

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

void embree::avx::CurveNvIntersectorK<8,4>::
     intersect_t<embree::avx::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 (*pauVar1) [28];
  undefined1 (*pauVar2) [28];
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined4 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Primitive PVar16;
  uint uVar17;
  uint uVar18;
  undefined4 uVar19;
  Geometry *pGVar20;
  RTCFilterFunctionN p_Var21;
  uint uVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  bool bVar115;
  bool bVar116;
  long lVar117;
  bool bVar118;
  bool bVar119;
  bool bVar120;
  bool bVar121;
  bool bVar122;
  bool bVar123;
  float fVar124;
  float fVar125;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [28];
  undefined1 auVar142 [28];
  undefined1 auVar143 [24];
  uint uVar144;
  uint uVar145;
  uint uVar146;
  ulong uVar147;
  long lVar148;
  undefined1 auVar149 [8];
  long lVar150;
  ulong uVar151;
  float fVar152;
  float fVar153;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar169;
  float fVar172;
  float fVar177;
  float fVar179;
  float fVar180;
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar178 [16];
  undefined1 auVar158 [32];
  float fVar170;
  float fVar173;
  float fVar175;
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  float fVar171;
  float fVar174;
  float fVar176;
  float fVar181;
  float fVar182;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [64];
  float fVar183;
  undefined8 extraout_XMM1_Qa;
  float fVar202;
  undefined1 auVar184 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  undefined1 auVar185 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  float fVar201;
  float fVar203;
  float fVar204;
  undefined1 auVar193 [32];
  float fVar205;
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 extraout_var [56];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  float fVar217;
  float fVar233;
  undefined1 auVar218 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar231;
  float fVar232;
  float fVar235;
  float fVar237;
  float fVar239;
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar219 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  float fVar234;
  float fVar236;
  float fVar238;
  float fVar240;
  float fVar241;
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  float fVar242;
  undefined1 auVar230 [64];
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar253;
  float fVar256;
  float fVar259;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  float fVar254;
  float fVar257;
  float fVar260;
  float fVar262;
  float fVar263;
  float fVar264;
  undefined1 auVar248 [32];
  float fVar255;
  float fVar258;
  float fVar261;
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  float fVar265;
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  float fVar266;
  float fVar279;
  float fVar282;
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  float fVar267;
  float fVar268;
  undefined1 auVar271 [16];
  float fVar288;
  float fVar289;
  float fVar290;
  undefined1 auVar272 [32];
  float fVar285;
  undefined1 auVar273 [32];
  float fVar280;
  float fVar281;
  float fVar283;
  float fVar284;
  float fVar286;
  float fVar287;
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [64];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  float fVar291;
  float fVar301;
  float fVar302;
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  float fVar303;
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  float fVar304;
  undefined1 auVar299 [32];
  float fVar305;
  undefined1 auVar300 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar317 [64];
  float fVar318;
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar330;
  float fVar331;
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  float fVar333;
  undefined1 auVar322 [32];
  float fVar329;
  float fVar332;
  undefined1 auVar323 [32];
  undefined1 auVar324 [64];
  float fVar334;
  float fVar335;
  float fVar343;
  float fVar345;
  float fVar347;
  float fVar349;
  float fVar350;
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  float fVar344;
  float fVar346;
  float fVar348;
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [64];
  float fVar355;
  float fVar356;
  float fVar357;
  float fVar358;
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [64];
  float fVar368;
  float fVar369;
  float in_register_0000151c;
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  float fVar370;
  float fVar371;
  float fVar375;
  float fVar377;
  float fVar379;
  undefined1 auVar372 [32];
  float fVar376;
  float fVar378;
  float fVar380;
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  float fVar381;
  float fVar385;
  float fVar386;
  float fVar387;
  float in_register_0000159c;
  undefined1 auVar382 [32];
  float fVar388;
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  float fVar389;
  float fVar394;
  float fVar395;
  undefined1 auVar390 [16];
  float fVar396;
  float in_register_000015dc;
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  undefined1 auVar393 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  undefined8 local_890;
  undefined8 uStack_888;
  uint local_880;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [32];
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  RTCFilterFunctionNArguments local_7d0;
  float local_7a0;
  float fStack_79c;
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined1 local_760 [8];
  undefined8 uStack_758;
  undefined1 auStack_750 [8];
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  undefined1 auStack_730 [8];
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [8];
  undefined8 uStack_6d8;
  undefined1 (*local_6c8) [16];
  undefined1 local_6c0 [32];
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [8];
  undefined8 uStack_678;
  undefined1 auStack_670 [16];
  undefined1 local_660 [8];
  undefined8 uStack_658;
  undefined1 auStack_650 [16];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  undefined8 uStack_5f8;
  undefined1 local_5f0 [8];
  undefined8 uStack_5e8;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [2] [32];
  undefined1 local_520 [32];
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  RTCHitN local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  undefined1 local_410 [16];
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  uint local_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  uint local_360;
  uint local_35c;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined1 local_300 [32];
  float local_2e0 [4];
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined1 local_80 [32];
  
  PVar16 = prim[1];
  uVar151 = (ulong)(byte)PVar16;
  lVar148 = uVar151 * 5;
  lVar117 = uVar151 * 0x19;
  auVar271 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar271 = vinsertps_avx(auVar271,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar209 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar209 = vinsertps_avx(auVar209,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar217 = *(float *)(prim + lVar117 + 0x12);
  auVar271 = vsubps_avx(auVar271,*(undefined1 (*) [16])(prim + lVar117 + 6));
  auVar184._0_4_ = fVar217 * auVar271._0_4_;
  auVar184._4_4_ = fVar217 * auVar271._4_4_;
  auVar184._8_4_ = fVar217 * auVar271._8_4_;
  auVar184._12_4_ = fVar217 * auVar271._12_4_;
  auVar271 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar151 * 4 + 6)));
  auVar178 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar151 * 4 + 10)));
  auVar269._0_4_ = fVar217 * auVar209._0_4_;
  auVar269._4_4_ = fVar217 * auVar209._4_4_;
  auVar269._8_4_ = fVar217 * auVar209._8_4_;
  auVar269._12_4_ = fVar217 * auVar209._12_4_;
  auVar156._16_16_ = auVar178;
  auVar156._0_16_ = auVar271;
  auVar271 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar148 + 6)));
  auVar156 = vcvtdq2ps_avx(auVar156);
  auVar209 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar148 + 10)));
  auVar213._16_16_ = auVar209;
  auVar213._0_16_ = auVar271;
  auVar321 = vcvtdq2ps_avx(auVar213);
  auVar271 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar151 * 6 + 6)));
  auVar209 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar151 * 6 + 10)));
  auVar222._16_16_ = auVar209;
  auVar222._0_16_ = auVar271;
  auVar271 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar151 * 0xb + 6)));
  auVar209 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar151 * 0xb + 10)));
  auVar24 = vcvtdq2ps_avx(auVar222);
  auVar223._16_16_ = auVar209;
  auVar223._0_16_ = auVar271;
  auVar25 = vcvtdq2ps_avx(auVar223);
  uVar147 = (ulong)((uint)(byte)PVar16 * 0xc);
  auVar271 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar147 + 6)));
  auVar209 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar147 + 10)));
  auVar294._16_16_ = auVar209;
  auVar294._0_16_ = auVar271;
  auVar271 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar147 + uVar151 + 6)));
  auVar26 = vcvtdq2ps_avx(auVar294);
  auVar209 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar147 + uVar151 + 10)));
  auVar306._16_16_ = auVar209;
  auVar306._0_16_ = auVar271;
  lVar150 = uVar151 * 9;
  uVar147 = (ulong)(uint)((int)lVar150 * 2);
  auVar271 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar147 + 6)));
  auVar27 = vcvtdq2ps_avx(auVar306);
  auVar209 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar147 + 10)));
  auVar307._16_16_ = auVar209;
  auVar307._0_16_ = auVar271;
  auVar28 = vcvtdq2ps_avx(auVar307);
  auVar271 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar147 + uVar151 + 6)));
  auVar209 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar147 + uVar151 + 10)));
  auVar336._16_16_ = auVar209;
  auVar336._0_16_ = auVar271;
  uVar147 = (ulong)(uint)((int)lVar148 << 2);
  auVar271 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar147 + 6)));
  auVar209 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar147 + 10)));
  auVar29 = vcvtdq2ps_avx(auVar336);
  auVar351._16_16_ = auVar209;
  auVar351._0_16_ = auVar271;
  auVar30 = vcvtdq2ps_avx(auVar351);
  auVar271 = vshufps_avx(auVar269,auVar269,0);
  auVar209 = vshufps_avx(auVar269,auVar269,0x55);
  auVar178 = vshufps_avx(auVar269,auVar269,0xaa);
  fVar217 = auVar178._0_4_;
  fVar231 = auVar178._4_4_;
  fVar232 = auVar178._8_4_;
  fVar233 = auVar178._12_4_;
  fVar235 = auVar209._0_4_;
  fVar237 = auVar209._4_4_;
  fVar239 = auVar209._8_4_;
  fVar243 = auVar209._12_4_;
  fVar253 = auVar271._0_4_;
  fVar256 = auVar271._4_4_;
  fVar259 = auVar271._8_4_;
  fVar262 = auVar271._12_4_;
  auVar363._0_4_ = fVar253 * auVar156._0_4_ + fVar235 * auVar321._0_4_ + fVar217 * auVar24._0_4_;
  auVar363._4_4_ = fVar256 * auVar156._4_4_ + fVar237 * auVar321._4_4_ + fVar231 * auVar24._4_4_;
  auVar363._8_4_ = fVar259 * auVar156._8_4_ + fVar239 * auVar321._8_4_ + fVar232 * auVar24._8_4_;
  auVar363._12_4_ = fVar262 * auVar156._12_4_ + fVar243 * auVar321._12_4_ + fVar233 * auVar24._12_4_
  ;
  auVar363._16_4_ = fVar253 * auVar156._16_4_ + fVar235 * auVar321._16_4_ + fVar217 * auVar24._16_4_
  ;
  auVar363._20_4_ = fVar256 * auVar156._20_4_ + fVar237 * auVar321._20_4_ + fVar231 * auVar24._20_4_
  ;
  auVar363._24_4_ = fVar259 * auVar156._24_4_ + fVar239 * auVar321._24_4_ + fVar232 * auVar24._24_4_
  ;
  auVar363._28_4_ = fVar243 + in_register_000015dc + in_register_0000151c;
  auVar359._0_4_ = fVar253 * auVar25._0_4_ + fVar235 * auVar26._0_4_ + auVar27._0_4_ * fVar217;
  auVar359._4_4_ = fVar256 * auVar25._4_4_ + fVar237 * auVar26._4_4_ + auVar27._4_4_ * fVar231;
  auVar359._8_4_ = fVar259 * auVar25._8_4_ + fVar239 * auVar26._8_4_ + auVar27._8_4_ * fVar232;
  auVar359._12_4_ = fVar262 * auVar25._12_4_ + fVar243 * auVar26._12_4_ + auVar27._12_4_ * fVar233;
  auVar359._16_4_ = fVar253 * auVar25._16_4_ + fVar235 * auVar26._16_4_ + auVar27._16_4_ * fVar217;
  auVar359._20_4_ = fVar256 * auVar25._20_4_ + fVar237 * auVar26._20_4_ + auVar27._20_4_ * fVar231;
  auVar359._24_4_ = fVar259 * auVar25._24_4_ + fVar239 * auVar26._24_4_ + auVar27._24_4_ * fVar232;
  auVar359._28_4_ = fVar243 + in_register_000015dc + in_register_0000159c;
  auVar272._0_4_ = fVar253 * auVar28._0_4_ + fVar235 * auVar29._0_4_ + auVar30._0_4_ * fVar217;
  auVar272._4_4_ = fVar256 * auVar28._4_4_ + fVar237 * auVar29._4_4_ + auVar30._4_4_ * fVar231;
  auVar272._8_4_ = fVar259 * auVar28._8_4_ + fVar239 * auVar29._8_4_ + auVar30._8_4_ * fVar232;
  auVar272._12_4_ = fVar262 * auVar28._12_4_ + fVar243 * auVar29._12_4_ + auVar30._12_4_ * fVar233;
  auVar272._16_4_ = fVar253 * auVar28._16_4_ + fVar235 * auVar29._16_4_ + auVar30._16_4_ * fVar217;
  auVar272._20_4_ = fVar256 * auVar28._20_4_ + fVar237 * auVar29._20_4_ + auVar30._20_4_ * fVar231;
  auVar272._24_4_ = fVar259 * auVar28._24_4_ + fVar239 * auVar29._24_4_ + auVar30._24_4_ * fVar232;
  auVar272._28_4_ = fVar262 + fVar243 + fVar233;
  auVar271 = vshufps_avx(auVar184,auVar184,0);
  auVar209 = vshufps_avx(auVar184,auVar184,0x55);
  auVar178 = vshufps_avx(auVar184,auVar184,0xaa);
  fVar231 = auVar178._0_4_;
  fVar232 = auVar178._4_4_;
  fVar233 = auVar178._8_4_;
  fVar235 = auVar178._12_4_;
  fVar256 = auVar209._0_4_;
  fVar259 = auVar209._4_4_;
  fVar262 = auVar209._8_4_;
  fVar263 = auVar209._12_4_;
  fVar237 = auVar271._0_4_;
  fVar239 = auVar271._4_4_;
  fVar243 = auVar271._8_4_;
  fVar253 = auVar271._12_4_;
  fVar217 = auVar156._28_4_;
  auVar295._0_4_ = fVar237 * auVar156._0_4_ + fVar256 * auVar321._0_4_ + fVar231 * auVar24._0_4_;
  auVar295._4_4_ = fVar239 * auVar156._4_4_ + fVar259 * auVar321._4_4_ + fVar232 * auVar24._4_4_;
  auVar295._8_4_ = fVar243 * auVar156._8_4_ + fVar262 * auVar321._8_4_ + fVar233 * auVar24._8_4_;
  auVar295._12_4_ = fVar253 * auVar156._12_4_ + fVar263 * auVar321._12_4_ + fVar235 * auVar24._12_4_
  ;
  auVar295._16_4_ = fVar237 * auVar156._16_4_ + fVar256 * auVar321._16_4_ + fVar231 * auVar24._16_4_
  ;
  auVar295._20_4_ = fVar239 * auVar156._20_4_ + fVar259 * auVar321._20_4_ + fVar232 * auVar24._20_4_
  ;
  auVar295._24_4_ = fVar243 * auVar156._24_4_ + fVar262 * auVar321._24_4_ + fVar233 * auVar24._24_4_
  ;
  auVar295._28_4_ = fVar217 + auVar321._28_4_ + auVar24._28_4_;
  auVar189._0_4_ = fVar237 * auVar25._0_4_ + auVar27._0_4_ * fVar231 + fVar256 * auVar26._0_4_;
  auVar189._4_4_ = fVar239 * auVar25._4_4_ + auVar27._4_4_ * fVar232 + fVar259 * auVar26._4_4_;
  auVar189._8_4_ = fVar243 * auVar25._8_4_ + auVar27._8_4_ * fVar233 + fVar262 * auVar26._8_4_;
  auVar189._12_4_ = fVar253 * auVar25._12_4_ + auVar27._12_4_ * fVar235 + fVar263 * auVar26._12_4_;
  auVar189._16_4_ = fVar237 * auVar25._16_4_ + auVar27._16_4_ * fVar231 + fVar256 * auVar26._16_4_;
  auVar189._20_4_ = fVar239 * auVar25._20_4_ + auVar27._20_4_ * fVar232 + fVar259 * auVar26._20_4_;
  auVar189._24_4_ = fVar243 * auVar25._24_4_ + auVar27._24_4_ * fVar233 + fVar262 * auVar26._24_4_;
  auVar189._28_4_ = fVar217 + auVar27._28_4_ + auVar24._28_4_;
  auVar308._8_4_ = 0x7fffffff;
  auVar308._0_8_ = 0x7fffffff7fffffff;
  auVar308._12_4_ = 0x7fffffff;
  auVar308._16_4_ = 0x7fffffff;
  auVar308._20_4_ = 0x7fffffff;
  auVar308._24_4_ = 0x7fffffff;
  auVar308._28_4_ = 0x7fffffff;
  auVar214._8_4_ = 0x219392ef;
  auVar214._0_8_ = 0x219392ef219392ef;
  auVar214._12_4_ = 0x219392ef;
  auVar214._16_4_ = 0x219392ef;
  auVar214._20_4_ = 0x219392ef;
  auVar214._24_4_ = 0x219392ef;
  auVar214._28_4_ = 0x219392ef;
  auVar156 = vandps_avx(auVar363,auVar308);
  auVar156 = vcmpps_avx(auVar156,auVar214,1);
  auVar321 = vblendvps_avx(auVar363,auVar214,auVar156);
  auVar156 = vandps_avx(auVar359,auVar308);
  auVar156 = vcmpps_avx(auVar156,auVar214,1);
  auVar24 = vblendvps_avx(auVar359,auVar214,auVar156);
  auVar156 = vandps_avx(auVar272,auVar308);
  auVar156 = vcmpps_avx(auVar156,auVar214,1);
  auVar156 = vblendvps_avx(auVar272,auVar214,auVar156);
  auVar215._0_4_ = fVar256 * auVar29._0_4_ + auVar30._0_4_ * fVar231 + fVar237 * auVar28._0_4_;
  auVar215._4_4_ = fVar259 * auVar29._4_4_ + auVar30._4_4_ * fVar232 + fVar239 * auVar28._4_4_;
  auVar215._8_4_ = fVar262 * auVar29._8_4_ + auVar30._8_4_ * fVar233 + fVar243 * auVar28._8_4_;
  auVar215._12_4_ = fVar263 * auVar29._12_4_ + auVar30._12_4_ * fVar235 + fVar253 * auVar28._12_4_;
  auVar215._16_4_ = fVar256 * auVar29._16_4_ + auVar30._16_4_ * fVar231 + fVar237 * auVar28._16_4_;
  auVar215._20_4_ = fVar259 * auVar29._20_4_ + auVar30._20_4_ * fVar232 + fVar239 * auVar28._20_4_;
  auVar215._24_4_ = fVar262 * auVar29._24_4_ + auVar30._24_4_ * fVar233 + fVar243 * auVar28._24_4_;
  auVar215._28_4_ = auVar26._28_4_ + fVar235 + fVar217;
  auVar25 = vrcpps_avx(auVar321);
  fVar217 = auVar25._0_4_;
  fVar231 = auVar25._4_4_;
  auVar26._4_4_ = auVar321._4_4_ * fVar231;
  auVar26._0_4_ = auVar321._0_4_ * fVar217;
  fVar232 = auVar25._8_4_;
  auVar26._8_4_ = auVar321._8_4_ * fVar232;
  fVar233 = auVar25._12_4_;
  auVar26._12_4_ = auVar321._12_4_ * fVar233;
  fVar235 = auVar25._16_4_;
  auVar26._16_4_ = auVar321._16_4_ * fVar235;
  fVar237 = auVar25._20_4_;
  auVar26._20_4_ = auVar321._20_4_ * fVar237;
  fVar239 = auVar25._24_4_;
  auVar26._24_4_ = auVar321._24_4_ * fVar239;
  auVar26._28_4_ = auVar321._28_4_;
  auVar319._8_4_ = 0x3f800000;
  auVar319._0_8_ = &DAT_3f8000003f800000;
  auVar319._12_4_ = 0x3f800000;
  auVar319._16_4_ = 0x3f800000;
  auVar319._20_4_ = 0x3f800000;
  auVar319._24_4_ = 0x3f800000;
  auVar319._28_4_ = 0x3f800000;
  auVar26 = vsubps_avx(auVar319,auVar26);
  auVar321 = vrcpps_avx(auVar24);
  fVar217 = fVar217 + fVar217 * auVar26._0_4_;
  fVar231 = fVar231 + fVar231 * auVar26._4_4_;
  fVar232 = fVar232 + fVar232 * auVar26._8_4_;
  fVar233 = fVar233 + fVar233 * auVar26._12_4_;
  fVar235 = fVar235 + fVar235 * auVar26._16_4_;
  fVar237 = fVar237 + fVar237 * auVar26._20_4_;
  fVar239 = fVar239 + fVar239 * auVar26._24_4_;
  fVar266 = auVar321._0_4_;
  fVar279 = auVar321._4_4_;
  auVar27._4_4_ = fVar279 * auVar24._4_4_;
  auVar27._0_4_ = fVar266 * auVar24._0_4_;
  fVar282 = auVar321._8_4_;
  auVar27._8_4_ = fVar282 * auVar24._8_4_;
  fVar285 = auVar321._12_4_;
  auVar27._12_4_ = fVar285 * auVar24._12_4_;
  fVar288 = auVar321._16_4_;
  auVar27._16_4_ = fVar288 * auVar24._16_4_;
  fVar289 = auVar321._20_4_;
  auVar27._20_4_ = fVar289 * auVar24._20_4_;
  fVar290 = auVar321._24_4_;
  auVar27._24_4_ = fVar290 * auVar24._24_4_;
  auVar27._28_4_ = auVar25._28_4_;
  auVar321 = vsubps_avx(auVar319,auVar27);
  fVar266 = fVar266 + fVar266 * auVar321._0_4_;
  fVar279 = fVar279 + fVar279 * auVar321._4_4_;
  fVar282 = fVar282 + fVar282 * auVar321._8_4_;
  fVar285 = fVar285 + fVar285 * auVar321._12_4_;
  fVar288 = fVar288 + fVar288 * auVar321._16_4_;
  fVar289 = fVar289 + fVar289 * auVar321._20_4_;
  fVar290 = fVar290 + fVar290 * auVar321._24_4_;
  auVar321 = vrcpps_avx(auVar156);
  fVar243 = auVar321._0_4_;
  fVar253 = auVar321._4_4_;
  auVar28._4_4_ = fVar253 * auVar156._4_4_;
  auVar28._0_4_ = fVar243 * auVar156._0_4_;
  fVar256 = auVar321._8_4_;
  auVar28._8_4_ = fVar256 * auVar156._8_4_;
  fVar259 = auVar321._12_4_;
  auVar28._12_4_ = fVar259 * auVar156._12_4_;
  fVar262 = auVar321._16_4_;
  auVar28._16_4_ = fVar262 * auVar156._16_4_;
  fVar263 = auVar321._20_4_;
  auVar28._20_4_ = fVar263 * auVar156._20_4_;
  fVar264 = auVar321._24_4_;
  auVar28._24_4_ = fVar264 * auVar156._24_4_;
  auVar28._28_4_ = auVar24._28_4_;
  auVar156 = vsubps_avx(auVar319,auVar28);
  fVar243 = fVar243 + fVar243 * auVar156._0_4_;
  fVar253 = fVar253 + fVar253 * auVar156._4_4_;
  fVar256 = fVar256 + fVar256 * auVar156._8_4_;
  fVar259 = fVar259 + fVar259 * auVar156._12_4_;
  fVar262 = fVar262 + fVar262 * auVar156._16_4_;
  fVar263 = fVar263 + fVar263 * auVar156._20_4_;
  fVar264 = fVar264 + fVar264 * auVar156._24_4_;
  auVar271._8_8_ = 0;
  auVar271._0_8_ = *(ulong *)(prim + uVar151 * 7 + 6);
  auVar271 = vpmovsxwd_avx(auVar271);
  auVar209._8_8_ = 0;
  auVar209._0_8_ = *(ulong *)(prim + uVar151 * 7 + 0xe);
  auVar209 = vpmovsxwd_avx(auVar209);
  auVar157._16_16_ = auVar209;
  auVar157._0_16_ = auVar271;
  auVar156 = vcvtdq2ps_avx(auVar157);
  auVar156 = vsubps_avx(auVar156,auVar295);
  auVar154._0_4_ = fVar217 * auVar156._0_4_;
  auVar154._4_4_ = fVar231 * auVar156._4_4_;
  auVar154._8_4_ = fVar232 * auVar156._8_4_;
  auVar154._12_4_ = fVar233 * auVar156._12_4_;
  auVar321._16_4_ = fVar235 * auVar156._16_4_;
  auVar321._0_16_ = auVar154;
  auVar321._20_4_ = fVar237 * auVar156._20_4_;
  auVar321._24_4_ = fVar239 * auVar156._24_4_;
  auVar321._28_4_ = auVar156._28_4_;
  auVar178._8_8_ = 0;
  auVar178._0_8_ = *(ulong *)(prim + lVar150 + 6);
  auVar271 = vpmovsxwd_avx(auVar178);
  auVar221._8_8_ = 0;
  auVar221._0_8_ = *(ulong *)(prim + lVar150 + 0xe);
  auVar209 = vpmovsxwd_avx(auVar221);
  auVar309._16_16_ = auVar209;
  auVar309._0_16_ = auVar271;
  auVar156 = vcvtdq2ps_avx(auVar309);
  auVar156 = vsubps_avx(auVar156,auVar295);
  auVar218._0_4_ = fVar217 * auVar156._0_4_;
  auVar218._4_4_ = fVar231 * auVar156._4_4_;
  auVar218._8_4_ = fVar232 * auVar156._8_4_;
  auVar218._12_4_ = fVar233 * auVar156._12_4_;
  auVar24._16_4_ = fVar235 * auVar156._16_4_;
  auVar24._0_16_ = auVar218;
  auVar24._20_4_ = fVar237 * auVar156._20_4_;
  auVar24._24_4_ = fVar239 * auVar156._24_4_;
  auVar24._28_4_ = auVar25._28_4_ + auVar26._28_4_;
  lVar148 = (ulong)(byte)PVar16 * 0x10;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + lVar148 + 6);
  auVar271 = vpmovsxwd_avx(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + lVar148 + 0xe);
  auVar209 = vpmovsxwd_avx(auVar9);
  lVar148 = lVar148 + uVar151 * -2;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + lVar148 + 6);
  auVar178 = vpmovsxwd_avx(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + lVar148 + 0xe);
  auVar221 = vpmovsxwd_avx(auVar11);
  auVar296._16_16_ = auVar221;
  auVar296._0_16_ = auVar178;
  auVar156 = vcvtdq2ps_avx(auVar296);
  auVar156 = vsubps_avx(auVar156,auVar189);
  auVar292._0_4_ = fVar266 * auVar156._0_4_;
  auVar292._4_4_ = fVar279 * auVar156._4_4_;
  auVar292._8_4_ = fVar282 * auVar156._8_4_;
  auVar292._12_4_ = fVar285 * auVar156._12_4_;
  auVar25._16_4_ = fVar288 * auVar156._16_4_;
  auVar25._0_16_ = auVar292;
  auVar25._20_4_ = fVar289 * auVar156._20_4_;
  auVar25._24_4_ = fVar290 * auVar156._24_4_;
  auVar25._28_4_ = auVar156._28_4_;
  auVar310._16_16_ = auVar209;
  auVar310._0_16_ = auVar271;
  auVar156 = vcvtdq2ps_avx(auVar310);
  auVar156 = vsubps_avx(auVar156,auVar189);
  auVar185._0_4_ = fVar266 * auVar156._0_4_;
  auVar185._4_4_ = fVar279 * auVar156._4_4_;
  auVar185._8_4_ = fVar282 * auVar156._8_4_;
  auVar185._12_4_ = fVar285 * auVar156._12_4_;
  auVar29._16_4_ = fVar288 * auVar156._16_4_;
  auVar29._0_16_ = auVar185;
  auVar29._20_4_ = fVar289 * auVar156._20_4_;
  auVar29._24_4_ = fVar290 * auVar156._24_4_;
  auVar29._28_4_ = auVar156._28_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar147 + uVar151 + 6);
  auVar271 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar147 + uVar151 + 0xe);
  auVar209 = vpmovsxwd_avx(auVar13);
  auVar273._16_16_ = auVar209;
  auVar273._0_16_ = auVar271;
  auVar156 = vcvtdq2ps_avx(auVar273);
  auVar156 = vsubps_avx(auVar156,auVar215);
  auVar270._0_4_ = fVar243 * auVar156._0_4_;
  auVar270._4_4_ = fVar253 * auVar156._4_4_;
  auVar270._8_4_ = fVar256 * auVar156._8_4_;
  auVar270._12_4_ = fVar259 * auVar156._12_4_;
  auVar30._16_4_ = fVar262 * auVar156._16_4_;
  auVar30._0_16_ = auVar270;
  auVar30._20_4_ = fVar263 * auVar156._20_4_;
  auVar30._24_4_ = fVar264 * auVar156._24_4_;
  auVar30._28_4_ = auVar156._28_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar151 * 0x17 + 6);
  auVar271 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar151 * 0x17 + 0xe);
  auVar209 = vpmovsxwd_avx(auVar15);
  auVar311._16_16_ = auVar209;
  auVar311._0_16_ = auVar271;
  auVar156 = vcvtdq2ps_avx(auVar311);
  auVar156 = vsubps_avx(auVar156,auVar215);
  auVar206._0_4_ = fVar243 * auVar156._0_4_;
  auVar206._4_4_ = fVar253 * auVar156._4_4_;
  auVar206._8_4_ = fVar256 * auVar156._8_4_;
  auVar206._12_4_ = fVar259 * auVar156._12_4_;
  auVar31._16_4_ = fVar262 * auVar156._16_4_;
  auVar31._0_16_ = auVar206;
  auVar31._20_4_ = fVar263 * auVar156._20_4_;
  auVar31._24_4_ = fVar264 * auVar156._24_4_;
  auVar31._28_4_ = auVar156._28_4_;
  auVar178 = auVar321._16_16_;
  auVar317 = ZEXT1664(auVar178);
  auVar271 = vpminsd_avx(auVar178,auVar24._16_16_);
  auVar209 = vpminsd_avx(auVar154,auVar218);
  auVar320._16_16_ = auVar271;
  auVar320._0_16_ = auVar209;
  auVar271 = vpminsd_avx(auVar25._16_16_,auVar29._16_16_);
  auVar209 = vpminsd_avx(auVar292,auVar185);
  auVar360._16_16_ = auVar271;
  auVar360._0_16_ = auVar209;
  auVar156 = vmaxps_avx(auVar320,auVar360);
  auVar271 = vpminsd_avx(auVar30._16_16_,auVar31._16_16_);
  auVar209 = vpminsd_avx(auVar270,auVar206);
  auVar372._16_16_ = auVar271;
  auVar372._0_16_ = auVar209;
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar382._4_4_ = uVar7;
  auVar382._0_4_ = uVar7;
  auVar382._8_4_ = uVar7;
  auVar382._12_4_ = uVar7;
  auVar382._16_4_ = uVar7;
  auVar382._20_4_ = uVar7;
  auVar382._24_4_ = uVar7;
  auVar382._28_4_ = uVar7;
  auVar321 = vmaxps_avx(auVar372,auVar382);
  auVar156 = vmaxps_avx(auVar156,auVar321);
  local_80._4_4_ = auVar156._4_4_ * 0.99999964;
  local_80._0_4_ = auVar156._0_4_ * 0.99999964;
  local_80._8_4_ = auVar156._8_4_ * 0.99999964;
  local_80._12_4_ = auVar156._12_4_ * 0.99999964;
  local_80._16_4_ = auVar156._16_4_ * 0.99999964;
  local_80._20_4_ = auVar156._20_4_ * 0.99999964;
  local_80._24_4_ = auVar156._24_4_ * 0.99999964;
  local_80._28_4_ = auVar156._28_4_;
  auVar324 = ZEXT3264(local_80);
  auVar271 = vpmaxsd_avx(auVar178,auVar24._16_16_);
  auVar209 = vpmaxsd_avx(auVar154,auVar218);
  auVar158._16_16_ = auVar271;
  auVar158._0_16_ = auVar209;
  auVar271 = vpmaxsd_avx(auVar25._16_16_,auVar29._16_16_);
  auVar209 = vpmaxsd_avx(auVar292,auVar185);
  auVar190._16_16_ = auVar271;
  auVar190._0_16_ = auVar209;
  auVar156 = vminps_avx(auVar158,auVar190);
  auVar271 = vpmaxsd_avx(auVar30._16_16_,auVar31._16_16_);
  auVar209 = vpmaxsd_avx(auVar270,auVar206);
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar224._4_4_ = uVar7;
  auVar224._0_4_ = uVar7;
  auVar224._8_4_ = uVar7;
  auVar224._12_4_ = uVar7;
  auVar224._16_4_ = uVar7;
  auVar224._20_4_ = uVar7;
  auVar224._24_4_ = uVar7;
  auVar224._28_4_ = uVar7;
  auVar191._16_16_ = auVar271;
  auVar191._0_16_ = auVar209;
  auVar321 = vminps_avx(auVar191,auVar224);
  auVar156 = vminps_avx(auVar156,auVar321);
  auVar23._4_4_ = auVar156._4_4_ * 1.0000004;
  auVar23._0_4_ = auVar156._0_4_ * 1.0000004;
  auVar23._8_4_ = auVar156._8_4_ * 1.0000004;
  auVar23._12_4_ = auVar156._12_4_ * 1.0000004;
  auVar23._16_4_ = auVar156._16_4_ * 1.0000004;
  auVar23._20_4_ = auVar156._20_4_ * 1.0000004;
  auVar23._24_4_ = auVar156._24_4_ * 1.0000004;
  auVar23._28_4_ = auVar156._28_4_;
  auVar156 = vcmpps_avx(local_80,auVar23,2);
  auVar271 = vpshufd_avx(ZEXT116((byte)PVar16),0);
  auVar192._16_16_ = auVar271;
  auVar192._0_16_ = auVar271;
  auVar321 = vcvtdq2ps_avx(auVar192);
  auVar321 = vcmpps_avx(_DAT_02020f40,auVar321,1);
  auVar156 = vandps_avx(auVar156,auVar321);
  uVar146 = vmovmskps_avx(auVar156);
  if (uVar146 != 0) {
    uVar146 = uVar146 & 0xff;
    local_560[1]._0_8_ = mm_lookupmask_ps._16_8_;
    local_560[1]._8_8_ = mm_lookupmask_ps._24_8_;
    local_560[1]._16_8_ = mm_lookupmask_ps._16_8_;
    local_560[1]._24_8_ = mm_lookupmask_ps._24_8_;
    local_6c8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    do {
      uVar151 = (ulong)uVar146;
      auVar321 = auVar324._0_32_;
      auVar156 = auVar317._0_32_;
      lVar148 = 0;
      if (uVar151 != 0) {
        for (; (uVar146 >> lVar148 & 1) == 0; lVar148 = lVar148 + 1) {
        }
      }
      uVar151 = uVar151 - 1 & uVar151;
      uVar146 = *(uint *)(prim + lVar148 * 4 + 6);
      lVar148 = lVar148 * 0x40;
      lVar150 = 0;
      if (uVar151 != 0) {
        for (; (uVar151 >> lVar150 & 1) == 0; lVar150 = lVar150 + 1) {
        }
      }
      uVar17 = *(uint *)(prim + 2);
      pGVar20 = (context->scene->geometries).items[uVar17].ptr;
      auVar271 = *(undefined1 (*) [16])(prim + lVar148 + lVar117 + 0x16);
      if (((uVar151 != 0) && (uVar147 = uVar151 - 1 & uVar151, uVar147 != 0)) &&
         (lVar150 = 0, uVar147 != 0)) {
        for (; (uVar147 >> lVar150 & 1) == 0; lVar150 = lVar150 + 1) {
        }
      }
      _local_6e0 = *(undefined1 (*) [16])(prim + lVar148 + lVar117 + 0x26);
      _local_5f0 = *(undefined1 (*) [16])(prim + lVar148 + lVar117 + 0x36);
      _local_600 = *(undefined1 (*) [16])(prim + lVar148 + lVar117 + 0x46);
      uVar18 = (uint)pGVar20[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar209 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar8 = vinsertps_avx(auVar209,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar221 = vsubps_avx(auVar271,auVar8);
      auVar209 = vshufps_avx(auVar221,auVar221,0);
      auVar178 = vshufps_avx(auVar221,auVar221,0x55);
      auVar221 = vshufps_avx(auVar221,auVar221,0xaa);
      fVar217 = pre->ray_space[k].vx.field_0.m128[0];
      fVar231 = pre->ray_space[k].vx.field_0.m128[1];
      fVar232 = pre->ray_space[k].vx.field_0.m128[2];
      fVar233 = pre->ray_space[k].vx.field_0.m128[3];
      fVar235 = pre->ray_space[k].vy.field_0.m128[0];
      fVar237 = pre->ray_space[k].vy.field_0.m128[1];
      fVar239 = pre->ray_space[k].vy.field_0.m128[2];
      fVar243 = pre->ray_space[k].vy.field_0.m128[3];
      fVar253 = pre->ray_space[k].vz.field_0.m128[0];
      fVar256 = pre->ray_space[k].vz.field_0.m128[1];
      fVar259 = pre->ray_space[k].vz.field_0.m128[2];
      fVar262 = pre->ray_space[k].vz.field_0.m128[3];
      auVar390._0_4_ =
           auVar209._0_4_ * fVar217 + auVar178._0_4_ * fVar235 + fVar253 * auVar221._0_4_;
      auVar390._4_4_ =
           auVar209._4_4_ * fVar231 + auVar178._4_4_ * fVar237 + fVar256 * auVar221._4_4_;
      auVar390._8_4_ =
           auVar209._8_4_ * fVar232 + auVar178._8_4_ * fVar239 + fVar259 * auVar221._8_4_;
      auVar390._12_4_ =
           auVar209._12_4_ * fVar233 + auVar178._12_4_ * fVar243 + fVar262 * auVar221._12_4_;
      auVar209 = vblendps_avx(auVar390,auVar271,8);
      auVar9 = vsubps_avx(_local_6e0,auVar8);
      auVar178 = vshufps_avx(auVar9,auVar9,0);
      auVar221 = vshufps_avx(auVar9,auVar9,0x55);
      auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
      auVar246._0_8_ =
           CONCAT44(auVar178._4_4_ * fVar231 + auVar221._4_4_ * fVar237 + fVar256 * auVar9._4_4_,
                    auVar178._0_4_ * fVar217 + auVar221._0_4_ * fVar235 + fVar253 * auVar9._0_4_);
      auVar246._8_4_ = auVar178._8_4_ * fVar232 + auVar221._8_4_ * fVar239 + fVar259 * auVar9._8_4_;
      auVar246._12_4_ =
           auVar178._12_4_ * fVar233 + auVar221._12_4_ * fVar243 + fVar262 * auVar9._12_4_;
      auVar178 = vblendps_avx(auVar246,_local_6e0,8);
      auVar10 = vsubps_avx(_local_5f0,auVar8);
      auVar221 = vshufps_avx(auVar10,auVar10,0);
      auVar9 = vshufps_avx(auVar10,auVar10,0x55);
      auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
      auVar247._0_4_ = auVar221._0_4_ * fVar217 + auVar9._0_4_ * fVar235 + fVar253 * auVar10._0_4_;
      auVar247._4_4_ = auVar221._4_4_ * fVar231 + auVar9._4_4_ * fVar237 + fVar256 * auVar10._4_4_;
      auVar247._8_4_ = auVar221._8_4_ * fVar232 + auVar9._8_4_ * fVar239 + fVar259 * auVar10._8_4_;
      auVar247._12_4_ =
           auVar221._12_4_ * fVar233 + auVar9._12_4_ * fVar243 + fVar262 * auVar10._12_4_;
      auVar221 = vblendps_avx(auVar247,_local_5f0,8);
      auVar10 = vsubps_avx(_local_600,auVar8);
      auVar8 = vshufps_avx(auVar10,auVar10,0);
      auVar9 = vshufps_avx(auVar10,auVar10,0x55);
      auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
      auVar293._0_4_ = auVar8._0_4_ * fVar217 + auVar9._0_4_ * fVar235 + fVar253 * auVar10._0_4_;
      auVar293._4_4_ = auVar8._4_4_ * fVar231 + auVar9._4_4_ * fVar237 + fVar256 * auVar10._4_4_;
      auVar293._8_4_ = auVar8._8_4_ * fVar232 + auVar9._8_4_ * fVar239 + fVar259 * auVar10._8_4_;
      auVar293._12_4_ = auVar8._12_4_ * fVar233 + auVar9._12_4_ * fVar243 + fVar262 * auVar10._12_4_
      ;
      auVar8 = vblendps_avx(auVar293,_local_600,8);
      auVar219._8_4_ = 0x7fffffff;
      auVar219._0_8_ = 0x7fffffff7fffffff;
      auVar219._12_4_ = 0x7fffffff;
      auVar209 = vandps_avx(auVar209,auVar219);
      auVar178 = vandps_avx(auVar178,auVar219);
      auVar9 = vmaxps_avx(auVar209,auVar178);
      auVar209 = vandps_avx(auVar221,auVar219);
      auVar178 = vandps_avx(auVar8,auVar219);
      auVar209 = vmaxps_avx(auVar209,auVar178);
      auVar209 = vmaxps_avx(auVar9,auVar209);
      auVar178 = vmovshdup_avx(auVar209);
      auVar178 = vmaxss_avx(auVar178,auVar209);
      auVar209 = vshufpd_avx(auVar209,auVar209,1);
      auVar209 = vmaxss_avx(auVar209,auVar178);
      lVar148 = (long)(int)uVar18 * 0x44;
      fVar266 = *(float *)(bspline_basis0 + lVar148 + 0x908);
      fVar279 = *(float *)(bspline_basis0 + lVar148 + 0x90c);
      fVar282 = *(float *)(bspline_basis0 + lVar148 + 0x910);
      fVar285 = *(float *)(bspline_basis0 + lVar148 + 0x914);
      fVar288 = *(float *)(bspline_basis0 + lVar148 + 0x918);
      fVar289 = *(float *)(bspline_basis0 + lVar148 + 0x91c);
      fVar290 = *(float *)(bspline_basis0 + lVar148 + 0x920);
      auVar178 = vshufps_avx(auVar247,auVar247,0);
      local_820._16_16_ = auVar178;
      local_820._0_16_ = auVar178;
      auVar221 = vshufps_avx(auVar247,auVar247,0x55);
      register0x00001350 = auVar221;
      _local_800 = auVar221;
      fVar318 = *(float *)(bspline_basis0 + lVar148 + 0xd8c);
      fVar234 = *(float *)(bspline_basis0 + lVar148 + 0xd90);
      fVar355 = *(float *)(bspline_basis0 + lVar148 + 0xd94);
      fVar325 = *(float *)(bspline_basis0 + lVar148 + 0xd98);
      fVar326 = *(float *)(bspline_basis0 + lVar148 + 0xd9c);
      fVar236 = *(float *)(bspline_basis0 + lVar148 + 0xda0);
      fVar356 = *(float *)(bspline_basis0 + lVar148 + 0xda4);
      auVar8 = vshufps_avx(auVar293,auVar293,0);
      register0x00001550 = auVar8;
      _local_4a0 = auVar8;
      auVar9 = vshufps_avx(auVar293,auVar293,0x55);
      register0x00001390 = auVar9;
      _local_700 = auVar9;
      fVar370 = auVar8._0_4_;
      fVar375 = auVar8._4_4_;
      fVar377 = auVar8._8_4_;
      fVar379 = auVar8._12_4_;
      fVar183 = auVar178._0_4_;
      fVar201 = auVar178._4_4_;
      fVar202 = auVar178._8_4_;
      fVar203 = auVar178._12_4_;
      fVar291 = auVar9._0_4_;
      fVar301 = auVar9._4_4_;
      fVar302 = auVar9._8_4_;
      fVar303 = auVar9._12_4_;
      fVar267 = auVar221._0_4_;
      fVar280 = auVar221._4_4_;
      fVar283 = auVar221._8_4_;
      fVar286 = auVar221._12_4_;
      auVar178 = vshufps_avx(_local_5f0,_local_5f0,0xff);
      register0x00001490 = auVar178;
      _local_140 = auVar178;
      auVar221 = vshufps_avx(_local_600,_local_600,0xff);
      register0x00001410 = auVar221;
      _local_160 = auVar221;
      fVar217 = auVar221._0_4_;
      fVar232 = auVar221._4_4_;
      fVar233 = auVar221._8_4_;
      fVar235 = auVar221._12_4_;
      fVar253 = auVar178._0_4_;
      fVar256 = auVar178._4_4_;
      fVar259 = auVar178._8_4_;
      auVar126._8_4_ = auVar246._8_4_;
      auVar126._0_8_ = auVar246._0_8_;
      auVar126._12_4_ = auVar246._12_4_;
      auVar221 = vshufps_avx(auVar126,auVar126,0);
      register0x00001350 = auVar221;
      _local_a0 = auVar221;
      fVar327 = *(float *)(bspline_basis0 + lVar148 + 0x484);
      fVar329 = *(float *)(bspline_basis0 + lVar148 + 0x488);
      fVar238 = *(float *)(bspline_basis0 + lVar148 + 0x48c);
      fVar357 = *(float *)(bspline_basis0 + lVar148 + 0x490);
      fVar242 = *(float *)(bspline_basis0 + lVar148 + 0x494);
      fVar332 = *(float *)(bspline_basis0 + lVar148 + 0x498);
      fVar241 = *(float *)(bspline_basis0 + lVar148 + 0x49c);
      fVar268 = auVar221._0_4_;
      fVar281 = auVar221._4_4_;
      fVar284 = auVar221._8_4_;
      fVar287 = auVar221._12_4_;
      auVar221 = vshufps_avx(auVar126,auVar126,0x55);
      register0x00001310 = auVar221;
      _local_5e0 = auVar221;
      fVar244 = auVar221._0_4_;
      fVar254 = auVar221._4_4_;
      fVar257 = auVar221._8_4_;
      fVar260 = auVar221._12_4_;
      auVar221 = vpermilps_avx(_local_6e0,0xff);
      register0x00001590 = auVar221;
      _local_c0 = auVar221;
      fVar262 = auVar221._0_4_;
      fVar263 = auVar221._4_4_;
      fVar264 = auVar221._8_4_;
      fVar387 = auVar221._12_4_;
      auVar221 = vshufps_avx(auVar390,auVar390,0);
      register0x000015d0 = auVar221;
      _local_1a0 = auVar221;
      local_220 = *(float *)(bspline_basis0 + lVar148);
      fStack_21c = *(float *)(bspline_basis0 + lVar148 + 4);
      fStack_218 = *(float *)(bspline_basis0 + lVar148 + 8);
      fStack_214 = *(float *)(bspline_basis0 + lVar148 + 0xc);
      fStack_210 = *(float *)(bspline_basis0 + lVar148 + 0x10);
      fStack_20c = *(float *)(bspline_basis0 + lVar148 + 0x14);
      fStack_208 = *(float *)(bspline_basis0 + lVar148 + 0x18);
      fVar389 = auVar221._0_4_;
      fVar394 = auVar221._4_4_;
      fVar395 = auVar221._8_4_;
      fVar396 = auVar221._12_4_;
      auVar361._0_4_ =
           fVar389 * local_220 + fVar268 * fVar327 + fVar183 * fVar266 + fVar370 * fVar318;
      auVar361._4_4_ =
           fVar394 * fStack_21c + fVar281 * fVar329 + fVar201 * fVar279 + fVar375 * fVar234;
      auVar361._8_4_ =
           fVar395 * fStack_218 + fVar284 * fVar238 + fVar202 * fVar282 + fVar377 * fVar355;
      auVar361._12_4_ =
           fVar396 * fStack_214 + fVar287 * fVar357 + fVar203 * fVar285 + fVar379 * fVar325;
      auVar361._16_4_ =
           fVar389 * fStack_210 + fVar268 * fVar242 + fVar183 * fVar288 + fVar370 * fVar326;
      auVar361._20_4_ =
           fVar394 * fStack_20c + fVar281 * fVar332 + fVar201 * fVar289 + fVar375 * fVar236;
      auVar361._24_4_ =
           fVar395 * fStack_208 + fVar284 * fVar241 + fVar202 * fVar290 + fVar377 * fVar356;
      auVar361._28_4_ = fVar203 + 0.0 + 0.0 + 0.0;
      auVar8 = vshufps_avx(auVar390,auVar390,0x55);
      register0x00001510 = auVar8;
      _local_200 = auVar8;
      fVar349 = auVar8._0_4_;
      fVar350 = auVar8._4_4_;
      fVar368 = auVar8._8_4_;
      fVar369 = auVar8._12_4_;
      auVar297._0_4_ =
           fVar349 * local_220 + fVar244 * fVar327 + fVar267 * fVar266 + fVar291 * fVar318;
      auVar297._4_4_ =
           fVar350 * fStack_21c + fVar254 * fVar329 + fVar280 * fVar279 + fVar301 * fVar234;
      auVar297._8_4_ =
           fVar368 * fStack_218 + fVar257 * fVar238 + fVar283 * fVar282 + fVar302 * fVar355;
      auVar297._12_4_ =
           fVar369 * fStack_214 + fVar260 * fVar357 + fVar286 * fVar285 + fVar303 * fVar325;
      auVar297._16_4_ =
           fVar349 * fStack_210 + fVar244 * fVar242 + fVar267 * fVar288 + fVar291 * fVar326;
      auVar297._20_4_ =
           fVar350 * fStack_20c + fVar254 * fVar332 + fVar280 * fVar289 + fVar301 * fVar236;
      auVar297._24_4_ =
           fVar368 * fStack_208 + fVar257 * fVar241 + fVar283 * fVar290 + fVar302 * fVar356;
      auVar297._28_4_ = fVar203 + 0.0 + 0.0 + 0.0;
      auVar8 = vpermilps_avx(auVar271,0xff);
      register0x00001450 = auVar8;
      _local_180 = auVar8;
      fStack_204 = (float)*(undefined4 *)(bspline_basis0 + lVar148 + 0x1c);
      fVar237 = auVar8._0_4_;
      fVar239 = auVar8._4_4_;
      fVar243 = auVar8._8_4_;
      local_840._0_4_ =
           fVar237 * local_220 + fVar262 * fVar327 + fVar253 * fVar266 + fVar217 * fVar318;
      local_840._4_4_ =
           fVar239 * fStack_21c + fVar263 * fVar329 + fVar256 * fVar279 + fVar232 * fVar234;
      fStack_838 = fVar243 * fStack_218 + fVar264 * fVar238 + fVar259 * fVar282 + fVar233 * fVar355;
      fStack_834 = auVar8._12_4_ * fStack_214 +
                   fVar387 * fVar357 + auVar178._12_4_ * fVar285 + fVar235 * fVar325;
      fStack_830 = fVar237 * fStack_210 + fVar262 * fVar242 + fVar253 * fVar288 + fVar217 * fVar326;
      fStack_82c = fVar239 * fStack_20c + fVar263 * fVar332 + fVar256 * fVar289 + fVar232 * fVar236;
      fStack_828 = fVar243 * fStack_208 + fVar264 * fVar241 + fVar259 * fVar290 + fVar233 * fVar356;
      fStack_824 = *(float *)(bspline_basis0 + lVar148 + 0x924) + 0.0 + 0.0 + 0.0;
      fVar204 = *(float *)(bspline_basis1 + lVar148 + 0x908);
      fVar358 = *(float *)(bspline_basis1 + lVar148 + 0x90c);
      fVar170 = *(float *)(bspline_basis1 + lVar148 + 0x910);
      fVar173 = *(float *)(bspline_basis1 + lVar148 + 0x914);
      fVar153 = *(float *)(bspline_basis1 + lVar148 + 0x918);
      fVar171 = *(float *)(bspline_basis1 + lVar148 + 0x91c);
      fVar174 = *(float *)(bspline_basis1 + lVar148 + 0x920);
      fVar176 = *(float *)(bspline_basis1 + lVar148 + 0xd8c);
      fVar177 = *(float *)(bspline_basis1 + lVar148 + 0xd90);
      fVar179 = *(float *)(bspline_basis1 + lVar148 + 0xd94);
      fVar180 = *(float *)(bspline_basis1 + lVar148 + 0xd98);
      fStack_4f0 = *(float *)(bspline_basis1 + lVar148 + 0xd9c);
      fStack_4ec = *(float *)(bspline_basis1 + lVar148 + 0xda0);
      fStack_4e8 = *(float *)(bspline_basis1 + lVar148 + 0xda4);
      fStack_4e4 = *(float *)(bspline_basis1 + lVar148 + 0xda8);
      fVar181 = *(float *)(bspline_basis1 + lVar148 + 0x484);
      fVar265 = *(float *)(bspline_basis1 + lVar148 + 0x488);
      fVar304 = *(float *)(bspline_basis1 + lVar148 + 0x48c);
      fVar240 = *(float *)(bspline_basis1 + lVar148 + 0x490);
      fVar182 = *(float *)(bspline_basis1 + lVar148 + 0x494);
      fVar205 = *(float *)(bspline_basis1 + lVar148 + 0x498);
      fVar305 = *(float *)(bspline_basis1 + lVar148 + 0x49c);
      fVar231 = fVar287 + 0.0;
      fVar328 = *(float *)(bspline_basis1 + lVar148);
      fVar330 = *(float *)(bspline_basis1 + lVar148 + 4);
      fVar331 = *(float *)(bspline_basis1 + lVar148 + 8);
      fVar335 = *(float *)(bspline_basis1 + lVar148 + 0xc);
      fVar344 = *(float *)(bspline_basis1 + lVar148 + 0x10);
      fVar346 = *(float *)(bspline_basis1 + lVar148 + 0x14);
      fVar348 = *(float *)(bspline_basis1 + lVar148 + 0x18);
      auVar248._0_4_ = fVar389 * fVar328 + fVar268 * fVar181 + fVar204 * fVar183 + fVar370 * fVar176
      ;
      auVar248._4_4_ = fVar394 * fVar330 + fVar281 * fVar265 + fVar358 * fVar201 + fVar375 * fVar177
      ;
      auVar248._8_4_ = fVar395 * fVar331 + fVar284 * fVar304 + fVar170 * fVar202 + fVar377 * fVar179
      ;
      auVar248._12_4_ =
           fVar396 * fVar335 + fVar287 * fVar240 + fVar173 * fVar203 + fVar379 * fVar180;
      auVar248._16_4_ =
           fVar389 * fVar344 + fVar268 * fVar182 + fVar153 * fVar183 + fVar370 * fStack_4f0;
      auVar248._20_4_ =
           fVar394 * fVar346 + fVar281 * fVar205 + fVar171 * fVar201 + fVar375 * fStack_4ec;
      auVar248._24_4_ =
           fVar395 * fVar348 + fVar284 * fVar305 + fVar174 * fVar202 + fVar377 * fStack_4e8;
      auVar248._28_4_ = fVar387 + fVar231;
      auVar225._0_4_ = fVar349 * fVar328 + fVar244 * fVar181 + fVar204 * fVar267 + fVar176 * fVar291
      ;
      auVar225._4_4_ = fVar350 * fVar330 + fVar254 * fVar265 + fVar358 * fVar280 + fVar177 * fVar301
      ;
      auVar225._8_4_ = fVar368 * fVar331 + fVar257 * fVar304 + fVar170 * fVar283 + fVar179 * fVar302
      ;
      auVar225._12_4_ =
           fVar369 * fVar335 + fVar260 * fVar240 + fVar173 * fVar286 + fVar180 * fVar303;
      auVar225._16_4_ =
           fVar349 * fVar344 + fVar244 * fVar182 + fVar153 * fVar267 + fStack_4f0 * fVar291;
      auVar225._20_4_ =
           fVar350 * fVar346 + fVar254 * fVar205 + fVar171 * fVar280 + fStack_4ec * fVar301;
      auVar225._24_4_ =
           fVar368 * fVar348 + fVar257 * fVar305 + fVar174 * fVar283 + fStack_4e8 * fVar302;
      auVar225._28_4_ = fVar231 + fVar287 + 0.0;
      local_720._0_4_ =
           fVar262 * fVar181 + fVar253 * fVar204 + fVar217 * fVar176 + fVar237 * fVar328;
      local_720._4_4_ =
           fVar263 * fVar265 + fVar256 * fVar358 + fVar232 * fVar177 + fVar239 * fVar330;
      local_720._8_4_ =
           fVar264 * fVar304 + fVar259 * fVar170 + fVar233 * fVar179 + fVar243 * fVar331;
      local_720._12_4_ =
           fVar387 * fVar240 + auVar178._12_4_ * fVar173 + fVar235 * fVar180 +
           auVar8._12_4_ * fVar335;
      local_720._16_4_ =
           fVar262 * fVar182 + fVar253 * fVar153 + fVar217 * fStack_4f0 + fVar237 * fVar344;
      local_720._20_4_ =
           fVar263 * fVar205 + fVar256 * fVar171 + fVar232 * fStack_4ec + fVar239 * fVar346;
      local_720._24_4_ =
           fVar264 * fVar305 + fVar259 * fVar174 + fVar233 * fStack_4e8 + fVar243 * fVar348;
      local_720._28_4_ = fVar287 + fVar235 + 0.0 + fVar231;
      local_260 = vsubps_avx(auVar248,auVar361);
      auVar26 = vsubps_avx(auVar225,auVar297);
      fVar217 = local_260._0_4_;
      fVar232 = local_260._4_4_;
      auVar32._4_4_ = auVar297._4_4_ * fVar232;
      auVar32._0_4_ = auVar297._0_4_ * fVar217;
      fVar235 = local_260._8_4_;
      auVar32._8_4_ = auVar297._8_4_ * fVar235;
      fVar239 = local_260._12_4_;
      auVar32._12_4_ = auVar297._12_4_ * fVar239;
      fVar253 = local_260._16_4_;
      auVar32._16_4_ = auVar297._16_4_ * fVar253;
      fVar259 = local_260._20_4_;
      auVar32._20_4_ = auVar297._20_4_ * fVar259;
      fVar263 = local_260._24_4_;
      auVar32._24_4_ = auVar297._24_4_ * fVar263;
      auVar32._28_4_ = fVar231;
      fVar231 = auVar26._0_4_;
      fVar233 = auVar26._4_4_;
      auVar33._4_4_ = auVar361._4_4_ * fVar233;
      auVar33._0_4_ = auVar361._0_4_ * fVar231;
      fVar237 = auVar26._8_4_;
      auVar33._8_4_ = auVar361._8_4_ * fVar237;
      fVar243 = auVar26._12_4_;
      auVar33._12_4_ = auVar361._12_4_ * fVar243;
      fVar256 = auVar26._16_4_;
      auVar33._16_4_ = auVar361._16_4_ * fVar256;
      fVar262 = auVar26._20_4_;
      auVar33._20_4_ = auVar361._20_4_ * fVar262;
      fVar264 = auVar26._24_4_;
      auVar33._24_4_ = auVar361._24_4_ * fVar264;
      auVar33._28_4_ = auVar225._28_4_;
      auVar25 = vsubps_avx(auVar32,auVar33);
      auVar24 = vmaxps_avx(_local_840,local_720);
      auVar34._4_4_ = auVar24._4_4_ * auVar24._4_4_ * (fVar232 * fVar232 + fVar233 * fVar233);
      auVar34._0_4_ = auVar24._0_4_ * auVar24._0_4_ * (fVar217 * fVar217 + fVar231 * fVar231);
      auVar34._8_4_ = auVar24._8_4_ * auVar24._8_4_ * (fVar235 * fVar235 + fVar237 * fVar237);
      auVar34._12_4_ = auVar24._12_4_ * auVar24._12_4_ * (fVar239 * fVar239 + fVar243 * fVar243);
      auVar34._16_4_ = auVar24._16_4_ * auVar24._16_4_ * (fVar253 * fVar253 + fVar256 * fVar256);
      auVar34._20_4_ = auVar24._20_4_ * auVar24._20_4_ * (fVar259 * fVar259 + fVar262 * fVar262);
      auVar34._24_4_ = auVar24._24_4_ * auVar24._24_4_ * (fVar263 * fVar263 + fVar264 * fVar264);
      auVar34._28_4_ = auVar26._28_4_ + auVar225._28_4_;
      auVar35._4_4_ = auVar25._4_4_ * auVar25._4_4_;
      auVar35._0_4_ = auVar25._0_4_ * auVar25._0_4_;
      auVar35._8_4_ = auVar25._8_4_ * auVar25._8_4_;
      auVar35._12_4_ = auVar25._12_4_ * auVar25._12_4_;
      auVar35._16_4_ = auVar25._16_4_ * auVar25._16_4_;
      auVar35._20_4_ = auVar25._20_4_ * auVar25._20_4_;
      auVar35._24_4_ = auVar25._24_4_ * auVar25._24_4_;
      auVar35._28_4_ = auVar25._28_4_;
      auVar24 = vcmpps_avx(auVar35,auVar34,2);
      auVar220._0_4_ = (float)(int)uVar18;
      auVar220._4_12_ = auVar221._4_12_;
      local_4c0._0_16_ = auVar220;
      auVar178 = vshufps_avx(auVar220,auVar220,0);
      auVar226._16_16_ = auVar178;
      auVar226._0_16_ = auVar178;
      auVar25 = vcmpps_avx(_DAT_02020f40,auVar226,1);
      auVar230 = ZEXT3264(auVar25);
      auVar178 = vpermilps_avx(auVar390,0xaa);
      auVar337._16_16_ = auVar178;
      auVar337._0_16_ = auVar178;
      auVar127._8_4_ = auVar246._8_4_;
      auVar127._0_8_ = auVar246._0_8_;
      auVar127._12_4_ = auVar246._12_4_;
      auVar221 = vpermilps_avx(auVar127,0xaa);
      register0x00001550 = auVar221;
      _local_480 = auVar221;
      auVar8 = vpermilps_avx(auVar247,0xaa);
      register0x00001590 = auVar8;
      _local_e0 = auVar8;
      auVar9 = vpermilps_avx(auVar293,0xaa);
      register0x00001310 = auVar9;
      _local_5c0 = auVar9;
      auVar27 = auVar25 & auVar24;
      uVar145 = *(uint *)(ray + k * 4 + 0x30);
      auVar209 = ZEXT416((uint)(auVar209._0_4_ * 4.7683716e-07));
      local_6c0._0_16_ = auVar209;
      local_890._0_4_ = auVar271._0_4_;
      fVar217 = (float)local_890;
      local_890._4_4_ = auVar271._4_4_;
      fVar231 = local_890._4_4_;
      uStack_888._0_4_ = auVar271._8_4_;
      fVar232 = (float)uStack_888;
      uStack_888._4_4_ = auVar271._12_4_;
      fVar233 = uStack_888._4_4_;
      local_890 = auVar271._0_8_;
      uStack_888 = auVar271._8_8_;
      fVar235 = fVar267;
      fVar237 = fVar280;
      fVar239 = fVar283;
      if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar27 >> 0x7f,0) == '\0') &&
            (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar27 >> 0xbf,0) == '\0') &&
          (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar27[0x1f])
      {
        auVar317 = ZEXT3264(auVar156);
        auVar324 = ZEXT3264(auVar321);
        auVar362 = ZEXT3264(local_820);
LAB_010fec53:
        fVar291 = (float)local_700._0_4_;
        fVar301 = (float)local_700._4_4_;
        fVar302 = fStack_6f8;
        fVar303 = fStack_6f4;
        fVar243 = fStack_6f0;
        fVar253 = fStack_6ec;
        fVar256 = fStack_6e8;
        fVar259 = fStack_6e4;
      }
      else {
        local_520._0_8_ = pGVar20;
        local_240 = vandps_avx(auVar24,auVar25);
        fVar334 = auVar178._0_4_;
        fVar343 = auVar178._4_4_;
        fVar345 = auVar178._8_4_;
        fVar347 = auVar178._12_4_;
        fVar371 = auVar221._0_4_;
        fVar376 = auVar221._4_4_;
        fVar378 = auVar221._8_4_;
        fVar380 = auVar221._12_4_;
        fVar381 = auVar8._0_4_;
        fVar385 = auVar8._4_4_;
        fVar386 = auVar8._8_4_;
        fVar388 = auVar8._12_4_;
        fVar245 = auVar9._0_4_;
        fVar255 = auVar9._4_4_;
        fVar258 = auVar9._8_4_;
        fVar261 = auVar9._12_4_;
        fVar243 = auVar25._28_4_ + *(float *)(bspline_basis1 + lVar148 + 0x924) + 0.0;
        local_500 = fVar334 * fVar328 + fVar371 * fVar181 + fVar381 * fVar204 + fVar245 * fVar176;
        fStack_4fc = fVar343 * fVar330 + fVar376 * fVar265 + fVar385 * fVar358 + fVar255 * fVar177;
        fStack_4f8 = fVar345 * fVar331 + fVar378 * fVar304 + fVar386 * fVar170 + fVar258 * fVar179;
        fStack_4f4 = fVar347 * fVar335 + fVar380 * fVar240 + fVar388 * fVar173 + fVar261 * fVar180;
        fStack_4f0 = fVar334 * fVar344 +
                     fVar371 * fVar182 + fVar381 * fVar153 + fVar245 * fStack_4f0;
        fStack_4ec = fVar343 * fVar346 +
                     fVar376 * fVar205 + fVar385 * fVar171 + fVar255 * fStack_4ec;
        fStack_4e8 = fVar345 * fVar348 +
                     fVar378 * fVar305 + fVar386 * fVar174 + fVar258 * fStack_4e8;
        fStack_4e4 = local_240._28_4_ + fVar243;
        fVar152 = fVar334 * local_220 + fVar371 * fVar327 + fVar381 * fVar266 + fVar245 * fVar318;
        fVar169 = fVar343 * fStack_21c + fVar376 * fVar329 + fVar385 * fVar279 + fVar255 * fVar234;
        fVar172 = fVar345 * fStack_218 + fVar378 * fVar238 + fVar386 * fVar282 + fVar258 * fVar355;
        fVar175 = fVar347 * fStack_214 + fVar380 * fVar357 + fVar388 * fVar285 + fVar261 * fVar325;
        fStack_790 = fVar334 * fStack_210 +
                     fVar371 * fVar242 + fVar381 * fVar288 + fVar245 * fVar326;
        fStack_78c = fVar343 * fStack_20c +
                     fVar376 * fVar332 + fVar385 * fVar289 + fVar255 * fVar236;
        fStack_788 = fVar345 * fStack_208 +
                     fVar378 * fVar241 + fVar386 * fVar290 + fVar258 * fVar356;
        fStack_784 = fStack_4e4 + fVar243 + local_240._28_4_ + auVar25._28_4_;
        fVar243 = *(float *)(bspline_basis0 + lVar148 + 0x1210);
        fVar253 = *(float *)(bspline_basis0 + lVar148 + 0x1214);
        fVar256 = *(float *)(bspline_basis0 + lVar148 + 0x1218);
        fVar259 = *(float *)(bspline_basis0 + lVar148 + 0x121c);
        fVar262 = *(float *)(bspline_basis0 + lVar148 + 0x1220);
        fVar263 = *(float *)(bspline_basis0 + lVar148 + 0x1224);
        fVar264 = *(float *)(bspline_basis0 + lVar148 + 0x1228);
        fVar266 = *(float *)(bspline_basis0 + lVar148 + 0x1694);
        fVar279 = *(float *)(bspline_basis0 + lVar148 + 0x1698);
        fVar282 = *(float *)(bspline_basis0 + lVar148 + 0x169c);
        fVar285 = *(float *)(bspline_basis0 + lVar148 + 0x16a0);
        fVar288 = *(float *)(bspline_basis0 + lVar148 + 0x16a4);
        fVar289 = *(float *)(bspline_basis0 + lVar148 + 0x16a8);
        fVar290 = *(float *)(bspline_basis0 + lVar148 + 0x16ac);
        fVar318 = *(float *)(bspline_basis0 + lVar148 + 0x1b18);
        fVar234 = *(float *)(bspline_basis0 + lVar148 + 0x1b1c);
        fVar355 = *(float *)(bspline_basis0 + lVar148 + 0x1b20);
        fVar325 = *(float *)(bspline_basis0 + lVar148 + 0x1b24);
        fVar326 = *(float *)(bspline_basis0 + lVar148 + 0x1b28);
        fVar236 = *(float *)(bspline_basis0 + lVar148 + 0x1b2c);
        fVar356 = *(float *)(bspline_basis0 + lVar148 + 0x1b30);
        fVar327 = *(float *)(bspline_basis0 + lVar148 + 0x1f9c);
        fVar329 = *(float *)(bspline_basis0 + lVar148 + 0x1fa0);
        fVar238 = *(float *)(bspline_basis0 + lVar148 + 0x1fa4);
        fVar357 = *(float *)(bspline_basis0 + lVar148 + 0x1fa8);
        fVar242 = *(float *)(bspline_basis0 + lVar148 + 0x1fac);
        fVar332 = *(float *)(bspline_basis0 + lVar148 + 0x1fb0);
        fVar241 = *(float *)(bspline_basis0 + lVar148 + 0x1fb4);
        fVar204 = *(float *)(bspline_basis0 + lVar148 + 0x1b34) +
                  *(float *)(bspline_basis0 + lVar148 + 0x1fb8);
        fVar333 = *(float *)(bspline_basis0 + lVar148 + 0x16b0) + fVar204;
        auVar312._0_4_ =
             fVar349 * fVar243 + fVar267 * fVar318 + fVar291 * fVar327 + fVar244 * fVar266;
        auVar312._4_4_ =
             fVar350 * fVar253 + fVar280 * fVar234 + fVar301 * fVar329 + fVar254 * fVar279;
        auVar312._8_4_ =
             fVar368 * fVar256 + fVar283 * fVar355 + fVar302 * fVar238 + fVar257 * fVar282;
        auVar312._12_4_ =
             fVar369 * fVar259 + fVar286 * fVar325 + fVar303 * fVar357 + fVar260 * fVar285;
        auVar312._16_4_ =
             fVar349 * fVar262 + fVar267 * fVar326 + fVar291 * fVar242 + fVar244 * fVar288;
        auVar312._20_4_ =
             fVar350 * fVar263 + fVar280 * fVar236 + fVar301 * fVar332 + fVar254 * fVar289;
        auVar312._24_4_ =
             fVar368 * fVar264 + fVar283 * fVar356 + fVar302 * fVar241 + fVar257 * fVar290;
        auVar312._28_4_ =
             fVar204 + fVar347 + *(float *)(bspline_basis1 + lVar148 + 0x1c) +
                       fVar347 + *(float *)(bspline_basis1 + lVar148 + 0x4a0);
        local_5a0 = fVar371 * fVar266 + fVar381 * fVar318 + fVar245 * fVar327 + fVar334 * fVar243;
        fStack_59c = fVar376 * fVar279 + fVar385 * fVar234 + fVar255 * fVar329 + fVar343 * fVar253;
        fStack_598 = fVar378 * fVar282 + fVar386 * fVar355 + fVar258 * fVar238 + fVar345 * fVar256;
        fStack_594 = fVar380 * fVar285 + fVar388 * fVar325 + fVar261 * fVar357 + fVar347 * fVar259;
        fStack_590 = fVar371 * fVar288 + fVar381 * fVar326 + fVar245 * fVar242 + fVar334 * fVar262;
        fStack_58c = fVar376 * fVar289 + fVar385 * fVar236 + fVar255 * fVar332 + fVar343 * fVar263;
        fStack_588 = fVar378 * fVar290 + fVar386 * fVar356 + fVar258 * fVar241 + fVar345 * fVar264;
        fStack_584 = fVar333 + *(float *)(bspline_basis0 + lVar148 + 0x122c);
        fVar204 = *(float *)(bspline_basis1 + lVar148 + 0x1b18);
        fVar358 = *(float *)(bspline_basis1 + lVar148 + 0x1b1c);
        fVar170 = *(float *)(bspline_basis1 + lVar148 + 0x1b20);
        fVar173 = *(float *)(bspline_basis1 + lVar148 + 0x1b24);
        fVar153 = *(float *)(bspline_basis1 + lVar148 + 0x1b28);
        fVar171 = *(float *)(bspline_basis1 + lVar148 + 0x1b2c);
        fVar174 = *(float *)(bspline_basis1 + lVar148 + 0x1b30);
        fVar176 = *(float *)(bspline_basis1 + lVar148 + 0x1f9c);
        fVar177 = *(float *)(bspline_basis1 + lVar148 + 0x1fa0);
        fVar179 = *(float *)(bspline_basis1 + lVar148 + 0x1fa4);
        fVar180 = *(float *)(bspline_basis1 + lVar148 + 0x1fa8);
        fVar181 = *(float *)(bspline_basis1 + lVar148 + 0x1fac);
        fVar265 = *(float *)(bspline_basis1 + lVar148 + 0x1fb0);
        fVar304 = *(float *)(bspline_basis1 + lVar148 + 0x1fb4);
        fVar240 = *(float *)(bspline_basis1 + lVar148 + 0x1694);
        fVar182 = *(float *)(bspline_basis1 + lVar148 + 0x1698);
        fVar205 = *(float *)(bspline_basis1 + lVar148 + 0x169c);
        fVar305 = *(float *)(bspline_basis1 + lVar148 + 0x16a0);
        fVar328 = *(float *)(bspline_basis1 + lVar148 + 0x16a4);
        fVar330 = *(float *)(bspline_basis1 + lVar148 + 0x16a8);
        fVar331 = *(float *)(bspline_basis1 + lVar148 + 0x16ac);
        fVar335 = *(float *)(bspline_basis1 + lVar148 + 0x1210);
        fVar344 = *(float *)(bspline_basis1 + lVar148 + 0x1214);
        fVar346 = *(float *)(bspline_basis1 + lVar148 + 0x1218);
        fVar348 = *(float *)(bspline_basis1 + lVar148 + 0x121c);
        fVar387 = *(float *)(bspline_basis1 + lVar148 + 0x1220);
        fVar124 = *(float *)(bspline_basis1 + lVar148 + 0x1224);
        fVar125 = *(float *)(bspline_basis1 + lVar148 + 0x1228);
        auVar322._0_4_ =
             fVar389 * fVar335 + fVar268 * fVar240 + fVar183 * fVar204 + fVar370 * fVar176;
        auVar322._4_4_ =
             fVar394 * fVar344 + fVar281 * fVar182 + fVar201 * fVar358 + fVar375 * fVar177;
        auVar322._8_4_ =
             fVar395 * fVar346 + fVar284 * fVar205 + fVar202 * fVar170 + fVar377 * fVar179;
        auVar322._12_4_ =
             fVar396 * fVar348 + fVar287 * fVar305 + fVar203 * fVar173 + fVar379 * fVar180;
        auVar322._16_4_ =
             fVar389 * fVar387 + fVar268 * fVar328 + fVar183 * fVar153 + fVar370 * fVar181;
        auVar322._20_4_ =
             fVar394 * fVar124 + fVar281 * fVar330 + fVar201 * fVar171 + fVar375 * fVar265;
        auVar322._24_4_ =
             fVar395 * fVar125 + fVar284 * fVar331 + fVar202 * fVar174 + fVar377 * fVar304;
        auVar322._28_4_ = fVar286 + fVar286 + fVar347 + fVar333;
        auVar338._0_4_ =
             fVar349 * fVar335 + fVar244 * fVar240 + fVar267 * fVar204 + fVar291 * fVar176;
        auVar338._4_4_ =
             fVar350 * fVar344 + fVar254 * fVar182 + fVar280 * fVar358 + fVar301 * fVar177;
        auVar338._8_4_ =
             fVar368 * fVar346 + fVar257 * fVar205 + fVar283 * fVar170 + fVar302 * fVar179;
        auVar338._12_4_ =
             fVar369 * fVar348 + fVar260 * fVar305 + fVar286 * fVar173 + fVar303 * fVar180;
        auVar338._16_4_ =
             fVar349 * fVar387 + fVar244 * fVar328 + fVar267 * fVar153 + fVar291 * fVar181;
        auVar338._20_4_ =
             fVar350 * fVar124 + fVar254 * fVar330 + fVar280 * fVar171 + fVar301 * fVar265;
        auVar338._24_4_ =
             fVar368 * fVar125 + fVar257 * fVar331 + fVar283 * fVar174 + fVar302 * fVar304;
        auVar338._28_4_ = fVar286 + fVar286 + fVar286 + fVar347;
        auVar216._0_4_ =
             fVar334 * fVar335 + fVar371 * fVar240 + fVar381 * fVar204 + fVar176 * fVar245;
        auVar216._4_4_ =
             fVar343 * fVar344 + fVar376 * fVar182 + fVar385 * fVar358 + fVar177 * fVar255;
        auVar216._8_4_ =
             fVar345 * fVar346 + fVar378 * fVar205 + fVar386 * fVar170 + fVar179 * fVar258;
        auVar216._12_4_ =
             fVar347 * fVar348 + fVar380 * fVar305 + fVar388 * fVar173 + fVar180 * fVar261;
        auVar216._16_4_ =
             fVar334 * fVar387 + fVar371 * fVar328 + fVar381 * fVar153 + fVar181 * fVar245;
        auVar216._20_4_ =
             fVar343 * fVar124 + fVar376 * fVar330 + fVar385 * fVar171 + fVar265 * fVar255;
        auVar216._24_4_ =
             fVar345 * fVar125 + fVar378 * fVar331 + fVar386 * fVar174 + fVar304 * fVar258;
        auVar216._28_4_ =
             *(float *)(bspline_basis1 + lVar148 + 0x122c) +
             *(float *)(bspline_basis1 + lVar148 + 0x16b0) +
             *(float *)(bspline_basis1 + lVar148 + 0x1b34) +
             *(float *)(bspline_basis1 + lVar148 + 0x1fb8);
        auVar249._8_4_ = 0x7fffffff;
        auVar249._0_8_ = 0x7fffffff7fffffff;
        auVar249._12_4_ = 0x7fffffff;
        auVar249._16_4_ = 0x7fffffff;
        auVar249._20_4_ = 0x7fffffff;
        auVar249._24_4_ = 0x7fffffff;
        auVar249._28_4_ = 0x7fffffff;
        auVar135._4_4_ =
             fVar394 * fVar253 + fVar281 * fVar279 + fVar201 * fVar234 + fVar375 * fVar329;
        auVar135._0_4_ =
             fVar389 * fVar243 + fVar268 * fVar266 + fVar183 * fVar318 + fVar370 * fVar327;
        auVar135._8_4_ =
             fVar395 * fVar256 + fVar284 * fVar282 + fVar202 * fVar355 + fVar377 * fVar238;
        auVar135._12_4_ =
             fVar396 * fVar259 + fVar287 * fVar285 + fVar203 * fVar325 + fVar379 * fVar357;
        auVar135._16_4_ =
             fVar389 * fVar262 + fVar268 * fVar288 + fVar183 * fVar326 + fVar370 * fVar242;
        auVar135._20_4_ =
             fVar394 * fVar263 + fVar281 * fVar289 + fVar201 * fVar236 + fVar375 * fVar332;
        auVar135._24_4_ =
             fVar395 * fVar264 + fVar284 * fVar290 + fVar202 * fVar356 + fVar377 * fVar241;
        auVar135._28_4_ =
             *(float *)(bspline_basis0 + lVar148 + 0x16b0) +
             *(float *)(bspline_basis0 + lVar148 + 0x1fb8) +
             fVar347 + *(float *)(bspline_basis1 + lVar148 + 0x4a0);
        auVar24 = vandps_avx(auVar135,auVar249);
        auVar25 = vandps_avx(auVar312,auVar249);
        auVar25 = vmaxps_avx(auVar24,auVar25);
        auVar137._4_4_ = fStack_59c;
        auVar137._0_4_ = local_5a0;
        auVar137._8_4_ = fStack_598;
        auVar137._12_4_ = fStack_594;
        auVar137._16_4_ = fStack_590;
        auVar137._20_4_ = fStack_58c;
        auVar137._24_4_ = fStack_588;
        auVar137._28_4_ = fStack_584;
        auVar24 = vandps_avx(auVar249,auVar137);
        auVar24 = vmaxps_avx(auVar25,auVar24);
        auVar271 = vpermilps_avx(auVar209,0);
        auVar313._16_16_ = auVar271;
        auVar313._0_16_ = auVar271;
        auVar24 = vcmpps_avx(auVar24,auVar313,1);
        auVar27 = vblendvps_avx(auVar135,local_260,auVar24);
        auVar28 = vblendvps_avx(auVar312,auVar26,auVar24);
        auVar24 = vandps_avx(auVar322,auVar249);
        auVar25 = vandps_avx(auVar338,auVar249);
        auVar29 = vmaxps_avx(auVar24,auVar25);
        auVar24 = vandps_avx(auVar216,auVar249);
        auVar24 = vmaxps_avx(auVar29,auVar24);
        auVar29 = vcmpps_avx(auVar24,auVar313,1);
        auVar24 = vblendvps_avx(auVar322,local_260,auVar29);
        auVar26 = vblendvps_avx(auVar338,auVar26,auVar29);
        fVar358 = auVar27._0_4_;
        fVar170 = auVar27._4_4_;
        fVar173 = auVar27._8_4_;
        fVar153 = auVar27._12_4_;
        fVar171 = auVar27._16_4_;
        fVar174 = auVar27._20_4_;
        fVar176 = auVar27._24_4_;
        fVar177 = auVar24._0_4_;
        fVar179 = auVar24._4_4_;
        fVar180 = auVar24._8_4_;
        fVar181 = auVar24._12_4_;
        fVar265 = auVar24._16_4_;
        fVar304 = auVar24._20_4_;
        fVar240 = auVar24._24_4_;
        fStack_684 = -auVar24._28_4_;
        fVar243 = auVar28._0_4_;
        fVar262 = auVar28._4_4_;
        fVar279 = auVar28._8_4_;
        fVar289 = auVar28._12_4_;
        fVar355 = auVar28._16_4_;
        fVar356 = auVar28._20_4_;
        fVar357 = auVar28._24_4_;
        auVar159._0_4_ = fVar243 * fVar243 + fVar358 * fVar358;
        auVar159._4_4_ = fVar262 * fVar262 + fVar170 * fVar170;
        auVar159._8_4_ = fVar279 * fVar279 + fVar173 * fVar173;
        auVar159._12_4_ = fVar289 * fVar289 + fVar153 * fVar153;
        auVar159._16_4_ = fVar355 * fVar355 + fVar171 * fVar171;
        auVar159._20_4_ = fVar356 * fVar356 + fVar174 * fVar174;
        auVar159._24_4_ = fVar357 * fVar357 + fVar176 * fVar176;
        auVar159._28_4_ = auVar338._28_4_ + auVar27._28_4_;
        auVar27 = vrsqrtps_avx(auVar159);
        fVar253 = auVar27._0_4_;
        fVar256 = auVar27._4_4_;
        auVar36._4_4_ = fVar256 * 1.5;
        auVar36._0_4_ = fVar253 * 1.5;
        fVar259 = auVar27._8_4_;
        auVar36._8_4_ = fVar259 * 1.5;
        fVar263 = auVar27._12_4_;
        auVar36._12_4_ = fVar263 * 1.5;
        fVar264 = auVar27._16_4_;
        auVar36._16_4_ = fVar264 * 1.5;
        fVar266 = auVar27._20_4_;
        auVar36._20_4_ = fVar266 * 1.5;
        fVar282 = auVar27._24_4_;
        fVar204 = auVar25._28_4_;
        auVar36._24_4_ = fVar282 * 1.5;
        auVar36._28_4_ = fVar204;
        auVar37._4_4_ = fVar256 * fVar256 * fVar256 * auVar159._4_4_ * 0.5;
        auVar37._0_4_ = fVar253 * fVar253 * fVar253 * auVar159._0_4_ * 0.5;
        auVar37._8_4_ = fVar259 * fVar259 * fVar259 * auVar159._8_4_ * 0.5;
        auVar37._12_4_ = fVar263 * fVar263 * fVar263 * auVar159._12_4_ * 0.5;
        auVar37._16_4_ = fVar264 * fVar264 * fVar264 * auVar159._16_4_ * 0.5;
        auVar37._20_4_ = fVar266 * fVar266 * fVar266 * auVar159._20_4_ * 0.5;
        auVar37._24_4_ = fVar282 * fVar282 * fVar282 * auVar159._24_4_ * 0.5;
        auVar37._28_4_ = auVar159._28_4_;
        auVar25 = vsubps_avx(auVar36,auVar37);
        fVar253 = auVar25._0_4_;
        fVar263 = auVar25._4_4_;
        fVar282 = auVar25._8_4_;
        fVar290 = auVar25._12_4_;
        fVar325 = auVar25._16_4_;
        fVar327 = auVar25._20_4_;
        fVar242 = auVar25._24_4_;
        fVar256 = auVar26._0_4_;
        fVar264 = auVar26._4_4_;
        fVar285 = auVar26._8_4_;
        fVar318 = auVar26._12_4_;
        fVar326 = auVar26._16_4_;
        fVar329 = auVar26._20_4_;
        fVar332 = auVar26._24_4_;
        auVar160._0_4_ = fVar256 * fVar256 + fVar177 * fVar177;
        auVar160._4_4_ = fVar264 * fVar264 + fVar179 * fVar179;
        auVar160._8_4_ = fVar285 * fVar285 + fVar180 * fVar180;
        auVar160._12_4_ = fVar318 * fVar318 + fVar181 * fVar181;
        auVar160._16_4_ = fVar326 * fVar326 + fVar265 * fVar265;
        auVar160._20_4_ = fVar329 * fVar329 + fVar304 * fVar304;
        auVar160._24_4_ = fVar332 * fVar332 + fVar240 * fVar240;
        auVar160._28_4_ = auVar24._28_4_ + auVar25._28_4_;
        auVar24 = vrsqrtps_avx(auVar160);
        fVar259 = auVar24._0_4_;
        fVar266 = auVar24._4_4_;
        auVar38._4_4_ = fVar266 * 1.5;
        auVar38._0_4_ = fVar259 * 1.5;
        fVar288 = auVar24._8_4_;
        auVar38._8_4_ = fVar288 * 1.5;
        fVar234 = auVar24._12_4_;
        auVar38._12_4_ = fVar234 * 1.5;
        fVar236 = auVar24._16_4_;
        auVar38._16_4_ = fVar236 * 1.5;
        fVar238 = auVar24._20_4_;
        auVar38._20_4_ = fVar238 * 1.5;
        fVar241 = auVar24._24_4_;
        auVar38._24_4_ = fVar241 * 1.5;
        auVar38._28_4_ = fVar204;
        auVar39._4_4_ = fVar266 * fVar266 * fVar266 * auVar160._4_4_ * 0.5;
        auVar39._0_4_ = fVar259 * fVar259 * fVar259 * auVar160._0_4_ * 0.5;
        auVar39._8_4_ = fVar288 * fVar288 * fVar288 * auVar160._8_4_ * 0.5;
        auVar39._12_4_ = fVar234 * fVar234 * fVar234 * auVar160._12_4_ * 0.5;
        auVar39._16_4_ = fVar236 * fVar236 * fVar236 * auVar160._16_4_ * 0.5;
        auVar39._20_4_ = fVar238 * fVar238 * fVar238 * auVar160._20_4_ * 0.5;
        auVar39._24_4_ = fVar241 * fVar241 * fVar241 * auVar160._24_4_ * 0.5;
        auVar39._28_4_ = auVar160._28_4_;
        auVar24 = vsubps_avx(auVar38,auVar39);
        fVar259 = auVar24._0_4_;
        fVar266 = auVar24._4_4_;
        fVar288 = auVar24._8_4_;
        fVar234 = auVar24._12_4_;
        fVar236 = auVar24._16_4_;
        fVar238 = auVar24._20_4_;
        fVar241 = auVar24._24_4_;
        fVar182 = (float)local_840._0_4_ * fVar243 * fVar253;
        fVar205 = (float)local_840._4_4_ * fVar262 * fVar263;
        auVar40._4_4_ = fVar205;
        auVar40._0_4_ = fVar182;
        fVar305 = fStack_838 * fVar279 * fVar282;
        auVar40._8_4_ = fVar305;
        fVar289 = fStack_834 * fVar289 * fVar290;
        auVar40._12_4_ = fVar289;
        fStack_690 = fStack_830 * fVar355 * fVar325;
        auVar40._16_4_ = fStack_690;
        fStack_68c = fStack_82c * fVar356 * fVar327;
        auVar40._20_4_ = fStack_68c;
        fStack_688 = fStack_828 * fVar357 * fVar242;
        auVar40._24_4_ = fStack_688;
        auVar40._28_4_ = fStack_684;
        fStack_690 = fStack_690 + auVar361._16_4_;
        fStack_68c = fStack_68c + auVar361._20_4_;
        fStack_688 = fStack_688 + auVar361._24_4_;
        fStack_684 = fStack_684 + auVar361._28_4_;
        fVar243 = (float)local_840._0_4_ * fVar253 * -fVar358;
        fVar262 = (float)local_840._4_4_ * fVar263 * -fVar170;
        auVar41._4_4_ = fVar262;
        auVar41._0_4_ = fVar243;
        fVar279 = fStack_838 * fVar282 * -fVar173;
        auVar41._8_4_ = fVar279;
        fVar355 = fStack_834 * fVar290 * -fVar153;
        auVar41._12_4_ = fVar355;
        fVar356 = fStack_830 * fVar325 * -fVar171;
        auVar41._16_4_ = fVar356;
        fVar357 = fStack_82c * fVar327 * -fVar174;
        auVar41._20_4_ = fVar357;
        fVar358 = fStack_828 * fVar242 * -fVar176;
        auVar41._24_4_ = fVar358;
        auVar41._28_4_ = fVar204;
        local_580._4_4_ = fVar262 + auVar297._4_4_;
        local_580._0_4_ = fVar243 + auVar297._0_4_;
        fStack_578 = fVar279 + auVar297._8_4_;
        fStack_574 = fVar355 + auVar297._12_4_;
        fStack_570 = fVar356 + auVar297._16_4_;
        fStack_56c = fVar357 + auVar297._20_4_;
        fStack_568 = fVar358 + auVar297._24_4_;
        fStack_564 = fVar204 + auVar297._28_4_;
        fVar243 = fVar253 * 0.0 * (float)local_840._0_4_;
        fVar253 = fVar263 * 0.0 * (float)local_840._4_4_;
        auVar42._4_4_ = fVar253;
        auVar42._0_4_ = fVar243;
        fVar262 = fVar282 * 0.0 * fStack_838;
        auVar42._8_4_ = fVar262;
        fVar263 = fVar290 * 0.0 * fStack_834;
        auVar42._12_4_ = fVar263;
        fVar279 = fVar325 * 0.0 * fStack_830;
        auVar42._16_4_ = fVar279;
        fVar282 = fVar327 * 0.0 * fStack_82c;
        auVar42._20_4_ = fVar282;
        fVar290 = fVar242 * 0.0 * fStack_828;
        auVar42._24_4_ = fVar290;
        auVar42._28_4_ = fVar303;
        auVar133._4_4_ = fVar169;
        auVar133._0_4_ = fVar152;
        auVar133._8_4_ = fVar172;
        auVar133._12_4_ = fVar175;
        auVar133._16_4_ = fStack_790;
        auVar133._20_4_ = fStack_78c;
        auVar133._24_4_ = fStack_788;
        auVar133._28_4_ = fStack_784;
        auVar314._0_4_ = fVar243 + fVar152;
        auVar314._4_4_ = fVar253 + fVar169;
        auVar314._8_4_ = fVar262 + fVar172;
        auVar314._12_4_ = fVar263 + fVar175;
        auVar314._16_4_ = fVar279 + fStack_790;
        auVar314._20_4_ = fVar282 + fStack_78c;
        auVar314._24_4_ = fVar290 + fStack_788;
        auVar314._28_4_ = fVar303 + fStack_784;
        fVar243 = (float)local_720._0_4_ * fVar256 * fVar259;
        fVar253 = local_720._4_4_ * fVar264 * fVar266;
        auVar43._4_4_ = fVar253;
        auVar43._0_4_ = fVar243;
        fVar256 = local_720._8_4_ * fVar285 * fVar288;
        auVar43._8_4_ = fVar256;
        fVar262 = local_720._12_4_ * fVar318 * fVar234;
        auVar43._12_4_ = fVar262;
        fVar263 = local_720._16_4_ * fVar326 * fVar236;
        auVar43._16_4_ = fVar263;
        fVar264 = local_720._20_4_ * fVar329 * fVar238;
        auVar43._20_4_ = fVar264;
        fVar279 = local_720._24_4_ * fVar332 * fVar241;
        auVar43._24_4_ = fVar279;
        auVar43._28_4_ = auVar26._28_4_;
        auVar30 = vsubps_avx(auVar361,auVar40);
        auVar339._0_4_ = auVar248._0_4_ + fVar243;
        auVar339._4_4_ = auVar248._4_4_ + fVar253;
        auVar339._8_4_ = auVar248._8_4_ + fVar256;
        auVar339._12_4_ = auVar248._12_4_ + fVar262;
        auVar339._16_4_ = auVar248._16_4_ + fVar263;
        auVar339._20_4_ = auVar248._20_4_ + fVar264;
        auVar339._24_4_ = auVar248._24_4_ + fVar279;
        auVar339._28_4_ = auVar248._28_4_ + auVar26._28_4_;
        fVar243 = (float)local_720._0_4_ * -fVar177 * fVar259;
        fVar253 = local_720._4_4_ * -fVar179 * fVar266;
        auVar44._4_4_ = fVar253;
        auVar44._0_4_ = fVar243;
        fVar256 = local_720._8_4_ * -fVar180 * fVar288;
        auVar44._8_4_ = fVar256;
        fVar262 = local_720._12_4_ * -fVar181 * fVar234;
        auVar44._12_4_ = fVar262;
        fVar263 = local_720._16_4_ * -fVar265 * fVar236;
        auVar44._16_4_ = fVar263;
        fVar264 = local_720._20_4_ * -fVar304 * fVar238;
        auVar44._20_4_ = fVar264;
        fVar279 = local_720._24_4_ * -fVar240 * fVar241;
        auVar44._24_4_ = fVar279;
        auVar44._28_4_ = fVar380;
        auVar31 = vsubps_avx(auVar297,auVar41);
        auVar352._0_4_ = fVar243 + auVar225._0_4_;
        auVar352._4_4_ = fVar253 + auVar225._4_4_;
        auVar352._8_4_ = fVar256 + auVar225._8_4_;
        auVar352._12_4_ = fVar262 + auVar225._12_4_;
        auVar352._16_4_ = fVar263 + auVar225._16_4_;
        auVar352._20_4_ = fVar264 + auVar225._20_4_;
        auVar352._24_4_ = fVar279 + auVar225._24_4_;
        auVar352._28_4_ = fVar380 + auVar225._28_4_;
        fVar243 = fVar259 * 0.0 * (float)local_720._0_4_;
        fVar253 = fVar266 * 0.0 * local_720._4_4_;
        auVar45._4_4_ = fVar253;
        auVar45._0_4_ = fVar243;
        fVar256 = fVar288 * 0.0 * local_720._8_4_;
        auVar45._8_4_ = fVar256;
        fVar259 = fVar234 * 0.0 * local_720._12_4_;
        auVar45._12_4_ = fVar259;
        fVar262 = fVar236 * 0.0 * local_720._16_4_;
        auVar45._16_4_ = fVar262;
        fVar263 = fVar238 * 0.0 * local_720._20_4_;
        auVar45._20_4_ = fVar263;
        fVar264 = fVar241 * 0.0 * local_720._24_4_;
        auVar45._24_4_ = fVar264;
        auVar45._28_4_ = fVar388;
        auVar158 = vsubps_avx(auVar133,auVar42);
        auVar140._4_4_ = fStack_4fc;
        auVar140._0_4_ = local_500;
        auVar140._8_4_ = fStack_4f8;
        auVar140._12_4_ = fStack_4f4;
        auVar140._16_4_ = fStack_4f0;
        auVar140._20_4_ = fStack_4ec;
        auVar140._24_4_ = fStack_4e8;
        auVar140._28_4_ = fStack_4e4;
        auVar391._0_4_ = fVar243 + local_500;
        auVar391._4_4_ = fVar253 + fStack_4fc;
        auVar391._8_4_ = fVar256 + fStack_4f8;
        auVar391._12_4_ = fVar259 + fStack_4f4;
        auVar391._16_4_ = fVar262 + fStack_4f0;
        auVar391._20_4_ = fVar263 + fStack_4ec;
        auVar391._24_4_ = fVar264 + fStack_4e8;
        auVar391._28_4_ = fVar388 + fStack_4e4;
        auVar24 = vsubps_avx(auVar248,auVar43);
        auVar25 = vsubps_avx(auVar225,auVar44);
        auVar26 = vsubps_avx(auVar140,auVar45);
        auVar27 = vsubps_avx(auVar352,auVar31);
        auVar28 = vsubps_avx(auVar391,auVar158);
        auVar46._4_4_ = auVar158._4_4_ * auVar27._4_4_;
        auVar46._0_4_ = auVar158._0_4_ * auVar27._0_4_;
        auVar46._8_4_ = auVar158._8_4_ * auVar27._8_4_;
        auVar46._12_4_ = auVar158._12_4_ * auVar27._12_4_;
        auVar46._16_4_ = auVar158._16_4_ * auVar27._16_4_;
        auVar46._20_4_ = auVar158._20_4_ * auVar27._20_4_;
        auVar46._24_4_ = auVar158._24_4_ * auVar27._24_4_;
        auVar46._28_4_ = fVar388;
        auVar47._4_4_ = auVar31._4_4_ * auVar28._4_4_;
        auVar47._0_4_ = auVar31._0_4_ * auVar28._0_4_;
        auVar47._8_4_ = auVar31._8_4_ * auVar28._8_4_;
        auVar47._12_4_ = auVar31._12_4_ * auVar28._12_4_;
        auVar47._16_4_ = auVar31._16_4_ * auVar28._16_4_;
        auVar47._20_4_ = auVar31._20_4_ * auVar28._20_4_;
        auVar47._24_4_ = auVar31._24_4_ * auVar28._24_4_;
        auVar47._28_4_ = auVar225._28_4_;
        auVar29 = vsubps_avx(auVar47,auVar46);
        auVar48._4_4_ = auVar30._4_4_ * auVar28._4_4_;
        auVar48._0_4_ = auVar30._0_4_ * auVar28._0_4_;
        auVar48._8_4_ = auVar30._8_4_ * auVar28._8_4_;
        auVar48._12_4_ = auVar30._12_4_ * auVar28._12_4_;
        auVar48._16_4_ = auVar30._16_4_ * auVar28._16_4_;
        auVar48._20_4_ = auVar30._20_4_ * auVar28._20_4_;
        auVar48._24_4_ = auVar30._24_4_ * auVar28._24_4_;
        auVar48._28_4_ = auVar28._28_4_;
        auVar23 = vsubps_avx(auVar339,auVar30);
        auVar49._4_4_ = auVar158._4_4_ * auVar23._4_4_;
        auVar49._0_4_ = auVar158._0_4_ * auVar23._0_4_;
        auVar49._8_4_ = auVar158._8_4_ * auVar23._8_4_;
        auVar49._12_4_ = auVar158._12_4_ * auVar23._12_4_;
        auVar49._16_4_ = auVar158._16_4_ * auVar23._16_4_;
        auVar49._20_4_ = auVar158._20_4_ * auVar23._20_4_;
        auVar49._24_4_ = auVar158._24_4_ * auVar23._24_4_;
        auVar49._28_4_ = auVar248._28_4_;
        auVar157 = vsubps_avx(auVar49,auVar48);
        auVar50._4_4_ = auVar23._4_4_ * auVar31._4_4_;
        auVar50._0_4_ = auVar23._0_4_ * auVar31._0_4_;
        auVar50._8_4_ = auVar23._8_4_ * auVar31._8_4_;
        auVar50._12_4_ = auVar23._12_4_ * auVar31._12_4_;
        auVar50._16_4_ = auVar23._16_4_ * auVar31._16_4_;
        auVar50._20_4_ = auVar23._20_4_ * auVar31._20_4_;
        auVar50._24_4_ = auVar23._24_4_ * auVar31._24_4_;
        auVar50._28_4_ = auVar28._28_4_;
        auVar51._4_4_ = auVar30._4_4_ * auVar27._4_4_;
        auVar51._0_4_ = auVar30._0_4_ * auVar27._0_4_;
        auVar51._8_4_ = auVar30._8_4_ * auVar27._8_4_;
        auVar51._12_4_ = auVar30._12_4_ * auVar27._12_4_;
        auVar51._16_4_ = auVar30._16_4_ * auVar27._16_4_;
        auVar51._20_4_ = auVar30._20_4_ * auVar27._20_4_;
        auVar51._24_4_ = auVar30._24_4_ * auVar27._24_4_;
        auVar51._28_4_ = auVar27._28_4_;
        auVar27 = vsubps_avx(auVar51,auVar50);
        auVar161._0_4_ = auVar29._0_4_ * 0.0 + auVar27._0_4_ + auVar157._0_4_ * 0.0;
        auVar161._4_4_ = auVar29._4_4_ * 0.0 + auVar27._4_4_ + auVar157._4_4_ * 0.0;
        auVar161._8_4_ = auVar29._8_4_ * 0.0 + auVar27._8_4_ + auVar157._8_4_ * 0.0;
        auVar161._12_4_ = auVar29._12_4_ * 0.0 + auVar27._12_4_ + auVar157._12_4_ * 0.0;
        auVar161._16_4_ = auVar29._16_4_ * 0.0 + auVar27._16_4_ + auVar157._16_4_ * 0.0;
        auVar161._20_4_ = auVar29._20_4_ * 0.0 + auVar27._20_4_ + auVar157._20_4_ * 0.0;
        auVar161._24_4_ = auVar29._24_4_ * 0.0 + auVar27._24_4_ + auVar157._24_4_ * 0.0;
        auVar161._28_4_ = auVar27._28_4_ + auVar27._28_4_ + auVar157._28_4_;
        auVar157 = vcmpps_avx(auVar161,ZEXT432(0) << 0x20,2);
        auVar136._4_4_ = fVar205 + auVar361._4_4_;
        auVar136._0_4_ = fVar182 + auVar361._0_4_;
        auVar136._8_4_ = fVar305 + auVar361._8_4_;
        auVar136._12_4_ = fVar289 + auVar361._12_4_;
        auVar136._16_4_ = fStack_690;
        auVar136._20_4_ = fStack_68c;
        auVar136._24_4_ = fStack_688;
        auVar136._28_4_ = fStack_684;
        auVar24 = vblendvps_avx(auVar24,auVar136,auVar157);
        auVar25 = vblendvps_avx(auVar25,_local_580,auVar157);
        auVar26 = vblendvps_avx(auVar26,auVar314,auVar157);
        auVar27 = vblendvps_avx(auVar30,auVar339,auVar157);
        auVar28 = vblendvps_avx(auVar31,auVar352,auVar157);
        auVar29 = vblendvps_avx(auVar158,auVar391,auVar157);
        auVar30 = vblendvps_avx(auVar339,auVar30,auVar157);
        auVar31 = vblendvps_avx(auVar352,auVar31,auVar157);
        auVar271 = vpackssdw_avx(local_240._0_16_,local_240._16_16_);
        auStack_650 = auVar361._16_16_;
        auVar23 = vblendvps_avx(auVar391,auVar158,auVar157);
        auVar30 = vsubps_avx(auVar30,auVar24);
        auVar189 = vsubps_avx(auVar31,auVar25);
        auVar23 = vsubps_avx(auVar23,auVar26);
        auVar190 = vsubps_avx(auVar25,auVar28);
        fVar243 = auVar189._0_4_;
        fVar176 = auVar26._0_4_;
        fVar263 = auVar189._4_4_;
        fVar177 = auVar26._4_4_;
        auVar52._4_4_ = fVar177 * fVar263;
        auVar52._0_4_ = fVar176 * fVar243;
        fVar285 = auVar189._8_4_;
        fVar179 = auVar26._8_4_;
        auVar52._8_4_ = fVar179 * fVar285;
        fVar234 = auVar189._12_4_;
        fVar180 = auVar26._12_4_;
        auVar52._12_4_ = fVar180 * fVar234;
        fVar356 = auVar189._16_4_;
        fVar181 = auVar26._16_4_;
        auVar52._16_4_ = fVar181 * fVar356;
        fVar242 = auVar189._20_4_;
        fVar265 = auVar26._20_4_;
        auVar52._20_4_ = fVar265 * fVar242;
        fVar170 = auVar189._24_4_;
        fVar304 = auVar26._24_4_;
        auVar52._24_4_ = fVar304 * fVar170;
        auVar52._28_4_ = auVar31._28_4_;
        fVar253 = auVar25._0_4_;
        fVar335 = auVar23._0_4_;
        fVar264 = auVar25._4_4_;
        fVar344 = auVar23._4_4_;
        auVar53._4_4_ = fVar344 * fVar264;
        auVar53._0_4_ = fVar335 * fVar253;
        fVar288 = auVar25._8_4_;
        fVar346 = auVar23._8_4_;
        auVar53._8_4_ = fVar346 * fVar288;
        fVar355 = auVar25._12_4_;
        fVar348 = auVar23._12_4_;
        auVar53._12_4_ = fVar348 * fVar355;
        fVar327 = auVar25._16_4_;
        fVar183 = auVar23._16_4_;
        auVar53._16_4_ = fVar183 * fVar327;
        fVar332 = auVar25._20_4_;
        fVar201 = auVar23._20_4_;
        auVar53._20_4_ = fVar201 * fVar332;
        fVar173 = auVar25._24_4_;
        fVar202 = auVar23._24_4_;
        uVar7 = auVar158._28_4_;
        auVar53._24_4_ = fVar202 * fVar173;
        auVar53._28_4_ = uVar7;
        auVar31 = vsubps_avx(auVar53,auVar52);
        fVar256 = auVar24._0_4_;
        fVar266 = auVar24._4_4_;
        auVar54._4_4_ = fVar344 * fVar266;
        auVar54._0_4_ = fVar335 * fVar256;
        fVar289 = auVar24._8_4_;
        auVar54._8_4_ = fVar346 * fVar289;
        fVar325 = auVar24._12_4_;
        auVar54._12_4_ = fVar348 * fVar325;
        fVar329 = auVar24._16_4_;
        auVar54._16_4_ = fVar183 * fVar329;
        fVar241 = auVar24._20_4_;
        auVar54._20_4_ = fVar201 * fVar241;
        fVar153 = auVar24._24_4_;
        auVar54._24_4_ = fVar202 * fVar153;
        auVar54._28_4_ = uVar7;
        fVar259 = auVar30._0_4_;
        auVar383._0_4_ = fVar176 * fVar259;
        fVar279 = auVar30._4_4_;
        auVar383._4_4_ = fVar177 * fVar279;
        fVar290 = auVar30._8_4_;
        auVar383._8_4_ = fVar179 * fVar290;
        fVar326 = auVar30._12_4_;
        auVar383._12_4_ = fVar180 * fVar326;
        fVar238 = auVar30._16_4_;
        auVar383._16_4_ = fVar181 * fVar238;
        fVar204 = auVar30._20_4_;
        auVar383._20_4_ = fVar265 * fVar204;
        fVar171 = auVar30._24_4_;
        auVar383._24_4_ = fVar304 * fVar171;
        auVar383._28_4_ = 0;
        auVar158 = vsubps_avx(auVar383,auVar54);
        auVar55._4_4_ = fVar264 * fVar279;
        auVar55._0_4_ = fVar253 * fVar259;
        auVar55._8_4_ = fVar288 * fVar290;
        auVar55._12_4_ = fVar355 * fVar326;
        auVar55._16_4_ = fVar327 * fVar238;
        auVar55._20_4_ = fVar332 * fVar204;
        auVar55._24_4_ = fVar173 * fVar171;
        auVar55._28_4_ = uVar7;
        auVar56._4_4_ = fVar266 * fVar263;
        auVar56._0_4_ = fVar256 * fVar243;
        auVar56._8_4_ = fVar289 * fVar285;
        auVar56._12_4_ = fVar325 * fVar234;
        auVar56._16_4_ = fVar329 * fVar356;
        auVar56._20_4_ = fVar241 * fVar242;
        auVar56._24_4_ = fVar153 * fVar170;
        auVar56._28_4_ = auVar391._28_4_;
        auVar191 = vsubps_avx(auVar56,auVar55);
        auVar192 = vsubps_avx(auVar26,auVar29);
        fVar262 = auVar191._28_4_ + auVar158._28_4_;
        auVar315._0_4_ = auVar191._0_4_ + auVar158._0_4_ * 0.0 + auVar31._0_4_ * 0.0;
        auVar315._4_4_ = auVar191._4_4_ + auVar158._4_4_ * 0.0 + auVar31._4_4_ * 0.0;
        auVar315._8_4_ = auVar191._8_4_ + auVar158._8_4_ * 0.0 + auVar31._8_4_ * 0.0;
        auVar315._12_4_ = auVar191._12_4_ + auVar158._12_4_ * 0.0 + auVar31._12_4_ * 0.0;
        auVar315._16_4_ = auVar191._16_4_ + auVar158._16_4_ * 0.0 + auVar31._16_4_ * 0.0;
        auVar315._20_4_ = auVar191._20_4_ + auVar158._20_4_ * 0.0 + auVar31._20_4_ * 0.0;
        auVar315._24_4_ = auVar191._24_4_ + auVar158._24_4_ * 0.0 + auVar31._24_4_ * 0.0;
        auVar315._28_4_ = fVar262 + auVar31._28_4_;
        fVar240 = auVar190._0_4_;
        fVar182 = auVar190._4_4_;
        auVar57._4_4_ = fVar182 * auVar29._4_4_;
        auVar57._0_4_ = fVar240 * auVar29._0_4_;
        fVar205 = auVar190._8_4_;
        auVar57._8_4_ = fVar205 * auVar29._8_4_;
        fVar305 = auVar190._12_4_;
        auVar57._12_4_ = fVar305 * auVar29._12_4_;
        fVar328 = auVar190._16_4_;
        auVar57._16_4_ = fVar328 * auVar29._16_4_;
        fVar330 = auVar190._20_4_;
        auVar57._20_4_ = fVar330 * auVar29._20_4_;
        fVar331 = auVar190._24_4_;
        auVar57._24_4_ = fVar331 * auVar29._24_4_;
        auVar57._28_4_ = fVar262;
        fVar262 = auVar192._0_4_;
        fVar282 = auVar192._4_4_;
        auVar58._4_4_ = auVar28._4_4_ * fVar282;
        auVar58._0_4_ = auVar28._0_4_ * fVar262;
        fVar318 = auVar192._8_4_;
        auVar58._8_4_ = auVar28._8_4_ * fVar318;
        fVar236 = auVar192._12_4_;
        auVar58._12_4_ = auVar28._12_4_ * fVar236;
        fVar357 = auVar192._16_4_;
        auVar58._16_4_ = auVar28._16_4_ * fVar357;
        fVar358 = auVar192._20_4_;
        auVar58._20_4_ = auVar28._20_4_ * fVar358;
        fVar174 = auVar192._24_4_;
        auVar58._24_4_ = auVar28._24_4_ * fVar174;
        auVar58._28_4_ = auVar191._28_4_;
        auVar158 = vsubps_avx(auVar58,auVar57);
        auVar190 = vsubps_avx(auVar24,auVar27);
        fVar203 = auVar190._0_4_;
        fVar244 = auVar190._4_4_;
        auVar59._4_4_ = fVar244 * auVar29._4_4_;
        auVar59._0_4_ = fVar203 * auVar29._0_4_;
        fVar254 = auVar190._8_4_;
        auVar59._8_4_ = fVar254 * auVar29._8_4_;
        fVar257 = auVar190._12_4_;
        auVar59._12_4_ = fVar257 * auVar29._12_4_;
        fVar260 = auVar190._16_4_;
        auVar59._16_4_ = fVar260 * auVar29._16_4_;
        fVar268 = auVar190._20_4_;
        auVar59._20_4_ = fVar268 * auVar29._20_4_;
        fVar281 = auVar190._24_4_;
        auVar59._24_4_ = fVar281 * auVar29._24_4_;
        auVar59._28_4_ = auVar29._28_4_;
        auVar60._4_4_ = auVar27._4_4_ * fVar282;
        auVar60._0_4_ = auVar27._0_4_ * fVar262;
        auVar60._8_4_ = auVar27._8_4_ * fVar318;
        auVar60._12_4_ = auVar27._12_4_ * fVar236;
        auVar60._16_4_ = auVar27._16_4_ * fVar357;
        auVar60._20_4_ = auVar27._20_4_ * fVar358;
        auVar60._24_4_ = auVar27._24_4_ * fVar174;
        auVar60._28_4_ = auVar31._28_4_;
        auVar31 = vsubps_avx(auVar59,auVar60);
        auVar61._4_4_ = auVar28._4_4_ * fVar244;
        auVar61._0_4_ = auVar28._0_4_ * fVar203;
        auVar61._8_4_ = auVar28._8_4_ * fVar254;
        auVar61._12_4_ = auVar28._12_4_ * fVar257;
        auVar61._16_4_ = auVar28._16_4_ * fVar260;
        auVar61._20_4_ = auVar28._20_4_ * fVar268;
        auVar61._24_4_ = auVar28._24_4_ * fVar281;
        auVar61._28_4_ = auVar29._28_4_;
        auVar62._4_4_ = auVar27._4_4_ * fVar182;
        auVar62._0_4_ = auVar27._0_4_ * fVar240;
        auVar62._8_4_ = auVar27._8_4_ * fVar205;
        auVar62._12_4_ = auVar27._12_4_ * fVar305;
        auVar62._16_4_ = auVar27._16_4_ * fVar328;
        auVar62._20_4_ = auVar27._20_4_ * fVar330;
        auVar62._24_4_ = auVar27._24_4_ * fVar331;
        auVar62._28_4_ = auVar27._28_4_;
        auVar27 = vsubps_avx(auVar62,auVar61);
        auVar168 = ZEXT864(0) << 0x20;
        auVar250._0_4_ = auVar158._0_4_ * 0.0 + auVar27._0_4_ + auVar31._0_4_ * 0.0;
        auVar250._4_4_ = auVar158._4_4_ * 0.0 + auVar27._4_4_ + auVar31._4_4_ * 0.0;
        auVar250._8_4_ = auVar158._8_4_ * 0.0 + auVar27._8_4_ + auVar31._8_4_ * 0.0;
        auVar250._12_4_ = auVar158._12_4_ * 0.0 + auVar27._12_4_ + auVar31._12_4_ * 0.0;
        auVar250._16_4_ = auVar158._16_4_ * 0.0 + auVar27._16_4_ + auVar31._16_4_ * 0.0;
        auVar250._20_4_ = auVar158._20_4_ * 0.0 + auVar27._20_4_ + auVar31._20_4_ * 0.0;
        auVar250._24_4_ = auVar158._24_4_ * 0.0 + auVar27._24_4_ + auVar31._24_4_ * 0.0;
        auVar250._28_4_ = auVar27._28_4_ + auVar27._28_4_ + auVar31._28_4_;
        auVar27 = vmaxps_avx(auVar315,auVar250);
        auVar27 = vcmpps_avx(auVar27,ZEXT832(0) << 0x20,2);
        auVar209 = vpackssdw_avx(auVar27._0_16_,auVar27._16_16_);
        auVar271 = vpand_avx(auVar209,auVar271);
        auVar209 = vpmovsxwd_avx(auVar271);
        auVar178 = vpunpckhwd_avx(auVar271,auVar271);
        auVar227._16_16_ = auVar178;
        auVar227._0_16_ = auVar209;
        if ((((((((auVar227 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar227 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar227 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar227 >> 0x7f,0) == '\0') &&
              (auVar227 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar178 >> 0x3f,0) == '\0') &&
            (auVar227 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar178[0xf]) {
LAB_011007fe:
          auVar230 = ZEXT3264(auVar227);
          auVar278 = ZEXT3264(CONCAT824(local_560[1]._24_8_,
                                        CONCAT816(local_560[1]._16_8_,
                                                  CONCAT88(local_560[1]._8_8_,local_560[1]._0_8_))))
          ;
          auVar317 = ZEXT3264(auVar156);
          auVar324 = ZEXT3264(auVar321);
        }
        else {
          auVar63._4_4_ = fVar282 * fVar263;
          auVar63._0_4_ = fVar262 * fVar243;
          auVar63._8_4_ = fVar318 * fVar285;
          auVar63._12_4_ = fVar236 * fVar234;
          auVar63._16_4_ = fVar357 * fVar356;
          auVar63._20_4_ = fVar358 * fVar242;
          auVar63._24_4_ = fVar174 * fVar170;
          auVar63._28_4_ = auVar178._12_4_;
          auVar364._0_4_ = fVar240 * fVar335;
          auVar364._4_4_ = fVar182 * fVar344;
          auVar364._8_4_ = fVar205 * fVar346;
          auVar364._12_4_ = fVar305 * fVar348;
          auVar364._16_4_ = fVar328 * fVar183;
          auVar364._20_4_ = fVar330 * fVar201;
          auVar364._24_4_ = fVar331 * fVar202;
          auVar364._28_4_ = 0;
          auVar27 = vsubps_avx(auVar364,auVar63);
          auVar64._4_4_ = fVar244 * fVar344;
          auVar64._0_4_ = fVar203 * fVar335;
          auVar64._8_4_ = fVar254 * fVar346;
          auVar64._12_4_ = fVar257 * fVar348;
          auVar64._16_4_ = fVar260 * fVar183;
          auVar64._20_4_ = fVar268 * fVar201;
          auVar64._24_4_ = fVar281 * fVar202;
          auVar64._28_4_ = auVar23._28_4_;
          auVar65._4_4_ = fVar282 * fVar279;
          auVar65._0_4_ = fVar262 * fVar259;
          auVar65._8_4_ = fVar318 * fVar290;
          auVar65._12_4_ = fVar236 * fVar326;
          auVar65._16_4_ = fVar357 * fVar238;
          auVar65._20_4_ = fVar358 * fVar204;
          auVar65._24_4_ = fVar174 * fVar171;
          auVar65._28_4_ = auVar192._28_4_;
          auVar29 = vsubps_avx(auVar65,auVar64);
          auVar66._4_4_ = fVar182 * fVar279;
          auVar66._0_4_ = fVar240 * fVar259;
          auVar66._8_4_ = fVar205 * fVar290;
          auVar66._12_4_ = fVar305 * fVar326;
          auVar66._16_4_ = fVar328 * fVar238;
          auVar66._20_4_ = fVar330 * fVar204;
          auVar66._24_4_ = fVar331 * fVar171;
          auVar66._28_4_ = auVar30._28_4_;
          auVar67._4_4_ = fVar244 * fVar263;
          auVar67._0_4_ = fVar203 * fVar243;
          auVar67._8_4_ = fVar254 * fVar285;
          auVar67._12_4_ = fVar257 * fVar234;
          auVar67._16_4_ = fVar260 * fVar356;
          auVar67._20_4_ = fVar268 * fVar242;
          auVar67._24_4_ = fVar281 * fVar170;
          auVar67._28_4_ = auVar315._28_4_;
          auVar31 = vsubps_avx(auVar67,auVar66);
          auVar316._0_4_ = auVar27._0_4_ * 0.0 + auVar31._0_4_ + auVar29._0_4_ * 0.0;
          auVar316._4_4_ = auVar27._4_4_ * 0.0 + auVar31._4_4_ + auVar29._4_4_ * 0.0;
          auVar316._8_4_ = auVar27._8_4_ * 0.0 + auVar31._8_4_ + auVar29._8_4_ * 0.0;
          auVar316._12_4_ = auVar27._12_4_ * 0.0 + auVar31._12_4_ + auVar29._12_4_ * 0.0;
          auVar316._16_4_ = auVar27._16_4_ * 0.0 + auVar31._16_4_ + auVar29._16_4_ * 0.0;
          auVar316._20_4_ = auVar27._20_4_ * 0.0 + auVar31._20_4_ + auVar29._20_4_ * 0.0;
          auVar316._24_4_ = auVar27._24_4_ * 0.0 + auVar31._24_4_ + auVar29._24_4_ * 0.0;
          auVar316._28_4_ = auVar315._28_4_ + auVar31._28_4_ + auVar30._28_4_;
          auVar28 = vrcpps_avx(auVar316);
          fVar243 = auVar28._0_4_;
          fVar259 = auVar28._4_4_;
          auVar68._4_4_ = auVar316._4_4_ * fVar259;
          auVar68._0_4_ = auVar316._0_4_ * fVar243;
          fVar262 = auVar28._8_4_;
          auVar68._8_4_ = auVar316._8_4_ * fVar262;
          fVar263 = auVar28._12_4_;
          auVar68._12_4_ = auVar316._12_4_ * fVar263;
          fVar279 = auVar28._16_4_;
          auVar68._16_4_ = auVar316._16_4_ * fVar279;
          fVar282 = auVar28._20_4_;
          auVar68._20_4_ = auVar316._20_4_ * fVar282;
          fVar285 = auVar28._24_4_;
          auVar68._24_4_ = auVar316._24_4_ * fVar285;
          auVar68._28_4_ = auVar192._28_4_;
          auVar365._8_4_ = 0x3f800000;
          auVar365._0_8_ = &DAT_3f8000003f800000;
          auVar365._12_4_ = 0x3f800000;
          auVar365._16_4_ = 0x3f800000;
          auVar365._20_4_ = 0x3f800000;
          auVar365._24_4_ = 0x3f800000;
          auVar365._28_4_ = 0x3f800000;
          auVar30 = vsubps_avx(auVar365,auVar68);
          fVar243 = auVar30._0_4_ * fVar243 + fVar243;
          fVar259 = auVar30._4_4_ * fVar259 + fVar259;
          fVar262 = auVar30._8_4_ * fVar262 + fVar262;
          fVar263 = auVar30._12_4_ * fVar263 + fVar263;
          fVar279 = auVar30._16_4_ * fVar279 + fVar279;
          fVar282 = auVar30._20_4_ * fVar282 + fVar282;
          fVar285 = auVar30._24_4_ * fVar285 + fVar285;
          auVar69._4_4_ =
               (auVar27._4_4_ * fVar266 + auVar29._4_4_ * fVar264 + auVar31._4_4_ * fVar177) *
               fVar259;
          auVar69._0_4_ =
               (auVar27._0_4_ * fVar256 + auVar29._0_4_ * fVar253 + auVar31._0_4_ * fVar176) *
               fVar243;
          auVar69._8_4_ =
               (auVar27._8_4_ * fVar289 + auVar29._8_4_ * fVar288 + auVar31._8_4_ * fVar179) *
               fVar262;
          auVar69._12_4_ =
               (auVar27._12_4_ * fVar325 + auVar29._12_4_ * fVar355 + auVar31._12_4_ * fVar180) *
               fVar263;
          auVar69._16_4_ =
               (auVar27._16_4_ * fVar329 + auVar29._16_4_ * fVar327 + auVar31._16_4_ * fVar181) *
               fVar279;
          auVar69._20_4_ =
               (auVar27._20_4_ * fVar241 + auVar29._20_4_ * fVar332 + auVar31._20_4_ * fVar265) *
               fVar282;
          auVar69._24_4_ =
               (auVar27._24_4_ * fVar153 + auVar29._24_4_ * fVar173 + auVar31._24_4_ * fVar304) *
               fVar285;
          auVar69._28_4_ = auVar24._28_4_ + auVar189._28_4_ + auVar26._28_4_;
          auVar209 = vpermilps_avx(ZEXT416(uVar145),0);
          auVar228._16_16_ = auVar209;
          auVar228._0_16_ = auVar209;
          auVar26 = vcmpps_avx(auVar228,auVar69,2);
          uVar7 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar274._4_4_ = uVar7;
          auVar274._0_4_ = uVar7;
          auVar274._8_4_ = uVar7;
          auVar274._12_4_ = uVar7;
          auVar274._16_4_ = uVar7;
          auVar274._20_4_ = uVar7;
          auVar274._24_4_ = uVar7;
          auVar274._28_4_ = uVar7;
          auVar27 = vcmpps_avx(auVar69,auVar274,2);
          auVar26 = vandps_avx(auVar27,auVar26);
          auVar209 = vpackssdw_avx(auVar26._0_16_,auVar26._16_16_);
          auVar271 = vpand_avx(auVar271,auVar209);
          auVar209 = vpmovsxwd_avx(auVar271);
          auVar178 = vpshufd_avx(auVar271,0xee);
          auVar178 = vpmovsxwd_avx(auVar178);
          auVar227._16_16_ = auVar178;
          auVar227._0_16_ = auVar209;
          if ((((((((auVar227 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar227 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar227 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar227 >> 0x7f,0) == '\0') &&
                (auVar227 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar178 >> 0x3f,0) == '\0') &&
              (auVar227 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar178[0xf]) goto LAB_011007fe;
          auVar26 = vcmpps_avx(ZEXT832(0) << 0x20,auVar316,4);
          auVar209 = vpackssdw_avx(auVar26._0_16_,auVar26._16_16_);
          auVar271 = vpand_avx(auVar271,auVar209);
          auVar209 = vpmovsxwd_avx(auVar271);
          auVar271 = vpunpckhwd_avx(auVar271,auVar271);
          auVar230 = ZEXT1664(auVar271);
          auVar298._16_16_ = auVar271;
          auVar298._0_16_ = auVar209;
          auVar278 = ZEXT3264(CONCAT824(local_560[1]._24_8_,
                                        CONCAT816(local_560[1]._16_8_,
                                                  CONCAT88(local_560[1]._8_8_,local_560[1]._0_8_))))
          ;
          auVar317 = ZEXT3264(auVar156);
          auVar324 = ZEXT3264(auVar321);
          if ((((((((auVar298 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar298 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar298 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar298 >> 0x7f,0) != '\0') ||
                (auVar298 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar271 >> 0x3f,0) != '\0') ||
              (auVar298 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar271[0xf] < '\0') {
            auVar229._0_4_ = auVar315._0_4_ * fVar243;
            auVar229._4_4_ = auVar315._4_4_ * fVar259;
            auVar229._8_4_ = auVar315._8_4_ * fVar262;
            auVar229._12_4_ = auVar315._12_4_ * fVar263;
            auVar229._16_4_ = auVar315._16_4_ * fVar279;
            auVar229._20_4_ = auVar315._20_4_ * fVar282;
            auVar229._24_4_ = auVar315._24_4_ * fVar285;
            auVar229._28_4_ = 0;
            auVar70._4_4_ = auVar250._4_4_ * fVar259;
            auVar70._0_4_ = auVar250._0_4_ * fVar243;
            auVar70._8_4_ = auVar250._8_4_ * fVar262;
            auVar70._12_4_ = auVar250._12_4_ * fVar263;
            auVar70._16_4_ = auVar250._16_4_ * fVar279;
            auVar70._20_4_ = auVar250._20_4_ * fVar282;
            auVar70._24_4_ = auVar250._24_4_ * fVar285;
            auVar70._28_4_ = auVar30._28_4_ + auVar28._28_4_;
            auVar275._8_4_ = 0x3f800000;
            auVar275._0_8_ = &DAT_3f8000003f800000;
            auVar275._12_4_ = 0x3f800000;
            auVar275._16_4_ = 0x3f800000;
            auVar275._20_4_ = 0x3f800000;
            auVar275._24_4_ = 0x3f800000;
            auVar275._28_4_ = 0x3f800000;
            auVar156 = vsubps_avx(auVar275,auVar229);
            auVar156 = vblendvps_avx(auVar156,auVar229,auVar157);
            auVar317 = ZEXT3264(auVar156);
            auVar156 = vsubps_avx(auVar275,auVar70);
            auVar230 = ZEXT3264(auVar156);
            _local_280 = vblendvps_avx(auVar156,auVar70,auVar157);
            auVar278 = ZEXT3264(auVar298);
            auVar324 = ZEXT3264(auVar69);
          }
        }
        auVar362 = ZEXT3264(local_820);
        auVar342 = ZEXT3264(auVar337);
        auVar156 = auVar278._0_32_;
        fVar243 = fVar291;
        fVar253 = fVar301;
        fVar256 = fVar302;
        fVar259 = fVar303;
        if ((((((((auVar156 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar156 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar156 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar156 >> 0x7f,0) != '\0') ||
              (auVar278 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar156 >> 0xbf,0) != '\0') ||
            (auVar278 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar278[0x1f] < '\0') {
          auVar321 = vsubps_avx(local_720,_local_840);
          local_620 = auVar317._0_32_;
          fVar253 = (float)local_840._0_4_ + auVar321._0_4_ * auVar317._0_4_;
          fVar256 = (float)local_840._4_4_ + auVar321._4_4_ * auVar317._4_4_;
          fVar259 = fStack_838 + auVar321._8_4_ * auVar317._8_4_;
          fVar262 = fStack_834 + auVar321._12_4_ * auVar317._12_4_;
          fVar263 = fStack_830 + auVar321._16_4_ * auVar317._16_4_;
          fVar264 = fStack_82c + auVar321._20_4_ * auVar317._20_4_;
          fVar266 = fStack_828 + auVar321._24_4_ * auVar317._24_4_;
          fVar279 = fStack_824 + auVar321._28_4_;
          fVar243 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
          auVar71._4_4_ = (fVar256 + fVar256) * fVar243;
          auVar71._0_4_ = (fVar253 + fVar253) * fVar243;
          auVar71._8_4_ = (fVar259 + fVar259) * fVar243;
          auVar71._12_4_ = (fVar262 + fVar262) * fVar243;
          auVar71._16_4_ = (fVar263 + fVar263) * fVar243;
          auVar71._20_4_ = (fVar264 + fVar264) * fVar243;
          auVar71._24_4_ = (fVar266 + fVar266) * fVar243;
          auVar71._28_4_ = fVar279 + fVar279;
          local_640 = auVar324._0_32_;
          auVar321 = vcmpps_avx(local_640,auVar71,6);
          auVar26 = auVar156 & auVar321;
          if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar26 >> 0x7f,0) != '\0') ||
                (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar26 >> 0xbf,0) != '\0') ||
              (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar26[0x1f] < '\0') {
            local_300 = vandps_avx(auVar321,auVar156);
            local_280._0_4_ = (float)local_280._0_4_ + (float)local_280._0_4_ + -1.0;
            local_280._4_4_ = (float)local_280._4_4_ + (float)local_280._4_4_ + -1.0;
            uStack_278._0_4_ = (float)uStack_278 + (float)uStack_278 + -1.0;
            uStack_278._4_4_ = uStack_278._4_4_ + uStack_278._4_4_ + -1.0;
            uStack_270._0_4_ = (float)uStack_270 + (float)uStack_270 + -1.0;
            uStack_270._4_4_ = uStack_270._4_4_ + uStack_270._4_4_ + -1.0;
            uStack_268._0_4_ = (float)uStack_268 + (float)uStack_268 + -1.0;
            uStack_268._4_4_ = uStack_268._4_4_ + uStack_268._4_4_ + -1.0;
            local_3c0 = local_620;
            auVar143 = _local_280;
            auVar156 = _local_280;
            local_3a0 = (float)local_280._0_4_;
            fStack_39c = (float)local_280._4_4_;
            fStack_398 = (float)uStack_278;
            fStack_394 = uStack_278._4_4_;
            fStack_390 = (float)uStack_270;
            fStack_38c = uStack_270._4_4_;
            fStack_388 = (float)uStack_268;
            fStack_384 = uStack_268._4_4_;
            local_380 = local_640;
            local_360 = 0;
            local_35c = uVar18;
            local_350 = local_890;
            uStack_348 = uStack_888;
            local_340 = local_6e0;
            uStack_338 = uStack_6d8;
            local_330 = local_5f0;
            uStack_328 = uStack_5e8;
            local_320 = local_600;
            uStack_318 = uStack_5f8;
            _local_280 = auVar156;
            if ((pGVar20->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              auVar207._0_4_ = 1.0 / auVar220._0_4_;
              auVar207._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar271 = vshufps_avx(auVar207,auVar207,0);
              local_2e0[0] = auVar271._0_4_ * (auVar317._0_4_ + 0.0);
              local_2e0[1] = auVar271._4_4_ * (auVar317._4_4_ + 1.0);
              local_2e0[2] = auVar271._8_4_ * (auVar317._8_4_ + 2.0);
              local_2e0[3] = auVar271._12_4_ * (auVar317._12_4_ + 3.0);
              fStack_2d0 = auVar271._0_4_ * (auVar317._16_4_ + 4.0);
              fStack_2cc = auVar271._4_4_ * (auVar317._20_4_ + 5.0);
              fStack_2c8 = auVar271._8_4_ * (auVar317._24_4_ + 6.0);
              fStack_2c4 = auVar317._28_4_ + 7.0;
              uStack_270 = auVar143._16_8_;
              uStack_268 = auVar156._24_8_;
              local_2c0 = local_280;
              uStack_2b8 = uStack_278;
              uStack_2b0 = uStack_270;
              uStack_2a8 = uStack_268;
              local_2a0 = local_640;
              auVar193._8_4_ = 0x7f800000;
              auVar193._0_8_ = 0x7f8000007f800000;
              auVar193._12_4_ = 0x7f800000;
              auVar193._16_4_ = 0x7f800000;
              auVar193._20_4_ = 0x7f800000;
              auVar193._24_4_ = 0x7f800000;
              auVar193._28_4_ = 0x7f800000;
              auVar156 = vblendvps_avx(auVar193,local_640,local_300);
              auVar321 = vshufps_avx(auVar156,auVar156,0xb1);
              auVar321 = vminps_avx(auVar156,auVar321);
              auVar26 = vshufpd_avx(auVar321,auVar321,5);
              auVar321 = vminps_avx(auVar321,auVar26);
              auVar26 = vperm2f128_avx(auVar321,auVar321,1);
              auVar321 = vminps_avx(auVar321,auVar26);
              auVar321 = vcmpps_avx(auVar156,auVar321,0);
              auVar26 = local_300 & auVar321;
              auVar156 = local_300;
              if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar26 >> 0x7f,0) != '\0') ||
                    (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0xbf,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar26[0x1f] < '\0') {
                auVar156 = vandps_avx(auVar321,local_300);
              }
              uVar144 = vmovmskps_avx(auVar156);
              uVar22 = 0;
              if (uVar144 != 0) {
                for (; (uVar144 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                }
              }
              auVar149 = (undefined1  [8])(ulong)uVar22;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar243 = local_2e0[(long)auVar149];
                uVar7 = *(undefined4 *)((long)&local_2c0 + (long)auVar149 * 4);
                fVar256 = 1.0 - fVar243;
                fVar253 = fVar243 * fVar256 * 4.0;
                auVar271 = ZEXT416((uint)(fVar243 * fVar243 * 0.5));
                auVar271 = vshufps_avx(auVar271,auVar271,0);
                auVar209 = ZEXT416((uint)((fVar256 * fVar256 + fVar253) * 0.5));
                auVar209 = vshufps_avx(auVar209,auVar209,0);
                auVar178 = ZEXT416((uint)((-fVar243 * fVar243 - fVar253) * 0.5));
                auVar178 = vshufps_avx(auVar178,auVar178,0);
                auVar221 = ZEXT416((uint)(fVar256 * -fVar256 * 0.5));
                auVar221 = vshufps_avx(auVar221,auVar221,0);
                auVar208._0_4_ =
                     auVar221._0_4_ * fVar217 +
                     auVar178._0_4_ * (float)local_6e0._0_4_ +
                     auVar271._0_4_ * (float)local_600._0_4_ +
                     auVar209._0_4_ * (float)local_5f0._0_4_;
                auVar208._4_4_ =
                     auVar221._4_4_ * fVar231 +
                     auVar178._4_4_ * (float)local_6e0._4_4_ +
                     auVar271._4_4_ * (float)local_600._4_4_ +
                     auVar209._4_4_ * (float)local_5f0._4_4_;
                auVar208._8_4_ =
                     auVar221._8_4_ * fVar232 +
                     auVar178._8_4_ * (float)uStack_6d8 +
                     auVar271._8_4_ * (float)uStack_5f8 + auVar209._8_4_ * (float)uStack_5e8;
                auVar208._12_4_ =
                     auVar221._12_4_ * fVar233 +
                     auVar178._12_4_ * uStack_6d8._4_4_ +
                     auVar271._12_4_ * uStack_5f8._4_4_ + auVar209._12_4_ * uStack_5e8._4_4_;
                auVar230 = ZEXT464(*(uint *)(local_2a0 + (long)auVar149 * 4));
                *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_2a0 + (long)auVar149 * 4);
                *(float *)(ray + k * 4 + 0xc0) = auVar208._0_4_;
                uVar19 = vextractps_avx(auVar208,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar19;
                uVar19 = vextractps_avx(auVar208,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar19;
                *(float *)(ray + k * 4 + 0xf0) = fVar243;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar7;
                *(uint *)(ray + k * 4 + 0x110) = uVar146;
                *(uint *)(ray + k * 4 + 0x120) = uVar17;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                _local_660 = vshufps_avx(ZEXT416(uVar17),ZEXT416(uVar17),0);
                _local_680 = vshufps_avx(ZEXT416(uVar146),ZEXT416(uVar146),0);
                auStack_670 = auVar24._16_16_;
                _auStack_730 = auVar25._16_16_;
                _local_740 = _local_6e0;
                _auStack_750 = auVar225._16_16_;
                _local_760 = _local_5f0;
                local_6a0 = (float)*(undefined8 *)*local_6c8;
                fStack_69c = (float)((ulong)*(undefined8 *)*local_6c8 >> 0x20);
                fStack_698 = (float)*(undefined8 *)(*local_6c8 + 8);
                fStack_694 = (float)((ulong)*(undefined8 *)(*local_6c8 + 8) >> 0x20);
                local_7a0 = (float)local_600._0_4_;
                fStack_79c = (float)local_600._4_4_;
                fStack_798 = (float)uStack_5f8;
                fStack_794 = uStack_5f8._4_4_;
                _local_780 = auVar337;
                local_560[0] = local_300;
                do {
                  local_720._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_420 = local_2e0[(long)auVar149];
                  local_840 = auVar149;
                  uVar7 = *(undefined4 *)((long)&local_2c0 + (long)auVar149 * 4);
                  auVar187._4_4_ = uVar7;
                  auVar187._0_4_ = uVar7;
                  auVar187._8_4_ = uVar7;
                  auVar187._12_4_ = uVar7;
                  *(undefined4 *)(ray + k * 4 + 0x80) =
                       *(undefined4 *)(local_2a0 + (long)auVar149 * 4);
                  fVar253 = 1.0 - local_420;
                  fVar243 = local_420 * fVar253 * 4.0;
                  auVar271 = ZEXT416((uint)(local_420 * local_420 * 0.5));
                  auVar271 = vshufps_avx(auVar271,auVar271,0);
                  auVar209 = ZEXT416((uint)((fVar253 * fVar253 + fVar243) * 0.5));
                  auVar209 = vshufps_avx(auVar209,auVar209,0);
                  auVar178 = ZEXT416((uint)((-local_420 * local_420 - fVar243) * 0.5));
                  auVar178 = vshufps_avx(auVar178,auVar178,0);
                  local_7d0.context = context->user;
                  auVar221 = ZEXT416((uint)(fVar253 * -fVar253 * 0.5));
                  auVar221 = vshufps_avx(auVar221,auVar221,0);
                  auVar212._0_4_ =
                       auVar221._0_4_ * fVar217 +
                       auVar178._0_4_ * (float)local_740._0_4_ +
                       auVar271._0_4_ * local_7a0 + auVar209._0_4_ * (float)local_760._0_4_;
                  auVar212._4_4_ =
                       auVar221._4_4_ * fVar231 +
                       auVar178._4_4_ * (float)local_740._4_4_ +
                       auVar271._4_4_ * fStack_79c + auVar209._4_4_ * (float)local_760._4_4_;
                  auVar212._8_4_ =
                       auVar221._8_4_ * fVar232 +
                       auVar178._8_4_ * fStack_738 +
                       auVar271._8_4_ * fStack_798 + auVar209._8_4_ * (float)uStack_758;
                  auVar212._12_4_ =
                       auVar221._12_4_ * fVar233 +
                       auVar178._12_4_ * fStack_734 +
                       auVar271._12_4_ * fStack_794 + auVar209._12_4_ * uStack_758._4_4_;
                  auVar271 = vshufps_avx(auVar212,auVar212,0);
                  local_450[0] = (RTCHitN)auVar271[0];
                  local_450[1] = (RTCHitN)auVar271[1];
                  local_450[2] = (RTCHitN)auVar271[2];
                  local_450[3] = (RTCHitN)auVar271[3];
                  local_450[4] = (RTCHitN)auVar271[4];
                  local_450[5] = (RTCHitN)auVar271[5];
                  local_450[6] = (RTCHitN)auVar271[6];
                  local_450[7] = (RTCHitN)auVar271[7];
                  local_450[8] = (RTCHitN)auVar271[8];
                  local_450[9] = (RTCHitN)auVar271[9];
                  local_450[10] = (RTCHitN)auVar271[10];
                  local_450[0xb] = (RTCHitN)auVar271[0xb];
                  local_450[0xc] = (RTCHitN)auVar271[0xc];
                  local_450[0xd] = (RTCHitN)auVar271[0xd];
                  local_450[0xe] = (RTCHitN)auVar271[0xe];
                  local_450[0xf] = (RTCHitN)auVar271[0xf];
                  local_440 = vshufps_avx(auVar212,auVar212,0x55);
                  auVar230 = ZEXT1664(local_440);
                  local_430 = vshufps_avx(auVar212,auVar212,0xaa);
                  fStack_41c = local_420;
                  fStack_418 = local_420;
                  fStack_414 = local_420;
                  local_410 = auVar187;
                  local_400 = local_680;
                  uStack_3f8 = uStack_678;
                  local_3f0 = local_660;
                  uStack_3e8 = uStack_658;
                  vcmpps_avx(auVar168._0_32_,auVar168._0_32_,0xf);
                  uStack_3dc = (local_7d0.context)->instID[0];
                  local_3e0 = uStack_3dc;
                  uStack_3d8 = uStack_3dc;
                  uStack_3d4 = uStack_3dc;
                  uStack_3d0 = (local_7d0.context)->instPrimID[0];
                  uStack_3cc = uStack_3d0;
                  uStack_3c8 = uStack_3d0;
                  uStack_3c4 = uStack_3d0;
                  local_850 = CONCAT44(fStack_69c,local_6a0);
                  uStack_848 = CONCAT44(fStack_694,fStack_698);
                  local_7d0.valid = (int *)&local_850;
                  local_7d0.geometryUserPtr = *(void **)(local_520._0_8_ + 0x18);
                  local_7d0.hit = local_450;
                  local_7d0.N = 4;
                  local_7d0.ray = (RTCRayN *)ray;
                  if (*(code **)(local_520._0_8_ + 0x40) != (code *)0x0) {
                    auVar230 = ZEXT1664(local_440);
                    (**(code **)(local_520._0_8_ + 0x40))(&local_7d0);
                    auVar317._8_56_ = extraout_var;
                    auVar317._0_8_ = extraout_XMM1_Qa;
                    auVar187 = auVar317._0_16_;
                    auVar342 = ZEXT3264(_local_780);
                    auVar362 = ZEXT3264(local_820);
                    auVar324 = ZEXT3264(local_640);
                    auVar317 = ZEXT3264(local_620);
                    auVar168 = ZEXT1664(ZEXT816(0) << 0x40);
                    fVar267 = (float)local_800._0_4_;
                    fVar280 = (float)local_800._4_4_;
                    fVar283 = fStack_7f8;
                    fVar286 = fStack_7f4;
                    fVar235 = fStack_7f0;
                    fVar237 = fStack_7ec;
                    fVar239 = fStack_7e8;
                  }
                  auVar131._8_8_ = uStack_848;
                  auVar131._0_8_ = local_850;
                  if (auVar131 == (undefined1  [16])0x0) {
                    auVar271 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                    auVar209 = vpcmpeqd_avx(auVar187,auVar187);
                    auVar271 = auVar271 ^ auVar209;
                    auVar149 = local_840;
                  }
                  else {
                    p_Var21 = context->args->filter;
                    auVar271 = vpcmpeqd_avx(auVar230._0_16_,auVar230._0_16_);
                    auVar230 = ZEXT1664(auVar271);
                    if ((p_Var21 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(local_520._0_8_ + 0x3e) & 0x40) != 0)))) {
                      (*p_Var21)(&local_7d0);
                      auVar342 = ZEXT3264(_local_780);
                      auVar362 = ZEXT3264(local_820);
                      auVar324 = ZEXT3264(local_640);
                      auVar317 = ZEXT3264(local_620);
                      auVar271 = vpcmpeqd_avx(auVar271,auVar271);
                      auVar230 = ZEXT1664(auVar271);
                      auVar168 = ZEXT1664(ZEXT816(0) << 0x40);
                      fVar267 = (float)local_800._0_4_;
                      fVar280 = (float)local_800._4_4_;
                      fVar283 = fStack_7f8;
                      fVar286 = fStack_7f4;
                      fVar235 = fStack_7f0;
                      fVar237 = fStack_7ec;
                      fVar239 = fStack_7e8;
                    }
                    auVar132._8_8_ = uStack_848;
                    auVar132._0_8_ = local_850;
                    auVar209 = vpcmpeqd_avx(auVar132,_DAT_01feba10);
                    auVar271 = auVar209 ^ auVar230._0_16_;
                    auVar149 = local_840;
                    if (auVar132 != (undefined1  [16])0x0) {
                      auVar209 = auVar209 ^ auVar230._0_16_;
                      auVar178 = vmaskmovps_avx(auVar209,*(undefined1 (*) [16])local_7d0.hit);
                      *(undefined1 (*) [16])(local_7d0.ray + 0xc0) = auVar178;
                      auVar178 = vmaskmovps_avx(auVar209,*(undefined1 (*) [16])
                                                          (local_7d0.hit + 0x10));
                      *(undefined1 (*) [16])(local_7d0.ray + 0xd0) = auVar178;
                      auVar178 = vmaskmovps_avx(auVar209,*(undefined1 (*) [16])
                                                          (local_7d0.hit + 0x20));
                      *(undefined1 (*) [16])(local_7d0.ray + 0xe0) = auVar178;
                      auVar178 = vmaskmovps_avx(auVar209,*(undefined1 (*) [16])
                                                          (local_7d0.hit + 0x30));
                      *(undefined1 (*) [16])(local_7d0.ray + 0xf0) = auVar178;
                      auVar178 = vmaskmovps_avx(auVar209,*(undefined1 (*) [16])
                                                          (local_7d0.hit + 0x40));
                      *(undefined1 (*) [16])(local_7d0.ray + 0x100) = auVar178;
                      auVar178 = vmaskmovps_avx(auVar209,*(undefined1 (*) [16])
                                                          (local_7d0.hit + 0x50));
                      *(undefined1 (*) [16])(local_7d0.ray + 0x110) = auVar178;
                      auVar178 = vmaskmovps_avx(auVar209,*(undefined1 (*) [16])
                                                          (local_7d0.hit + 0x60));
                      *(undefined1 (*) [16])(local_7d0.ray + 0x120) = auVar178;
                      auVar178 = vmaskmovps_avx(auVar209,*(undefined1 (*) [16])
                                                          (local_7d0.hit + 0x70));
                      *(undefined1 (*) [16])(local_7d0.ray + 0x130) = auVar178;
                      auVar209 = vmaskmovps_avx(auVar209,*(undefined1 (*) [16])
                                                          (local_7d0.hit + 0x80));
                      *(undefined1 (*) [16])(local_7d0.ray + 0x140) = auVar209;
                    }
                  }
                  auVar337 = auVar342._0_32_;
                  auVar188._8_8_ = 0x100000001;
                  auVar188._0_8_ = 0x100000001;
                  if ((auVar188 & auVar271) == (undefined1  [16])0x0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_720._0_4_;
                  }
                  *(undefined4 *)(local_560[0] + (long)auVar149 * 4) = 0;
                  uVar7 = *(undefined4 *)(ray + k * 4 + 0x80);
                  auVar167._4_4_ = uVar7;
                  auVar167._0_4_ = uVar7;
                  auVar167._8_4_ = uVar7;
                  auVar167._12_4_ = uVar7;
                  auVar167._16_4_ = uVar7;
                  auVar167._20_4_ = uVar7;
                  auVar167._24_4_ = uVar7;
                  auVar167._28_4_ = uVar7;
                  auVar321 = vcmpps_avx(auVar324._0_32_,auVar167,2);
                  auVar156 = vandps_avx(auVar321,local_560[0]);
                  local_560[0] = local_560[0] & auVar321;
                  bVar122 = (local_560[0] >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar123 = (local_560[0] >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar121 = (local_560[0] >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar120 = SUB321(local_560[0] >> 0x7f,0) != '\0';
                  bVar119 = (local_560[0] & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar118 = SUB321(local_560[0] >> 0xbf,0) != '\0';
                  bVar116 = (local_560[0] & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar115 = local_560[0][0x1f] < '\0';
                  if (((((((bVar122 || bVar123) || bVar121) || bVar120) || bVar119) || bVar118) ||
                      bVar116) || bVar115) {
                    auVar200._8_4_ = 0x7f800000;
                    auVar200._0_8_ = 0x7f8000007f800000;
                    auVar200._12_4_ = 0x7f800000;
                    auVar200._16_4_ = 0x7f800000;
                    auVar200._20_4_ = 0x7f800000;
                    auVar200._24_4_ = 0x7f800000;
                    auVar200._28_4_ = 0x7f800000;
                    auVar321 = vblendvps_avx(auVar200,auVar324._0_32_,auVar156);
                    auVar24 = vshufps_avx(auVar321,auVar321,0xb1);
                    auVar24 = vminps_avx(auVar321,auVar24);
                    auVar25 = vshufpd_avx(auVar24,auVar24,5);
                    auVar24 = vminps_avx(auVar24,auVar25);
                    auVar25 = vperm2f128_avx(auVar24,auVar24,1);
                    auVar230 = ZEXT3264(auVar25);
                    auVar24 = vminps_avx(auVar24,auVar25);
                    auVar24 = vcmpps_avx(auVar321,auVar24,0);
                    auVar25 = auVar156 & auVar24;
                    auVar321 = auVar156;
                    if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar25 >> 0x7f,0) != '\0') ||
                          (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar25 >> 0xbf,0) != '\0') ||
                        (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar25[0x1f] < '\0') {
                      auVar321 = vandps_avx(auVar24,auVar156);
                    }
                    uVar144 = vmovmskps_avx(auVar321);
                    uVar22 = 0;
                    if (uVar144 != 0) {
                      for (; (uVar144 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                      }
                    }
                    auVar149 = (undefined1  [8])(ulong)uVar22;
                  }
                  local_560[0] = auVar156;
                } while (((((((bVar122 || bVar123) || bVar121) || bVar120) || bVar119) || bVar118)
                         || bVar116) || bVar115);
              }
            }
          }
          goto LAB_010fec53;
        }
      }
      if (8 < (int)uVar18) {
        auVar271 = vpshufd_avx(ZEXT416(uVar18),0);
        local_500 = auVar271._0_4_;
        fStack_4fc = auVar271._4_4_;
        fStack_4f8 = auVar271._8_4_;
        fStack_4f4 = auVar271._12_4_;
        auVar271 = vshufps_avx(local_6c0._0_16_,local_6c0._0_16_,0);
        local_260._16_16_ = auVar271;
        local_260._0_16_ = auVar271;
        auVar271 = vpermilps_avx(ZEXT416(uVar145),0);
        local_520._16_16_ = auVar271;
        local_520._0_16_ = auVar271;
        auVar155._0_4_ = 1.0 / (float)local_4c0._0_4_;
        auVar155._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar271 = vshufps_avx(auVar155,auVar155,0);
        register0x00001210 = auVar271;
        _local_120 = auVar271;
        local_1d0 = vshufps_avx(ZEXT416(uVar17),ZEXT416(uVar17),0);
        local_1e0 = vshufps_avx(ZEXT416(uVar146),ZEXT416(uVar146),0);
        auVar168 = ZEXT1664(local_1e0);
        lVar150 = 8;
        local_620 = auVar317._0_32_;
        local_640 = auVar324._0_32_;
        _local_780 = auVar337;
        do {
          pauVar1 = (undefined1 (*) [28])(bspline_basis0 + lVar150 * 4 + lVar148);
          fVar262 = *(float *)*pauVar1;
          fVar263 = *(float *)(*pauVar1 + 4);
          fVar264 = *(float *)(*pauVar1 + 8);
          fVar266 = *(float *)(*pauVar1 + 0xc);
          fVar279 = *(float *)(*pauVar1 + 0x10);
          fVar282 = *(float *)(*pauVar1 + 0x14);
          fVar285 = *(float *)(*pauVar1 + 0x18);
          auVar142 = *pauVar1;
          pauVar2 = (undefined1 (*) [28])(lVar148 + 0x222bfac + lVar150 * 4);
          fVar288 = *(float *)*pauVar2;
          fVar289 = *(float *)(*pauVar2 + 4);
          fVar290 = *(float *)(*pauVar2 + 8);
          fVar318 = *(float *)(*pauVar2 + 0xc);
          fVar234 = *(float *)(*pauVar2 + 0x10);
          fVar355 = *(float *)(*pauVar2 + 0x14);
          fVar325 = *(float *)(*pauVar2 + 0x18);
          auVar141 = *pauVar2;
          pfVar3 = (float *)(lVar148 + 0x222c430 + lVar150 * 4);
          fVar326 = *pfVar3;
          fVar236 = pfVar3[1];
          fVar356 = pfVar3[2];
          fVar327 = pfVar3[3];
          fVar329 = pfVar3[4];
          fVar238 = pfVar3[5];
          fVar357 = pfVar3[6];
          pfVar3 = (float *)(lVar148 + 0x222c8b4 + lVar150 * 4);
          local_6a0 = *pfVar3;
          fStack_69c = pfVar3[1];
          fStack_698 = pfVar3[2];
          fStack_694 = pfVar3[3];
          fStack_690 = pfVar3[4];
          fStack_68c = pfVar3[5];
          fStack_688 = pfVar3[6];
          fStack_684 = pfVar3[7];
          fVar331 = auVar362._0_4_;
          fVar335 = auVar362._4_4_;
          fVar344 = auVar362._8_4_;
          fVar346 = auVar362._12_4_;
          fVar348 = auVar362._16_4_;
          fVar183 = auVar362._20_4_;
          fVar201 = auVar362._24_4_;
          fVar242 = auVar230._28_4_;
          fVar181 = fVar242 + fVar242 + auVar168._28_4_;
          auVar392._0_4_ =
               (float)local_1a0._0_4_ * fVar262 +
               (float)local_a0._0_4_ * fVar288 +
               fVar331 * fVar326 + (float)local_4a0._0_4_ * local_6a0;
          auVar392._4_4_ =
               (float)local_1a0._4_4_ * fVar263 +
               (float)local_a0._4_4_ * fVar289 +
               fVar335 * fVar236 + (float)local_4a0._4_4_ * fStack_69c;
          auVar392._8_4_ =
               fStack_198 * fVar264 +
               fStack_98 * fVar290 + fVar344 * fVar356 + fStack_498 * fStack_698;
          auVar392._12_4_ =
               fStack_194 * fVar266 +
               fStack_94 * fVar318 + fVar346 * fVar327 + fStack_494 * fStack_694;
          auVar392._16_4_ =
               fStack_190 * fVar279 +
               fStack_90 * fVar234 + fVar348 * fVar329 + fStack_490 * fStack_690;
          auVar392._20_4_ =
               fStack_18c * fVar282 +
               fStack_8c * fVar355 + fVar183 * fVar238 + fStack_48c * fStack_68c;
          auVar392._24_4_ =
               fStack_188 * fVar285 +
               fStack_88 * fVar325 + fVar201 * fVar357 + fStack_488 * fStack_688;
          auVar392._28_4_ = fVar242 + fStack_684 + fVar181;
          local_6c0._0_4_ =
               (float)local_5e0._0_4_ * fVar288 + fVar267 * fVar326 + fVar291 * local_6a0 +
               (float)local_200._0_4_ * fVar262;
          local_6c0._4_4_ =
               (float)local_5e0._4_4_ * fVar289 + fVar280 * fVar236 + fVar301 * fStack_69c +
               (float)local_200._4_4_ * fVar263;
          local_6c0._8_4_ =
               fStack_5d8 * fVar290 + fVar283 * fVar356 + fVar302 * fStack_698 +
               fStack_1f8 * fVar264;
          local_6c0._12_4_ =
               fStack_5d4 * fVar318 + fVar286 * fVar327 + fVar303 * fStack_694 +
               fStack_1f4 * fVar266;
          local_6c0._16_4_ =
               fStack_5d0 * fVar234 + fVar235 * fVar329 + fVar243 * fStack_690 +
               fStack_1f0 * fVar279;
          local_6c0._20_4_ =
               fStack_5cc * fVar355 + fVar237 * fVar238 + fVar253 * fStack_68c +
               fStack_1ec * fVar282;
          local_6c0._24_4_ =
               fStack_5c8 * fVar325 + fVar239 * fVar357 + fVar256 * fStack_688 +
               fStack_1e8 * fVar285;
          local_6c0._28_4_ = fVar242 + fVar242 + fVar259 + fVar181;
          fVar153 = fVar262 * (float)local_180._0_4_ +
                    (float)local_c0._0_4_ * fVar288 +
                    fVar326 * (float)local_140._0_4_ + local_6a0 * (float)local_160._0_4_;
          fVar171 = fVar263 * (float)local_180._4_4_ +
                    (float)local_c0._4_4_ * fVar289 +
                    fVar236 * (float)local_140._4_4_ + fStack_69c * (float)local_160._4_4_;
          fVar174 = fVar264 * fStack_178 +
                    fStack_b8 * fVar290 + fVar356 * fStack_138 + fStack_698 * fStack_158;
          fVar176 = fVar266 * fStack_174 +
                    fStack_b4 * fVar318 + fVar327 * fStack_134 + fStack_694 * fStack_154;
          fVar177 = fVar279 * fStack_170 +
                    fStack_b0 * fVar234 + fVar329 * fStack_130 + fStack_690 * fStack_150;
          fVar179 = fVar282 * fStack_16c +
                    fStack_ac * fVar355 + fVar238 * fStack_12c + fStack_68c * fStack_14c;
          fVar180 = fVar285 * fStack_168 +
                    fStack_a8 * fVar325 + fVar357 * fStack_128 + fStack_688 * fStack_148;
          fVar181 = fVar181 + fVar242 + fVar242 + fStack_684;
          pfVar3 = (float *)(bspline_basis1 + lVar150 * 4 + lVar148);
          fVar288 = *pfVar3;
          fVar289 = pfVar3[1];
          fVar290 = pfVar3[2];
          fVar318 = pfVar3[3];
          fVar234 = pfVar3[4];
          fVar355 = pfVar3[5];
          fVar325 = pfVar3[6];
          auVar156 = *(undefined1 (*) [32])(lVar148 + 0x222e3cc + lVar150 * 4);
          auVar168 = ZEXT3264(auVar156);
          pfVar4 = (float *)(lVar148 + 0x222e850 + lVar150 * 4);
          fVar242 = *pfVar4;
          fVar332 = pfVar4[1];
          fVar241 = pfVar4[2];
          fVar204 = pfVar4[3];
          fVar358 = pfVar4[4];
          fVar170 = pfVar4[5];
          fVar173 = pfVar4[6];
          pfVar4 = (float *)(lVar148 + 0x222ecd4 + lVar150 * 4);
          local_220 = *pfVar4;
          fStack_21c = pfVar4[1];
          fStack_218 = pfVar4[2];
          fStack_214 = pfVar4[3];
          fStack_210 = pfVar4[4];
          fStack_20c = pfVar4[5];
          fStack_208 = pfVar4[6];
          fStack_204 = pfVar4[7];
          fVar304 = fVar259 + pfVar4[7];
          fVar262 = auVar156._0_4_;
          fVar263 = auVar156._4_4_;
          fVar264 = auVar156._8_4_;
          fVar266 = auVar156._12_4_;
          fVar279 = auVar156._16_4_;
          fVar282 = auVar156._20_4_;
          fVar285 = auVar156._24_4_;
          fVar265 = fVar259 + fVar259 + fStack_484;
          auVar128._4_4_ = fVar171;
          auVar128._0_4_ = fVar153;
          auVar128._8_4_ = fVar174;
          auVar128._12_4_ = fVar176;
          auVar128._16_4_ = fVar177;
          auVar128._20_4_ = fVar179;
          auVar128._24_4_ = fVar180;
          auVar128._28_4_ = fVar181;
          auVar299._0_4_ =
               fVar288 * (float)local_1a0._0_4_ +
               (float)local_a0._0_4_ * fVar262 +
               fVar331 * fVar242 + (float)local_4a0._0_4_ * local_220;
          auVar299._4_4_ =
               fVar289 * (float)local_1a0._4_4_ +
               (float)local_a0._4_4_ * fVar263 +
               fVar335 * fVar332 + (float)local_4a0._4_4_ * fStack_21c;
          auVar299._8_4_ =
               fVar290 * fStack_198 +
               fStack_98 * fVar264 + fVar344 * fVar241 + fStack_498 * fStack_218;
          auVar299._12_4_ =
               fVar318 * fStack_194 +
               fStack_94 * fVar266 + fVar346 * fVar204 + fStack_494 * fStack_214;
          auVar299._16_4_ =
               fVar234 * fStack_190 +
               fStack_90 * fVar279 + fVar348 * fVar358 + fStack_490 * fStack_210;
          auVar299._20_4_ =
               fVar355 * fStack_18c +
               fStack_8c * fVar282 + fVar183 * fVar170 + fStack_48c * fStack_20c;
          auVar299._24_4_ =
               fVar325 * fStack_188 +
               fStack_88 * fVar285 + fVar201 * fVar173 + fStack_488 * fStack_208;
          auVar299._28_4_ = fVar304 + fVar265;
          auVar276._0_4_ =
               fVar288 * (float)local_200._0_4_ +
               (float)local_5e0._0_4_ * fVar262 + fVar267 * fVar242 + fVar291 * local_220;
          auVar276._4_4_ =
               fVar289 * (float)local_200._4_4_ +
               (float)local_5e0._4_4_ * fVar263 + fVar280 * fVar332 + fVar301 * fStack_21c;
          auVar276._8_4_ =
               fVar290 * fStack_1f8 +
               fStack_5d8 * fVar264 + fVar283 * fVar241 + fVar302 * fStack_218;
          auVar276._12_4_ =
               fVar318 * fStack_1f4 +
               fStack_5d4 * fVar266 + fVar286 * fVar204 + fVar303 * fStack_214;
          auVar276._16_4_ =
               fVar234 * fStack_1f0 +
               fStack_5d0 * fVar279 + fVar235 * fVar358 + fVar243 * fStack_210;
          auVar276._20_4_ =
               fVar355 * fStack_1ec +
               fStack_5cc * fVar282 + fVar237 * fVar170 + fVar253 * fStack_20c;
          auVar276._24_4_ =
               fVar325 * fStack_1e8 +
               fStack_5c8 * fVar285 + fVar239 * fVar173 + fVar256 * fStack_208;
          auVar276._28_4_ = fVar265 + fVar259 + fVar259 + *(float *)pauVar1[1];
          local_840._0_4_ =
               (float)local_c0._0_4_ * fVar262 +
               fVar242 * (float)local_140._0_4_ + local_220 * (float)local_160._0_4_ +
               fVar288 * (float)local_180._0_4_;
          local_840._4_4_ =
               (float)local_c0._4_4_ * fVar263 +
               fVar332 * (float)local_140._4_4_ + fStack_21c * (float)local_160._4_4_ +
               fVar289 * (float)local_180._4_4_;
          fStack_838 = fStack_b8 * fVar264 + fVar241 * fStack_138 + fStack_218 * fStack_158 +
                       fVar290 * fStack_178;
          fStack_834 = fStack_b4 * fVar266 + fVar204 * fStack_134 + fStack_214 * fStack_154 +
                       fVar318 * fStack_174;
          fStack_830 = fStack_b0 * fVar279 + fVar358 * fStack_130 + fStack_210 * fStack_150 +
                       fVar234 * fStack_170;
          fStack_82c = fStack_ac * fVar282 + fVar170 * fStack_12c + fStack_20c * fStack_14c +
                       fVar355 * fStack_16c;
          fStack_828 = fStack_a8 * fVar285 + fVar173 * fStack_128 + fStack_208 * fStack_148 +
                       fVar325 * fStack_168;
          fStack_824 = fVar259 + fVar304 + fVar265;
          auVar24 = vsubps_avx(auVar299,auVar392);
          local_240 = vsubps_avx(auVar276,local_6c0);
          fVar304 = auVar24._0_4_;
          fVar240 = auVar24._4_4_;
          auVar72._4_4_ = fVar240 * local_6c0._4_4_;
          auVar72._0_4_ = fVar304 * (float)local_6c0._0_4_;
          fVar182 = auVar24._8_4_;
          auVar72._8_4_ = fVar182 * local_6c0._8_4_;
          fVar205 = auVar24._12_4_;
          auVar72._12_4_ = fVar205 * local_6c0._12_4_;
          fVar305 = auVar24._16_4_;
          auVar72._16_4_ = fVar305 * local_6c0._16_4_;
          fVar328 = auVar24._20_4_;
          auVar72._20_4_ = fVar328 * local_6c0._20_4_;
          fVar330 = auVar24._24_4_;
          auVar72._24_4_ = fVar330 * local_6c0._24_4_;
          auVar72._28_4_ = fVar265;
          fVar235 = local_240._0_4_;
          fVar237 = local_240._4_4_;
          auVar73._4_4_ = auVar392._4_4_ * fVar237;
          auVar73._0_4_ = auVar392._0_4_ * fVar235;
          fVar239 = local_240._8_4_;
          auVar73._8_4_ = auVar392._8_4_ * fVar239;
          fVar243 = local_240._12_4_;
          auVar73._12_4_ = auVar392._12_4_ * fVar243;
          fVar253 = local_240._16_4_;
          auVar73._16_4_ = auVar392._16_4_ * fVar253;
          fVar256 = local_240._20_4_;
          auVar73._20_4_ = auVar392._20_4_ * fVar256;
          fVar259 = local_240._24_4_;
          auVar73._24_4_ = auVar392._24_4_ * fVar259;
          auVar73._28_4_ = auVar276._28_4_;
          auVar25 = vsubps_avx(auVar72,auVar73);
          auVar321 = vmaxps_avx(auVar128,_local_840);
          auVar74._4_4_ = auVar321._4_4_ * auVar321._4_4_ * (fVar240 * fVar240 + fVar237 * fVar237);
          auVar74._0_4_ = auVar321._0_4_ * auVar321._0_4_ * (fVar304 * fVar304 + fVar235 * fVar235);
          auVar74._8_4_ = auVar321._8_4_ * auVar321._8_4_ * (fVar182 * fVar182 + fVar239 * fVar239);
          auVar74._12_4_ =
               auVar321._12_4_ * auVar321._12_4_ * (fVar205 * fVar205 + fVar243 * fVar243);
          auVar74._16_4_ =
               auVar321._16_4_ * auVar321._16_4_ * (fVar305 * fVar305 + fVar253 * fVar253);
          auVar74._20_4_ =
               auVar321._20_4_ * auVar321._20_4_ * (fVar328 * fVar328 + fVar256 * fVar256);
          auVar74._24_4_ =
               auVar321._24_4_ * auVar321._24_4_ * (fVar330 * fVar330 + fVar259 * fVar259);
          auVar74._28_4_ = auVar299._28_4_ + auVar276._28_4_;
          auVar75._4_4_ = auVar25._4_4_ * auVar25._4_4_;
          auVar75._0_4_ = auVar25._0_4_ * auVar25._0_4_;
          auVar75._8_4_ = auVar25._8_4_ * auVar25._8_4_;
          auVar75._12_4_ = auVar25._12_4_ * auVar25._12_4_;
          auVar75._16_4_ = auVar25._16_4_ * auVar25._16_4_;
          auVar75._20_4_ = auVar25._20_4_ * auVar25._20_4_;
          auVar75._24_4_ = auVar25._24_4_ * auVar25._24_4_;
          auVar75._28_4_ = auVar25._28_4_;
          auVar321 = vcmpps_avx(auVar75,auVar74,2);
          auVar230 = ZEXT3264(auVar321);
          local_7a0 = (float)lVar150;
          auVar209 = vpshufd_avx(ZEXT416((uint)local_7a0),0);
          auVar271 = vpor_avx(auVar209,_DAT_01ff0cf0);
          auVar209 = vpor_avx(auVar209,_DAT_02020ea0);
          auVar139._4_4_ = fStack_4fc;
          auVar139._0_4_ = local_500;
          auVar139._8_4_ = fStack_4f8;
          auVar139._12_4_ = fStack_4f4;
          auVar271 = vpcmpgtd_avx(auVar139,auVar271);
          auVar209 = vpcmpgtd_avx(auVar139,auVar209);
          register0x00001250 = auVar209;
          _local_580 = auVar271;
          auVar25 = _local_580 & auVar321;
          fVar267 = (float)local_800._0_4_;
          fVar280 = (float)local_800._4_4_;
          fVar283 = fStack_7f8;
          fVar286 = fStack_7f4;
          fVar235 = fStack_7f0;
          fVar237 = fStack_7ec;
          fVar239 = fStack_7e8;
          if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar25 >> 0x7f,0) == '\0') &&
                (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar25 >> 0xbf,0) == '\0') &&
              (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar25[0x1f]) {
            auVar362 = ZEXT3264(auVar362._0_32_);
          }
          else {
            local_5a0 = fVar288 * (float)local_780._0_4_ +
                        (float)local_480._0_4_ * fVar262 +
                        (float)local_e0._0_4_ * fVar242 + (float)local_5c0._0_4_ * local_220;
            fStack_59c = fVar289 * (float)local_780._4_4_ +
                         (float)local_480._4_4_ * fVar263 +
                         (float)local_e0._4_4_ * fVar332 + (float)local_5c0._4_4_ * fStack_21c;
            fStack_598 = fVar290 * fStack_778 +
                         fStack_478 * fVar264 + fStack_d8 * fVar241 + fStack_5b8 * fStack_218;
            fStack_594 = fVar318 * fStack_774 +
                         fStack_474 * fVar266 + fStack_d4 * fVar204 + fStack_5b4 * fStack_214;
            fStack_590 = fVar234 * fStack_770 +
                         fStack_470 * fVar279 + fStack_d0 * fVar358 + fStack_5b0 * fStack_210;
            fStack_58c = fVar355 * fStack_76c +
                         fStack_46c * fVar282 + fStack_cc * fVar170 + fStack_5ac * fStack_20c;
            fStack_588 = fVar325 * fStack_768 +
                         fStack_468 * fVar285 + fStack_c8 * fVar173 + fStack_5a8 * fStack_208;
            fStack_584 = local_240._28_4_ + auVar156._28_4_ + auVar209._12_4_ + 0.0;
            local_760._0_4_ = auVar141._0_4_;
            local_760._4_4_ = auVar141._4_4_;
            uStack_758._0_4_ = auVar141._8_4_;
            uStack_758._4_4_ = auVar141._12_4_;
            auStack_750._0_4_ = auVar141._16_4_;
            auStack_750._4_4_ = auVar141._20_4_;
            fStack_748 = auVar141._24_4_;
            pfVar4 = (float *)(lVar148 + 0x222d640 + lVar150 * 4);
            fVar243 = *pfVar4;
            fVar253 = pfVar4[1];
            fVar256 = pfVar4[2];
            fVar259 = pfVar4[3];
            fVar262 = pfVar4[4];
            fVar263 = pfVar4[5];
            fVar264 = pfVar4[6];
            pfVar5 = (float *)(lVar148 + 0x222dac4 + lVar150 * 4);
            fVar266 = *pfVar5;
            fVar279 = pfVar5[1];
            fVar282 = pfVar5[2];
            fVar285 = pfVar5[3];
            fVar288 = pfVar5[4];
            fVar289 = pfVar5[5];
            fVar290 = pfVar5[6];
            pfVar6 = (float *)(lVar148 + 0x222d1bc + lVar150 * 4);
            fVar318 = *pfVar6;
            fVar234 = pfVar6[1];
            fVar355 = pfVar6[2];
            fVar325 = pfVar6[3];
            fVar242 = pfVar6[4];
            fVar332 = pfVar6[5];
            fVar241 = pfVar6[6];
            fVar182 = pfVar4[7] + pfVar5[7];
            fVar205 = pfVar5[7] + fVar181 + 0.0;
            fVar305 = fVar181 + pfVar3[7] + fVar181 + 0.0;
            pfVar3 = (float *)(lVar148 + 0x222cd38 + lVar150 * 4);
            fVar204 = *pfVar3;
            fVar358 = pfVar3[1];
            fVar170 = pfVar3[2];
            fVar173 = pfVar3[3];
            fVar265 = pfVar3[4];
            fVar304 = pfVar3[5];
            fVar240 = pfVar3[6];
            fStack_798 = fVar170 * fStack_198 +
                         fStack_98 * fVar355 + fVar344 * fVar256 + fStack_498 * fVar282;
            fStack_794 = fVar173 * fStack_194 +
                         fStack_94 * fVar325 + fVar346 * fVar259 + fStack_494 * fVar285;
            fStack_790 = fVar265 * fStack_190 +
                         fStack_90 * fVar242 + fVar348 * fVar262 + fStack_490 * fVar288;
            fStack_78c = fVar304 * fStack_18c +
                         fStack_8c * fVar332 + fVar183 * fVar263 + fStack_48c * fVar289;
            fStack_788 = fVar240 * fStack_188 +
                         fStack_88 * fVar241 + fVar201 * fVar264 + fStack_488 * fVar290;
            fStack_784 = fVar182 + fVar205;
            auVar194._0_4_ =
                 fVar204 * (float)local_200._0_4_ +
                 (float)local_800._0_4_ * fVar243 + (float)local_700._0_4_ * fVar266 +
                 (float)local_5e0._0_4_ * fVar318;
            auVar194._4_4_ =
                 fVar358 * (float)local_200._4_4_ +
                 (float)local_800._4_4_ * fVar253 + (float)local_700._4_4_ * fVar279 +
                 (float)local_5e0._4_4_ * fVar234;
            auVar194._8_4_ =
                 fVar170 * fStack_1f8 +
                 fStack_7f8 * fVar256 + fStack_6f8 * fVar282 + fStack_5d8 * fVar355;
            auVar194._12_4_ =
                 fVar173 * fStack_1f4 +
                 fStack_7f4 * fVar259 + fStack_6f4 * fVar285 + fStack_5d4 * fVar325;
            auVar194._16_4_ =
                 fVar265 * fStack_1f0 +
                 fStack_7f0 * fVar262 + fStack_6f0 * fVar288 + fStack_5d0 * fVar242;
            auVar194._20_4_ =
                 fVar304 * fStack_1ec +
                 fStack_7ec * fVar263 + fStack_6ec * fVar289 + fStack_5cc * fVar332;
            auVar194._24_4_ =
                 fVar240 * fStack_1e8 +
                 fStack_7e8 * fVar264 + fStack_6e8 * fVar290 + fStack_5c8 * fVar241;
            auVar194._28_4_ = fVar205 + fVar305;
            auVar373._0_4_ =
                 fVar318 * (float)local_480._0_4_ +
                 (float)local_e0._0_4_ * fVar243 + (float)local_5c0._0_4_ * fVar266 +
                 fVar204 * (float)local_780._0_4_;
            auVar373._4_4_ =
                 fVar234 * (float)local_480._4_4_ +
                 (float)local_e0._4_4_ * fVar253 + (float)local_5c0._4_4_ * fVar279 +
                 fVar358 * (float)local_780._4_4_;
            auVar373._8_4_ =
                 fVar355 * fStack_478 + fStack_d8 * fVar256 + fStack_5b8 * fVar282 +
                 fVar170 * fStack_778;
            auVar373._12_4_ =
                 fVar325 * fStack_474 + fStack_d4 * fVar259 + fStack_5b4 * fVar285 +
                 fVar173 * fStack_774;
            auVar373._16_4_ =
                 fVar242 * fStack_470 + fStack_d0 * fVar262 + fStack_5b0 * fVar288 +
                 fVar265 * fStack_770;
            auVar373._20_4_ =
                 fVar332 * fStack_46c + fStack_cc * fVar263 + fStack_5ac * fVar289 +
                 fVar304 * fStack_76c;
            auVar373._24_4_ =
                 fVar241 * fStack_468 + fStack_c8 * fVar264 + fStack_5a8 * fVar290 +
                 fVar240 * fStack_768;
            auVar373._28_4_ = pfVar6[7] + fVar182 + fVar305;
            pfVar3 = (float *)(lVar148 + 0x222fa60 + lVar150 * 4);
            fVar256 = *pfVar3;
            fVar259 = pfVar3[1];
            fVar262 = pfVar3[2];
            fVar263 = pfVar3[3];
            fVar264 = pfVar3[4];
            fVar282 = pfVar3[5];
            fVar285 = pfVar3[6];
            pfVar4 = (float *)(lVar148 + 0x222fee4 + lVar150 * 4);
            fVar288 = *pfVar4;
            fVar289 = pfVar4[1];
            fVar290 = pfVar4[2];
            fVar355 = pfVar4[3];
            fVar325 = pfVar4[4];
            fVar242 = pfVar4[5];
            fVar332 = pfVar4[6];
            pfVar5 = (float *)(lVar148 + 0x222f5dc + lVar150 * 4);
            fVar241 = *pfVar5;
            fVar170 = pfVar5[1];
            fVar173 = pfVar5[2];
            fVar265 = pfVar5[3];
            fVar304 = pfVar5[4];
            fVar240 = pfVar5[5];
            fVar182 = pfVar5[6];
            pfVar6 = (float *)(lVar148 + 0x222f158 + lVar150 * 4);
            fVar205 = *pfVar6;
            fVar305 = pfVar6[1];
            fVar328 = pfVar6[2];
            fVar330 = pfVar6[3];
            fVar291 = pfVar6[4];
            fVar301 = pfVar6[5];
            fVar302 = pfVar6[6];
            auVar340._0_4_ =
                 fVar205 * (float)local_1a0._0_4_ +
                 (float)local_a0._0_4_ * fVar241 +
                 fVar331 * fVar256 + (float)local_4a0._0_4_ * fVar288;
            auVar340._4_4_ =
                 fVar305 * (float)local_1a0._4_4_ +
                 (float)local_a0._4_4_ * fVar170 +
                 fVar335 * fVar259 + (float)local_4a0._4_4_ * fVar289;
            auVar340._8_4_ =
                 fVar328 * fStack_198 +
                 fStack_98 * fVar173 + fVar344 * fVar262 + fStack_498 * fVar290;
            auVar340._12_4_ =
                 fVar330 * fStack_194 +
                 fStack_94 * fVar265 + fVar346 * fVar263 + fStack_494 * fVar355;
            auVar340._16_4_ =
                 fVar291 * fStack_190 +
                 fStack_90 * fVar304 + fVar348 * fVar264 + fStack_490 * fVar325;
            auVar340._20_4_ =
                 fVar301 * fStack_18c +
                 fStack_8c * fVar240 + fVar183 * fVar282 + fStack_48c * fVar242;
            auVar340._24_4_ =
                 fVar302 * fStack_188 +
                 fStack_88 * fVar182 + fVar201 * fVar285 + fStack_488 * fVar332;
            auVar340._28_4_ = fStack_5c4 + fStack_5c4 + fStack_484 + fStack_5c4;
            auVar366._0_4_ =
                 fVar205 * (float)local_200._0_4_ +
                 fVar241 * (float)local_5e0._0_4_ +
                 (float)local_800._0_4_ * fVar256 + (float)local_700._0_4_ * fVar288;
            auVar366._4_4_ =
                 fVar305 * (float)local_200._4_4_ +
                 fVar170 * (float)local_5e0._4_4_ +
                 (float)local_800._4_4_ * fVar259 + (float)local_700._4_4_ * fVar289;
            auVar366._8_4_ =
                 fVar328 * fStack_1f8 +
                 fVar173 * fStack_5d8 + fStack_7f8 * fVar262 + fStack_6f8 * fVar290;
            auVar366._12_4_ =
                 fVar330 * fStack_1f4 +
                 fVar265 * fStack_5d4 + fStack_7f4 * fVar263 + fStack_6f4 * fVar355;
            auVar366._16_4_ =
                 fVar291 * fStack_1f0 +
                 fVar304 * fStack_5d0 + fStack_7f0 * fVar264 + fStack_6f0 * fVar325;
            auVar366._20_4_ =
                 fVar301 * fStack_1ec +
                 fVar240 * fStack_5cc + fStack_7ec * fVar282 + fStack_6ec * fVar242;
            auVar366._24_4_ =
                 fVar302 * fStack_1e8 +
                 fVar182 * fStack_5c8 + fStack_7e8 * fVar285 + fStack_6e8 * fVar332;
            auVar366._28_4_ = fStack_5c4 + fStack_5c4 + fStack_6e4 + fStack_5c4;
            auVar277._8_4_ = 0x7fffffff;
            auVar277._0_8_ = 0x7fffffff7fffffff;
            auVar277._12_4_ = 0x7fffffff;
            auVar277._16_4_ = 0x7fffffff;
            auVar277._20_4_ = 0x7fffffff;
            auVar277._24_4_ = 0x7fffffff;
            auVar277._28_4_ = 0x7fffffff;
            auVar134._4_4_ =
                 fVar358 * (float)local_1a0._4_4_ +
                 (float)local_a0._4_4_ * fVar234 +
                 fVar335 * fVar253 + (float)local_4a0._4_4_ * fVar279;
            auVar134._0_4_ =
                 fVar204 * (float)local_1a0._0_4_ +
                 (float)local_a0._0_4_ * fVar318 +
                 fVar331 * fVar243 + (float)local_4a0._0_4_ * fVar266;
            auVar134._8_4_ = fStack_798;
            auVar134._12_4_ = fStack_794;
            auVar134._16_4_ = fStack_790;
            auVar134._20_4_ = fStack_78c;
            auVar134._24_4_ = fStack_788;
            auVar134._28_4_ = fStack_784;
            auVar156 = vandps_avx(auVar134,auVar277);
            auVar25 = vandps_avx(auVar194,auVar277);
            auVar25 = vmaxps_avx(auVar156,auVar25);
            auVar156 = vandps_avx(auVar373,auVar277);
            auVar25 = vmaxps_avx(auVar25,auVar156);
            auVar25 = vcmpps_avx(auVar25,local_260,1);
            auVar26 = vblendvps_avx(auVar134,auVar24,auVar25);
            auVar163._0_4_ =
                 fVar205 * (float)local_780._0_4_ +
                 fVar241 * (float)local_480._0_4_ +
                 fVar288 * (float)local_5c0._0_4_ + (float)local_e0._0_4_ * fVar256;
            auVar163._4_4_ =
                 fVar305 * (float)local_780._4_4_ +
                 fVar170 * (float)local_480._4_4_ +
                 fVar289 * (float)local_5c0._4_4_ + (float)local_e0._4_4_ * fVar259;
            auVar163._8_4_ =
                 fVar328 * fStack_778 +
                 fVar173 * fStack_478 + fVar290 * fStack_5b8 + fStack_d8 * fVar262;
            auVar163._12_4_ =
                 fVar330 * fStack_774 +
                 fVar265 * fStack_474 + fVar355 * fStack_5b4 + fStack_d4 * fVar263;
            auVar163._16_4_ =
                 fVar291 * fStack_770 +
                 fVar304 * fStack_470 + fVar325 * fStack_5b0 + fStack_d0 * fVar264;
            auVar163._20_4_ =
                 fVar301 * fStack_76c +
                 fVar240 * fStack_46c + fVar242 * fStack_5ac + fStack_cc * fVar282;
            auVar163._24_4_ =
                 fVar302 * fStack_768 +
                 fVar182 * fStack_468 + fVar332 * fStack_5a8 + fStack_c8 * fVar285;
            auVar163._28_4_ = auVar156._28_4_ + pfVar5[7] + pfVar4[7] + pfVar3[7];
            auVar27 = vblendvps_avx(auVar194,local_240,auVar25);
            auVar156 = vandps_avx(auVar340,auVar277);
            auVar25 = vandps_avx(auVar366,auVar277);
            auVar28 = vmaxps_avx(auVar156,auVar25);
            auVar156 = vandps_avx(auVar163,auVar277);
            auVar156 = vmaxps_avx(auVar28,auVar156);
            local_740._0_4_ = auVar142._0_4_;
            local_740._4_4_ = auVar142._4_4_;
            fStack_738 = auVar142._8_4_;
            fStack_734 = auVar142._12_4_;
            auStack_730._0_4_ = auVar142._16_4_;
            auStack_730._4_4_ = auVar142._20_4_;
            fStack_728 = auVar142._24_4_;
            auVar25 = vcmpps_avx(auVar156,local_260,1);
            auVar156 = vblendvps_avx(auVar340,auVar24,auVar25);
            auVar164._0_4_ =
                 (float)local_780._0_4_ * (float)local_740._0_4_ +
                 (float)local_480._0_4_ * (float)local_760._0_4_ +
                 (float)local_e0._0_4_ * fVar326 + (float)local_5c0._0_4_ * local_6a0;
            auVar164._4_4_ =
                 (float)local_780._4_4_ * (float)local_740._4_4_ +
                 (float)local_480._4_4_ * (float)local_760._4_4_ +
                 (float)local_e0._4_4_ * fVar236 + (float)local_5c0._4_4_ * fStack_69c;
            auVar164._8_4_ =
                 fStack_778 * fStack_738 +
                 fStack_478 * (float)uStack_758 + fStack_d8 * fVar356 + fStack_5b8 * fStack_698;
            auVar164._12_4_ =
                 fStack_774 * fStack_734 +
                 fStack_474 * uStack_758._4_4_ + fStack_d4 * fVar327 + fStack_5b4 * fStack_694;
            auVar164._16_4_ =
                 fStack_770 * (float)auStack_730._0_4_ +
                 fStack_470 * (float)auStack_750._0_4_ +
                 fStack_d0 * fVar329 + fStack_5b0 * fStack_690;
            auVar164._20_4_ =
                 fStack_76c * (float)auStack_730._4_4_ +
                 fStack_46c * (float)auStack_750._4_4_ +
                 fStack_cc * fVar238 + fStack_5ac * fStack_68c;
            auVar164._24_4_ =
                 fStack_768 * fStack_728 +
                 fStack_468 * fStack_748 + fStack_c8 * fVar357 + fStack_5a8 * fStack_688;
            auVar164._28_4_ = auVar28._28_4_ + fStack_584 + auVar209._12_4_ + 0.0;
            auVar24 = vblendvps_avx(auVar366,local_240,auVar25);
            fVar182 = auVar26._0_4_;
            fVar205 = auVar26._4_4_;
            fVar305 = auVar26._8_4_;
            fVar328 = auVar26._12_4_;
            fVar330 = auVar26._16_4_;
            fVar331 = auVar26._20_4_;
            fVar335 = auVar26._24_4_;
            fVar344 = auVar26._28_4_;
            fVar318 = auVar156._0_4_;
            fVar355 = auVar156._4_4_;
            fVar326 = auVar156._8_4_;
            fVar356 = auVar156._12_4_;
            fVar329 = auVar156._16_4_;
            fVar357 = auVar156._20_4_;
            fVar332 = auVar156._24_4_;
            fVar243 = auVar27._0_4_;
            fVar256 = auVar27._4_4_;
            fVar262 = auVar27._8_4_;
            fVar264 = auVar27._12_4_;
            fVar279 = auVar27._16_4_;
            fVar285 = auVar27._20_4_;
            fVar289 = auVar27._24_4_;
            auVar353._0_4_ = fVar243 * fVar243 + fVar182 * fVar182;
            auVar353._4_4_ = fVar256 * fVar256 + fVar205 * fVar205;
            auVar353._8_4_ = fVar262 * fVar262 + fVar305 * fVar305;
            auVar353._12_4_ = fVar264 * fVar264 + fVar328 * fVar328;
            auVar353._16_4_ = fVar279 * fVar279 + fVar330 * fVar330;
            auVar353._20_4_ = fVar285 * fVar285 + fVar331 * fVar331;
            auVar353._24_4_ = fVar289 * fVar289 + fVar335 * fVar335;
            auVar353._28_4_ = fStack_84 + auVar362._28_4_;
            auVar25 = vrsqrtps_avx(auVar353);
            fVar253 = auVar25._0_4_;
            fVar259 = auVar25._4_4_;
            auVar76._4_4_ = fVar259 * 1.5;
            auVar76._0_4_ = fVar253 * 1.5;
            fVar263 = auVar25._8_4_;
            auVar76._8_4_ = fVar263 * 1.5;
            fVar266 = auVar25._12_4_;
            auVar76._12_4_ = fVar266 * 1.5;
            fVar282 = auVar25._16_4_;
            auVar76._16_4_ = fVar282 * 1.5;
            fVar288 = auVar25._20_4_;
            auVar76._20_4_ = fVar288 * 1.5;
            fVar290 = auVar25._24_4_;
            auVar76._24_4_ = fVar290 * 1.5;
            auVar76._28_4_ = auVar366._28_4_;
            auVar77._4_4_ = fVar259 * fVar259 * fVar259 * auVar353._4_4_ * 0.5;
            auVar77._0_4_ = fVar253 * fVar253 * fVar253 * auVar353._0_4_ * 0.5;
            auVar77._8_4_ = fVar263 * fVar263 * fVar263 * auVar353._8_4_ * 0.5;
            auVar77._12_4_ = fVar266 * fVar266 * fVar266 * auVar353._12_4_ * 0.5;
            auVar77._16_4_ = fVar282 * fVar282 * fVar282 * auVar353._16_4_ * 0.5;
            auVar77._20_4_ = fVar288 * fVar288 * fVar288 * auVar353._20_4_ * 0.5;
            auVar77._24_4_ = fVar290 * fVar290 * fVar290 * auVar353._24_4_ * 0.5;
            auVar77._28_4_ = auVar353._28_4_;
            auVar26 = vsubps_avx(auVar76,auVar77);
            fVar204 = auVar26._0_4_;
            fVar358 = auVar26._4_4_;
            fVar170 = auVar26._8_4_;
            fVar173 = auVar26._12_4_;
            fVar265 = auVar26._16_4_;
            fVar304 = auVar26._20_4_;
            fVar240 = auVar26._24_4_;
            fVar253 = auVar24._0_4_;
            fVar259 = auVar24._4_4_;
            fVar263 = auVar24._8_4_;
            fVar266 = auVar24._12_4_;
            fVar282 = auVar24._16_4_;
            fVar288 = auVar24._20_4_;
            fVar290 = auVar24._24_4_;
            auVar323._0_4_ = fVar253 * fVar253 + fVar318 * fVar318;
            auVar323._4_4_ = fVar259 * fVar259 + fVar355 * fVar355;
            auVar323._8_4_ = fVar263 * fVar263 + fVar326 * fVar326;
            auVar323._12_4_ = fVar266 * fVar266 + fVar356 * fVar356;
            auVar323._16_4_ = fVar282 * fVar282 + fVar329 * fVar329;
            auVar323._20_4_ = fVar288 * fVar288 + fVar357 * fVar357;
            auVar323._24_4_ = fVar290 * fVar290 + fVar332 * fVar332;
            auVar323._28_4_ = auVar25._28_4_ + auVar156._28_4_;
            auVar156 = vrsqrtps_avx(auVar323);
            fVar234 = auVar156._0_4_;
            fVar325 = auVar156._4_4_;
            auVar78._4_4_ = fVar325 * 1.5;
            auVar78._0_4_ = fVar234 * 1.5;
            fVar236 = auVar156._8_4_;
            auVar78._8_4_ = fVar236 * 1.5;
            fVar327 = auVar156._12_4_;
            auVar78._12_4_ = fVar327 * 1.5;
            fVar238 = auVar156._16_4_;
            auVar78._16_4_ = fVar238 * 1.5;
            fVar242 = auVar156._20_4_;
            auVar78._20_4_ = fVar242 * 1.5;
            fVar241 = auVar156._24_4_;
            auVar78._24_4_ = fVar241 * 1.5;
            auVar78._28_4_ = auVar366._28_4_;
            auVar79._4_4_ = fVar325 * fVar325 * fVar325 * auVar323._4_4_ * 0.5;
            auVar79._0_4_ = fVar234 * fVar234 * fVar234 * auVar323._0_4_ * 0.5;
            auVar79._8_4_ = fVar236 * fVar236 * fVar236 * auVar323._8_4_ * 0.5;
            auVar79._12_4_ = fVar327 * fVar327 * fVar327 * auVar323._12_4_ * 0.5;
            auVar79._16_4_ = fVar238 * fVar238 * fVar238 * auVar323._16_4_ * 0.5;
            auVar79._20_4_ = fVar242 * fVar242 * fVar242 * auVar323._20_4_ * 0.5;
            auVar79._24_4_ = fVar241 * fVar241 * fVar241 * auVar323._24_4_ * 0.5;
            auVar79._28_4_ = auVar323._28_4_;
            auVar24 = vsubps_avx(auVar78,auVar79);
            fVar234 = auVar24._0_4_;
            fVar325 = auVar24._4_4_;
            fVar236 = auVar24._8_4_;
            fVar327 = auVar24._12_4_;
            fVar238 = auVar24._16_4_;
            fVar242 = auVar24._20_4_;
            fVar241 = auVar24._24_4_;
            fVar243 = fVar153 * fVar204 * fVar243;
            fVar256 = fVar171 * fVar358 * fVar256;
            auVar80._4_4_ = fVar256;
            auVar80._0_4_ = fVar243;
            fVar262 = fVar174 * fVar170 * fVar262;
            auVar80._8_4_ = fVar262;
            fVar264 = fVar176 * fVar173 * fVar264;
            auVar80._12_4_ = fVar264;
            fVar279 = fVar177 * fVar265 * fVar279;
            auVar80._16_4_ = fVar279;
            fVar285 = fVar179 * fVar304 * fVar285;
            auVar80._20_4_ = fVar285;
            fVar289 = fVar180 * fVar240 * fVar289;
            auVar80._24_4_ = fVar289;
            auVar80._28_4_ = auVar156._28_4_;
            local_740._4_4_ = fVar256 + auVar392._4_4_;
            local_740._0_4_ = fVar243 + auVar392._0_4_;
            fStack_738 = fVar262 + auVar392._8_4_;
            fStack_734 = fVar264 + auVar392._12_4_;
            auStack_730._0_4_ = fVar279 + auVar392._16_4_;
            auStack_730._4_4_ = fVar285 + auVar392._20_4_;
            fStack_728 = fVar289 + auVar392._24_4_;
            fStack_724 = auVar156._28_4_ + auVar392._28_4_;
            fVar243 = fVar153 * fVar204 * -fVar182;
            fVar256 = fVar171 * fVar358 * -fVar205;
            auVar81._4_4_ = fVar256;
            auVar81._0_4_ = fVar243;
            fVar262 = fVar174 * fVar170 * -fVar305;
            auVar81._8_4_ = fVar262;
            fVar264 = fVar176 * fVar173 * -fVar328;
            auVar81._12_4_ = fVar264;
            fVar279 = fVar177 * fVar265 * -fVar330;
            auVar81._16_4_ = fVar279;
            fVar285 = fVar179 * fVar304 * -fVar331;
            auVar81._20_4_ = fVar285;
            fVar289 = fVar180 * fVar240 * -fVar335;
            auVar81._24_4_ = fVar289;
            auVar81._28_4_ = -fVar344;
            local_760._4_4_ = local_6c0._4_4_ + fVar256;
            local_760._0_4_ = (float)local_6c0._0_4_ + fVar243;
            uStack_758._0_4_ = local_6c0._8_4_ + fVar262;
            uStack_758._4_4_ = local_6c0._12_4_ + fVar264;
            auStack_750._0_4_ = local_6c0._16_4_ + fVar279;
            auStack_750._4_4_ = local_6c0._20_4_ + fVar285;
            fStack_748 = local_6c0._24_4_ + fVar289;
            fStack_744 = local_6c0._28_4_ + -fVar344;
            fVar243 = fVar204 * 0.0 * fVar153;
            fVar256 = fVar358 * 0.0 * fVar171;
            auVar82._4_4_ = fVar256;
            auVar82._0_4_ = fVar243;
            fVar262 = fVar170 * 0.0 * fVar174;
            auVar82._8_4_ = fVar262;
            fVar264 = fVar173 * 0.0 * fVar176;
            auVar82._12_4_ = fVar264;
            fVar279 = fVar265 * 0.0 * fVar177;
            auVar82._16_4_ = fVar279;
            fVar285 = fVar304 * 0.0 * fVar179;
            auVar82._20_4_ = fVar285;
            fVar289 = fVar240 * 0.0 * fVar180;
            auVar82._24_4_ = fVar289;
            auVar82._28_4_ = fVar344;
            auVar29 = vsubps_avx(auVar392,auVar80);
            auVar393._0_4_ = fVar243 + auVar164._0_4_;
            auVar393._4_4_ = fVar256 + auVar164._4_4_;
            auVar393._8_4_ = fVar262 + auVar164._8_4_;
            auVar393._12_4_ = fVar264 + auVar164._12_4_;
            auVar393._16_4_ = fVar279 + auVar164._16_4_;
            auVar393._20_4_ = fVar285 + auVar164._20_4_;
            auVar393._24_4_ = fVar289 + auVar164._24_4_;
            auVar393._28_4_ = fVar344 + auVar164._28_4_;
            fVar243 = (float)local_840._0_4_ * fVar234 * fVar253;
            fVar253 = (float)local_840._4_4_ * fVar325 * fVar259;
            auVar83._4_4_ = fVar253;
            auVar83._0_4_ = fVar243;
            fVar256 = fStack_838 * fVar236 * fVar263;
            auVar83._8_4_ = fVar256;
            fVar259 = fStack_834 * fVar327 * fVar266;
            auVar83._12_4_ = fVar259;
            fVar262 = fStack_830 * fVar238 * fVar282;
            auVar83._16_4_ = fVar262;
            fVar263 = fStack_82c * fVar242 * fVar288;
            auVar83._20_4_ = fVar263;
            fVar264 = fStack_828 * fVar241 * fVar290;
            auVar83._24_4_ = fVar264;
            auVar83._28_4_ = fVar181;
            auVar157 = vsubps_avx(local_6c0,auVar81);
            auVar374._0_4_ = auVar299._0_4_ + fVar243;
            auVar374._4_4_ = auVar299._4_4_ + fVar253;
            auVar374._8_4_ = auVar299._8_4_ + fVar256;
            auVar374._12_4_ = auVar299._12_4_ + fVar259;
            auVar374._16_4_ = auVar299._16_4_ + fVar262;
            auVar374._20_4_ = auVar299._20_4_ + fVar263;
            auVar374._24_4_ = auVar299._24_4_ + fVar264;
            auVar374._28_4_ = auVar299._28_4_ + fVar181;
            fVar243 = fVar234 * -fVar318 * (float)local_840._0_4_;
            fVar253 = fVar325 * -fVar355 * (float)local_840._4_4_;
            auVar84._4_4_ = fVar253;
            auVar84._0_4_ = fVar243;
            fVar256 = fVar236 * -fVar326 * fStack_838;
            auVar84._8_4_ = fVar256;
            fVar259 = fVar327 * -fVar356 * fStack_834;
            auVar84._12_4_ = fVar259;
            fVar262 = fVar238 * -fVar329 * fStack_830;
            auVar84._16_4_ = fVar262;
            fVar263 = fVar242 * -fVar357 * fStack_82c;
            auVar84._20_4_ = fVar263;
            fVar264 = fVar241 * -fVar332 * fStack_828;
            auVar84._24_4_ = fVar264;
            auVar84._28_4_ = auVar392._28_4_;
            auVar158 = vsubps_avx(auVar164,auVar82);
            auVar251._0_4_ = auVar276._0_4_ + fVar243;
            auVar251._4_4_ = auVar276._4_4_ + fVar253;
            auVar251._8_4_ = auVar276._8_4_ + fVar256;
            auVar251._12_4_ = auVar276._12_4_ + fVar259;
            auVar251._16_4_ = auVar276._16_4_ + fVar262;
            auVar251._20_4_ = auVar276._20_4_ + fVar263;
            auVar251._24_4_ = auVar276._24_4_ + fVar264;
            auVar251._28_4_ = auVar276._28_4_ + auVar392._28_4_;
            fVar243 = fVar234 * 0.0 * (float)local_840._0_4_;
            fVar253 = fVar325 * 0.0 * (float)local_840._4_4_;
            auVar85._4_4_ = fVar253;
            auVar85._0_4_ = fVar243;
            fVar256 = fVar236 * 0.0 * fStack_838;
            auVar85._8_4_ = fVar256;
            fVar259 = fVar327 * 0.0 * fStack_834;
            auVar85._12_4_ = fVar259;
            fVar262 = fVar238 * 0.0 * fStack_830;
            auVar85._16_4_ = fVar262;
            fVar263 = fVar242 * 0.0 * fStack_82c;
            auVar85._20_4_ = fVar263;
            fVar264 = fVar241 * 0.0 * fStack_828;
            auVar85._24_4_ = fVar264;
            auVar85._28_4_ = auVar164._28_4_;
            auVar156 = vsubps_avx(auVar299,auVar83);
            auVar138._4_4_ = fStack_59c;
            auVar138._0_4_ = local_5a0;
            auVar138._8_4_ = fStack_598;
            auVar138._12_4_ = fStack_594;
            auVar138._16_4_ = fStack_590;
            auVar138._20_4_ = fStack_58c;
            auVar138._24_4_ = fStack_588;
            auVar138._28_4_ = fStack_584;
            auVar341._0_4_ = local_5a0 + fVar243;
            auVar341._4_4_ = fStack_59c + fVar253;
            auVar341._8_4_ = fStack_598 + fVar256;
            auVar341._12_4_ = fStack_594 + fVar259;
            auVar341._16_4_ = fStack_590 + fVar262;
            auVar341._20_4_ = fStack_58c + fVar263;
            auVar341._24_4_ = fStack_588 + fVar264;
            auVar341._28_4_ = fStack_584 + auVar164._28_4_;
            auVar25 = vsubps_avx(auVar276,auVar84);
            auVar26 = vsubps_avx(auVar138,auVar85);
            auVar27 = vsubps_avx(auVar251,auVar157);
            auVar28 = vsubps_avx(auVar341,auVar158);
            auVar86._4_4_ = auVar158._4_4_ * auVar27._4_4_;
            auVar86._0_4_ = auVar158._0_4_ * auVar27._0_4_;
            auVar86._8_4_ = auVar158._8_4_ * auVar27._8_4_;
            auVar86._12_4_ = auVar158._12_4_ * auVar27._12_4_;
            auVar86._16_4_ = auVar158._16_4_ * auVar27._16_4_;
            auVar86._20_4_ = auVar158._20_4_ * auVar27._20_4_;
            auVar86._24_4_ = auVar158._24_4_ * auVar27._24_4_;
            auVar86._28_4_ = auVar366._28_4_;
            auVar87._4_4_ = auVar157._4_4_ * auVar28._4_4_;
            auVar87._0_4_ = auVar157._0_4_ * auVar28._0_4_;
            auVar87._8_4_ = auVar157._8_4_ * auVar28._8_4_;
            auVar87._12_4_ = auVar157._12_4_ * auVar28._12_4_;
            auVar87._16_4_ = auVar157._16_4_ * auVar28._16_4_;
            auVar87._20_4_ = auVar157._20_4_ * auVar28._20_4_;
            auVar87._24_4_ = auVar157._24_4_ * auVar28._24_4_;
            auVar87._28_4_ = fStack_584;
            auVar30 = vsubps_avx(auVar87,auVar86);
            auVar88._4_4_ = auVar29._4_4_ * auVar28._4_4_;
            auVar88._0_4_ = auVar29._0_4_ * auVar28._0_4_;
            auVar88._8_4_ = auVar29._8_4_ * auVar28._8_4_;
            auVar88._12_4_ = auVar29._12_4_ * auVar28._12_4_;
            auVar88._16_4_ = auVar29._16_4_ * auVar28._16_4_;
            auVar88._20_4_ = auVar29._20_4_ * auVar28._20_4_;
            auVar88._24_4_ = auVar29._24_4_ * auVar28._24_4_;
            auVar88._28_4_ = auVar28._28_4_;
            auVar28 = vsubps_avx(auVar374,auVar29);
            auVar89._4_4_ = auVar158._4_4_ * auVar28._4_4_;
            auVar89._0_4_ = auVar158._0_4_ * auVar28._0_4_;
            auVar89._8_4_ = auVar158._8_4_ * auVar28._8_4_;
            auVar89._12_4_ = auVar158._12_4_ * auVar28._12_4_;
            auVar89._16_4_ = auVar158._16_4_ * auVar28._16_4_;
            auVar89._20_4_ = auVar158._20_4_ * auVar28._20_4_;
            auVar89._24_4_ = auVar158._24_4_ * auVar28._24_4_;
            auVar89._28_4_ = auVar24._28_4_;
            auVar31 = vsubps_avx(auVar89,auVar88);
            auVar90._4_4_ = auVar157._4_4_ * auVar28._4_4_;
            auVar90._0_4_ = auVar157._0_4_ * auVar28._0_4_;
            auVar90._8_4_ = auVar157._8_4_ * auVar28._8_4_;
            auVar90._12_4_ = auVar157._12_4_ * auVar28._12_4_;
            auVar90._16_4_ = auVar157._16_4_ * auVar28._16_4_;
            auVar90._20_4_ = auVar157._20_4_ * auVar28._20_4_;
            auVar90._24_4_ = auVar157._24_4_ * auVar28._24_4_;
            auVar90._28_4_ = auVar24._28_4_;
            auVar91._4_4_ = auVar29._4_4_ * auVar27._4_4_;
            auVar91._0_4_ = auVar29._0_4_ * auVar27._0_4_;
            auVar91._8_4_ = auVar29._8_4_ * auVar27._8_4_;
            auVar91._12_4_ = auVar29._12_4_ * auVar27._12_4_;
            auVar91._16_4_ = auVar29._16_4_ * auVar27._16_4_;
            auVar91._20_4_ = auVar29._20_4_ * auVar27._20_4_;
            auVar91._24_4_ = auVar29._24_4_ * auVar27._24_4_;
            auVar91._28_4_ = auVar27._28_4_;
            auVar24 = vsubps_avx(auVar91,auVar90);
            auVar195._0_4_ = auVar30._0_4_ * 0.0 + auVar24._0_4_ + auVar31._0_4_ * 0.0;
            auVar195._4_4_ = auVar30._4_4_ * 0.0 + auVar24._4_4_ + auVar31._4_4_ * 0.0;
            auVar195._8_4_ = auVar30._8_4_ * 0.0 + auVar24._8_4_ + auVar31._8_4_ * 0.0;
            auVar195._12_4_ = auVar30._12_4_ * 0.0 + auVar24._12_4_ + auVar31._12_4_ * 0.0;
            auVar195._16_4_ = auVar30._16_4_ * 0.0 + auVar24._16_4_ + auVar31._16_4_ * 0.0;
            auVar195._20_4_ = auVar30._20_4_ * 0.0 + auVar24._20_4_ + auVar31._20_4_ * 0.0;
            auVar195._24_4_ = auVar30._24_4_ * 0.0 + auVar24._24_4_ + auVar31._24_4_ * 0.0;
            auVar195._28_4_ = auVar30._28_4_ + auVar24._28_4_ + auVar31._28_4_;
            auVar23 = vcmpps_avx(auVar195,ZEXT832(0) << 0x20,2);
            auVar156 = vblendvps_avx(auVar156,_local_740,auVar23);
            auVar230 = ZEXT3264(auVar156);
            auVar24 = vblendvps_avx(auVar25,_local_760,auVar23);
            auVar25 = vblendvps_avx(auVar26,auVar393,auVar23);
            auVar26 = vblendvps_avx(auVar29,auVar374,auVar23);
            auVar27 = vblendvps_avx(auVar157,auVar251,auVar23);
            auVar28 = vblendvps_avx(auVar158,auVar341,auVar23);
            auVar29 = vblendvps_avx(auVar374,auVar29,auVar23);
            auVar30 = vblendvps_avx(auVar251,auVar157,auVar23);
            auVar31 = vblendvps_avx(auVar341,auVar158,auVar23);
            local_6c0 = vandps_avx(_local_580,auVar321);
            auVar29 = vsubps_avx(auVar29,auVar156);
            auVar189 = vsubps_avx(auVar30,auVar24);
            auVar31 = vsubps_avx(auVar31,auVar25);
            auVar190 = vsubps_avx(auVar24,auVar27);
            fVar243 = auVar189._0_4_;
            fVar183 = auVar25._0_4_;
            fVar266 = auVar189._4_4_;
            fVar201 = auVar25._4_4_;
            auVar92._4_4_ = fVar201 * fVar266;
            auVar92._0_4_ = fVar183 * fVar243;
            fVar318 = auVar189._8_4_;
            fVar202 = auVar25._8_4_;
            auVar92._8_4_ = fVar202 * fVar318;
            fVar327 = auVar189._12_4_;
            fVar203 = auVar25._12_4_;
            auVar92._12_4_ = fVar203 * fVar327;
            fVar204 = auVar189._16_4_;
            fVar244 = auVar25._16_4_;
            auVar92._16_4_ = fVar244 * fVar204;
            fVar182 = auVar189._20_4_;
            fVar254 = auVar25._20_4_;
            auVar92._20_4_ = fVar254 * fVar182;
            fVar344 = auVar189._24_4_;
            fVar257 = auVar25._24_4_;
            auVar92._24_4_ = fVar257 * fVar344;
            auVar92._28_4_ = auVar30._28_4_;
            fVar253 = auVar24._0_4_;
            fVar260 = auVar31._0_4_;
            fVar279 = auVar24._4_4_;
            fVar268 = auVar31._4_4_;
            auVar93._4_4_ = fVar268 * fVar279;
            auVar93._0_4_ = fVar260 * fVar253;
            fVar234 = auVar24._8_4_;
            fVar281 = auVar31._8_4_;
            auVar93._8_4_ = fVar281 * fVar234;
            fVar329 = auVar24._12_4_;
            fVar284 = auVar31._12_4_;
            auVar93._12_4_ = fVar284 * fVar329;
            fVar358 = auVar24._16_4_;
            fVar287 = auVar31._16_4_;
            auVar93._16_4_ = fVar287 * fVar358;
            fVar205 = auVar24._20_4_;
            fVar349 = auVar31._20_4_;
            auVar93._20_4_ = fVar349 * fVar205;
            fVar346 = auVar24._24_4_;
            fVar350 = auVar31._24_4_;
            uVar7 = auVar157._28_4_;
            auVar93._24_4_ = fVar350 * fVar346;
            auVar93._28_4_ = uVar7;
            auVar30 = vsubps_avx(auVar93,auVar92);
            fVar256 = auVar156._0_4_;
            fVar282 = auVar156._4_4_;
            auVar94._4_4_ = fVar268 * fVar282;
            auVar94._0_4_ = fVar260 * fVar256;
            fVar355 = auVar156._8_4_;
            auVar94._8_4_ = fVar281 * fVar355;
            fVar238 = auVar156._12_4_;
            auVar94._12_4_ = fVar284 * fVar238;
            fVar170 = auVar156._16_4_;
            auVar94._16_4_ = fVar287 * fVar170;
            fVar305 = auVar156._20_4_;
            auVar94._20_4_ = fVar349 * fVar305;
            fVar348 = auVar156._24_4_;
            auVar94._24_4_ = fVar350 * fVar348;
            auVar94._28_4_ = uVar7;
            fVar259 = auVar29._0_4_;
            fVar285 = auVar29._4_4_;
            auVar95._4_4_ = fVar201 * fVar285;
            auVar95._0_4_ = fVar183 * fVar259;
            fVar325 = auVar29._8_4_;
            auVar95._8_4_ = fVar202 * fVar325;
            fVar357 = auVar29._12_4_;
            auVar95._12_4_ = fVar203 * fVar357;
            fVar173 = auVar29._16_4_;
            auVar95._16_4_ = fVar244 * fVar173;
            fVar328 = auVar29._20_4_;
            auVar95._20_4_ = fVar254 * fVar328;
            fVar291 = auVar29._24_4_;
            auVar95._24_4_ = fVar257 * fVar291;
            auVar95._28_4_ = auVar374._28_4_;
            auVar157 = vsubps_avx(auVar95,auVar94);
            auVar96._4_4_ = fVar279 * fVar285;
            auVar96._0_4_ = fVar253 * fVar259;
            auVar96._8_4_ = fVar234 * fVar325;
            auVar96._12_4_ = fVar329 * fVar357;
            auVar96._16_4_ = fVar358 * fVar173;
            auVar96._20_4_ = fVar205 * fVar328;
            auVar96._24_4_ = fVar346 * fVar291;
            auVar96._28_4_ = uVar7;
            auVar97._4_4_ = fVar282 * fVar266;
            auVar97._0_4_ = fVar256 * fVar243;
            auVar97._8_4_ = fVar355 * fVar318;
            auVar97._12_4_ = fVar238 * fVar327;
            auVar97._16_4_ = fVar170 * fVar204;
            auVar97._20_4_ = fVar305 * fVar182;
            auVar97._24_4_ = fVar348 * fVar344;
            auVar97._28_4_ = auVar158._28_4_;
            auVar158 = vsubps_avx(auVar97,auVar96);
            auVar191 = vsubps_avx(auVar25,auVar28);
            fVar263 = auVar158._28_4_ + auVar157._28_4_;
            auVar354._0_4_ = auVar158._0_4_ + auVar157._0_4_ * 0.0 + auVar30._0_4_ * 0.0;
            auVar354._4_4_ = auVar158._4_4_ + auVar157._4_4_ * 0.0 + auVar30._4_4_ * 0.0;
            auVar354._8_4_ = auVar158._8_4_ + auVar157._8_4_ * 0.0 + auVar30._8_4_ * 0.0;
            auVar354._12_4_ = auVar158._12_4_ + auVar157._12_4_ * 0.0 + auVar30._12_4_ * 0.0;
            auVar354._16_4_ = auVar158._16_4_ + auVar157._16_4_ * 0.0 + auVar30._16_4_ * 0.0;
            auVar354._20_4_ = auVar158._20_4_ + auVar157._20_4_ * 0.0 + auVar30._20_4_ * 0.0;
            auVar354._24_4_ = auVar158._24_4_ + auVar157._24_4_ * 0.0 + auVar30._24_4_ * 0.0;
            auVar354._28_4_ = fVar263 + auVar30._28_4_;
            fVar262 = auVar190._0_4_;
            fVar288 = auVar190._4_4_;
            auVar98._4_4_ = auVar28._4_4_ * fVar288;
            auVar98._0_4_ = auVar28._0_4_ * fVar262;
            fVar326 = auVar190._8_4_;
            auVar98._8_4_ = auVar28._8_4_ * fVar326;
            fVar242 = auVar190._12_4_;
            auVar98._12_4_ = auVar28._12_4_ * fVar242;
            fVar265 = auVar190._16_4_;
            auVar98._16_4_ = auVar28._16_4_ * fVar265;
            fVar330 = auVar190._20_4_;
            auVar98._20_4_ = auVar28._20_4_ * fVar330;
            fVar301 = auVar190._24_4_;
            auVar98._24_4_ = auVar28._24_4_ * fVar301;
            auVar98._28_4_ = fVar263;
            fVar263 = auVar191._0_4_;
            fVar289 = auVar191._4_4_;
            auVar99._4_4_ = auVar27._4_4_ * fVar289;
            auVar99._0_4_ = auVar27._0_4_ * fVar263;
            fVar236 = auVar191._8_4_;
            auVar99._8_4_ = auVar27._8_4_ * fVar236;
            fVar332 = auVar191._12_4_;
            auVar99._12_4_ = auVar27._12_4_ * fVar332;
            fVar304 = auVar191._16_4_;
            auVar99._16_4_ = auVar27._16_4_ * fVar304;
            fVar331 = auVar191._20_4_;
            auVar99._20_4_ = auVar27._20_4_ * fVar331;
            fVar302 = auVar191._24_4_;
            auVar99._24_4_ = auVar27._24_4_ * fVar302;
            auVar99._28_4_ = auVar158._28_4_;
            auVar157 = vsubps_avx(auVar99,auVar98);
            auVar158 = vsubps_avx(auVar156,auVar26);
            fVar264 = auVar158._0_4_;
            fVar290 = auVar158._4_4_;
            auVar100._4_4_ = auVar28._4_4_ * fVar290;
            auVar100._0_4_ = auVar28._0_4_ * fVar264;
            fVar356 = auVar158._8_4_;
            auVar100._8_4_ = auVar28._8_4_ * fVar356;
            fVar241 = auVar158._12_4_;
            auVar100._12_4_ = auVar28._12_4_ * fVar241;
            fVar240 = auVar158._16_4_;
            auVar100._16_4_ = auVar28._16_4_ * fVar240;
            fVar335 = auVar158._20_4_;
            auVar100._20_4_ = auVar28._20_4_ * fVar335;
            fVar303 = auVar158._24_4_;
            auVar100._24_4_ = auVar28._24_4_ * fVar303;
            auVar100._28_4_ = auVar28._28_4_;
            auVar101._4_4_ = fVar289 * auVar26._4_4_;
            auVar101._0_4_ = fVar263 * auVar26._0_4_;
            auVar101._8_4_ = fVar236 * auVar26._8_4_;
            auVar101._12_4_ = fVar332 * auVar26._12_4_;
            auVar101._16_4_ = fVar304 * auVar26._16_4_;
            auVar101._20_4_ = fVar331 * auVar26._20_4_;
            auVar101._24_4_ = fVar302 * auVar26._24_4_;
            auVar101._28_4_ = auVar30._28_4_;
            auVar28 = vsubps_avx(auVar100,auVar101);
            auVar102._4_4_ = auVar27._4_4_ * fVar290;
            auVar102._0_4_ = auVar27._0_4_ * fVar264;
            auVar102._8_4_ = auVar27._8_4_ * fVar356;
            auVar102._12_4_ = auVar27._12_4_ * fVar241;
            auVar102._16_4_ = auVar27._16_4_ * fVar240;
            auVar102._20_4_ = auVar27._20_4_ * fVar335;
            auVar102._24_4_ = auVar27._24_4_ * fVar303;
            auVar102._28_4_ = auVar27._28_4_;
            auVar103._4_4_ = fVar288 * auVar26._4_4_;
            auVar103._0_4_ = fVar262 * auVar26._0_4_;
            auVar103._8_4_ = fVar326 * auVar26._8_4_;
            auVar103._12_4_ = fVar242 * auVar26._12_4_;
            auVar103._16_4_ = fVar265 * auVar26._16_4_;
            auVar103._20_4_ = fVar330 * auVar26._20_4_;
            auVar103._24_4_ = fVar301 * auVar26._24_4_;
            auVar103._28_4_ = auVar26._28_4_;
            auVar26 = vsubps_avx(auVar103,auVar102);
            auVar165._0_4_ = auVar157._0_4_ * 0.0 + auVar26._0_4_ + auVar28._0_4_ * 0.0;
            auVar165._4_4_ = auVar157._4_4_ * 0.0 + auVar26._4_4_ + auVar28._4_4_ * 0.0;
            auVar165._8_4_ = auVar157._8_4_ * 0.0 + auVar26._8_4_ + auVar28._8_4_ * 0.0;
            auVar165._12_4_ = auVar157._12_4_ * 0.0 + auVar26._12_4_ + auVar28._12_4_ * 0.0;
            auVar165._16_4_ = auVar157._16_4_ * 0.0 + auVar26._16_4_ + auVar28._16_4_ * 0.0;
            auVar165._20_4_ = auVar157._20_4_ * 0.0 + auVar26._20_4_ + auVar28._20_4_ * 0.0;
            auVar165._24_4_ = auVar157._24_4_ * 0.0 + auVar26._24_4_ + auVar28._24_4_ * 0.0;
            auVar165._28_4_ = auVar28._28_4_ + auVar26._28_4_ + auVar28._28_4_;
            auVar168 = ZEXT3264(auVar165);
            auVar26 = vmaxps_avx(auVar354,auVar165);
            auVar26 = vcmpps_avx(auVar26,ZEXT832(0) << 0x20,2);
            auVar27 = local_6c0 & auVar26;
            if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar27 >> 0x7f,0) == '\0') &&
                  (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar27 >> 0xbf,0) == '\0') &&
                (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar27[0x1f]) {
              auVar271 = vpcmpeqd_avx(auVar190._0_16_,auVar190._0_16_);
LAB_01100304:
              auVar197._8_8_ = local_560[1]._8_8_;
              auVar197._0_8_ = local_560[1]._0_8_;
              auVar197._16_8_ = local_560[1]._16_8_;
              auVar197._24_8_ = local_560[1]._24_8_;
              auVar317 = ZEXT1664(auVar271);
              auVar384._4_4_ = fVar171;
              auVar384._0_4_ = fVar153;
              auVar384._8_4_ = fVar174;
              auVar384._12_4_ = fVar176;
              auVar384._16_4_ = fVar177;
              auVar384._20_4_ = fVar179;
              auVar384._24_4_ = fVar180;
              auVar384._28_4_ = fVar181;
            }
            else {
              auVar27 = vandps_avx(auVar26,local_6c0);
              auVar104._4_4_ = fVar289 * fVar266;
              auVar104._0_4_ = fVar263 * fVar243;
              auVar104._8_4_ = fVar236 * fVar318;
              auVar104._12_4_ = fVar332 * fVar327;
              auVar104._16_4_ = fVar304 * fVar204;
              auVar104._20_4_ = fVar331 * fVar182;
              auVar104._24_4_ = fVar302 * fVar344;
              auVar104._28_4_ = local_6c0._28_4_;
              auVar105._4_4_ = fVar288 * fVar268;
              auVar105._0_4_ = fVar262 * fVar260;
              auVar105._8_4_ = fVar326 * fVar281;
              auVar105._12_4_ = fVar242 * fVar284;
              auVar105._16_4_ = fVar265 * fVar287;
              auVar105._20_4_ = fVar330 * fVar349;
              auVar105._24_4_ = fVar301 * fVar350;
              auVar105._28_4_ = auVar26._28_4_;
              auVar28 = vsubps_avx(auVar105,auVar104);
              auVar106._4_4_ = fVar290 * fVar268;
              auVar106._0_4_ = fVar264 * fVar260;
              auVar106._8_4_ = fVar356 * fVar281;
              auVar106._12_4_ = fVar241 * fVar284;
              auVar106._16_4_ = fVar240 * fVar287;
              auVar106._20_4_ = fVar335 * fVar349;
              auVar106._24_4_ = fVar303 * fVar350;
              auVar106._28_4_ = auVar31._28_4_;
              auVar107._4_4_ = fVar289 * fVar285;
              auVar107._0_4_ = fVar263 * fVar259;
              auVar107._8_4_ = fVar236 * fVar325;
              auVar107._12_4_ = fVar332 * fVar357;
              auVar107._16_4_ = fVar304 * fVar173;
              auVar107._20_4_ = fVar331 * fVar328;
              auVar107._24_4_ = fVar302 * fVar291;
              auVar107._28_4_ = auVar191._28_4_;
              auVar30 = vsubps_avx(auVar107,auVar106);
              auVar108._4_4_ = fVar288 * fVar285;
              auVar108._0_4_ = fVar262 * fVar259;
              auVar108._8_4_ = fVar326 * fVar325;
              auVar108._12_4_ = fVar242 * fVar357;
              auVar108._16_4_ = fVar265 * fVar173;
              auVar108._20_4_ = fVar330 * fVar328;
              auVar108._24_4_ = fVar301 * fVar291;
              auVar108._28_4_ = auVar29._28_4_;
              auVar109._4_4_ = fVar290 * fVar266;
              auVar109._0_4_ = fVar264 * fVar243;
              auVar109._8_4_ = fVar356 * fVar318;
              auVar109._12_4_ = fVar241 * fVar327;
              auVar109._16_4_ = fVar240 * fVar204;
              auVar109._20_4_ = fVar335 * fVar182;
              auVar109._24_4_ = fVar303 * fVar344;
              auVar109._28_4_ = auVar189._28_4_;
              auVar31 = vsubps_avx(auVar109,auVar108);
              auVar196._0_4_ = auVar28._0_4_ * 0.0 + auVar31._0_4_ + auVar30._0_4_ * 0.0;
              auVar196._4_4_ = auVar28._4_4_ * 0.0 + auVar31._4_4_ + auVar30._4_4_ * 0.0;
              auVar196._8_4_ = auVar28._8_4_ * 0.0 + auVar31._8_4_ + auVar30._8_4_ * 0.0;
              auVar196._12_4_ = auVar28._12_4_ * 0.0 + auVar31._12_4_ + auVar30._12_4_ * 0.0;
              auVar196._16_4_ = auVar28._16_4_ * 0.0 + auVar31._16_4_ + auVar30._16_4_ * 0.0;
              auVar196._20_4_ = auVar28._20_4_ * 0.0 + auVar31._20_4_ + auVar30._20_4_ * 0.0;
              auVar196._24_4_ = auVar28._24_4_ * 0.0 + auVar31._24_4_ + auVar30._24_4_ * 0.0;
              auVar196._28_4_ = auVar189._28_4_ + auVar31._28_4_ + auVar29._28_4_;
              auVar26 = vrcpps_avx(auVar196);
              fVar243 = auVar26._0_4_;
              fVar259 = auVar26._4_4_;
              auVar110._4_4_ = auVar196._4_4_ * fVar259;
              auVar110._0_4_ = auVar196._0_4_ * fVar243;
              fVar262 = auVar26._8_4_;
              auVar110._8_4_ = auVar196._8_4_ * fVar262;
              fVar263 = auVar26._12_4_;
              auVar110._12_4_ = auVar196._12_4_ * fVar263;
              fVar264 = auVar26._16_4_;
              auVar110._16_4_ = auVar196._16_4_ * fVar264;
              fVar266 = auVar26._20_4_;
              auVar110._20_4_ = auVar196._20_4_ * fVar266;
              fVar285 = auVar26._24_4_;
              auVar110._24_4_ = auVar196._24_4_ * fVar285;
              auVar110._28_4_ = auVar191._28_4_;
              auVar367._8_4_ = 0x3f800000;
              auVar367._0_8_ = &DAT_3f8000003f800000;
              auVar367._12_4_ = 0x3f800000;
              auVar367._16_4_ = 0x3f800000;
              auVar367._20_4_ = 0x3f800000;
              auVar367._24_4_ = 0x3f800000;
              auVar367._28_4_ = 0x3f800000;
              auVar26 = vsubps_avx(auVar367,auVar110);
              fVar243 = auVar26._0_4_ * fVar243 + fVar243;
              fVar259 = auVar26._4_4_ * fVar259 + fVar259;
              fVar262 = auVar26._8_4_ * fVar262 + fVar262;
              fVar263 = auVar26._12_4_ * fVar263 + fVar263;
              fVar264 = auVar26._16_4_ * fVar264 + fVar264;
              fVar266 = auVar26._20_4_ * fVar266 + fVar266;
              fVar285 = auVar26._24_4_ * fVar285 + fVar285;
              auVar111._4_4_ =
                   (fVar282 * auVar28._4_4_ + auVar30._4_4_ * fVar279 + auVar31._4_4_ * fVar201) *
                   fVar259;
              auVar111._0_4_ =
                   (fVar256 * auVar28._0_4_ + auVar30._0_4_ * fVar253 + auVar31._0_4_ * fVar183) *
                   fVar243;
              auVar111._8_4_ =
                   (fVar355 * auVar28._8_4_ + auVar30._8_4_ * fVar234 + auVar31._8_4_ * fVar202) *
                   fVar262;
              auVar111._12_4_ =
                   (fVar238 * auVar28._12_4_ + auVar30._12_4_ * fVar329 + auVar31._12_4_ * fVar203)
                   * fVar263;
              auVar111._16_4_ =
                   (fVar170 * auVar28._16_4_ + auVar30._16_4_ * fVar358 + auVar31._16_4_ * fVar244)
                   * fVar264;
              auVar111._20_4_ =
                   (fVar305 * auVar28._20_4_ + auVar30._20_4_ * fVar205 + auVar31._20_4_ * fVar254)
                   * fVar266;
              auVar111._24_4_ =
                   (fVar348 * auVar28._24_4_ + auVar30._24_4_ * fVar346 + auVar31._24_4_ * fVar257)
                   * fVar285;
              auVar111._28_4_ = auVar156._28_4_ + auVar24._28_4_ + auVar25._28_4_;
              auVar230 = ZEXT3264(auVar111);
              uVar7 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar252._4_4_ = uVar7;
              auVar252._0_4_ = uVar7;
              auVar252._8_4_ = uVar7;
              auVar252._12_4_ = uVar7;
              auVar252._16_4_ = uVar7;
              auVar252._20_4_ = uVar7;
              auVar252._24_4_ = uVar7;
              auVar252._28_4_ = uVar7;
              auVar156 = vcmpps_avx(local_520,auVar111,2);
              auVar24 = vcmpps_avx(auVar111,auVar252,2);
              auVar156 = vandps_avx(auVar156,auVar24);
              auVar25 = auVar27 & auVar156;
              auVar271 = auVar31._0_16_;
              if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar25 >> 0x7f,0) == '\0') &&
                    (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar25 >> 0xbf,0) == '\0') &&
                  (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar25[0x1f]) {
                auVar271 = vpcmpeqd_avx(auVar271,auVar271);
                goto LAB_01100304;
              }
              auVar156 = vandps_avx(auVar27,auVar156);
              auVar25 = vcmpps_avx(ZEXT832(0) << 0x20,auVar196,4);
              auVar26 = auVar156 & auVar25;
              auVar197._8_8_ = local_560[1]._8_8_;
              auVar197._0_8_ = local_560[1]._0_8_;
              auVar197._16_8_ = local_560[1]._16_8_;
              auVar197._24_8_ = local_560[1]._24_8_;
              auVar271 = vpcmpeqd_avx(auVar271,auVar271);
              auVar317 = ZEXT1664(auVar271);
              auVar384._4_4_ = fVar171;
              auVar384._0_4_ = fVar153;
              auVar384._8_4_ = fVar174;
              auVar384._12_4_ = fVar176;
              auVar384._16_4_ = fVar177;
              auVar384._20_4_ = fVar179;
              auVar384._24_4_ = fVar180;
              auVar384._28_4_ = fVar181;
              if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar26 >> 0x7f,0) != '\0') ||
                    (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0xbf,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar26[0x1f] < '\0') {
                auVar197 = vandps_avx(auVar25,auVar156);
                auVar112._4_4_ = auVar354._4_4_ * fVar259;
                auVar112._0_4_ = auVar354._0_4_ * fVar243;
                auVar112._8_4_ = auVar354._8_4_ * fVar262;
                auVar112._12_4_ = auVar354._12_4_ * fVar263;
                auVar112._16_4_ = auVar354._16_4_ * fVar264;
                auVar112._20_4_ = auVar354._20_4_ * fVar266;
                auVar112._24_4_ = auVar354._24_4_ * fVar285;
                auVar112._28_4_ = auVar24._28_4_;
                auVar113._4_4_ = auVar165._4_4_ * fVar259;
                auVar113._0_4_ = auVar165._0_4_ * fVar243;
                auVar113._8_4_ = auVar165._8_4_ * fVar262;
                auVar113._12_4_ = auVar165._12_4_ * fVar263;
                auVar113._16_4_ = auVar165._16_4_ * fVar264;
                auVar113._20_4_ = auVar165._20_4_ * fVar266;
                auVar113._24_4_ = auVar165._24_4_ * fVar285;
                auVar113._28_4_ = auVar165._28_4_;
                auVar300._8_4_ = 0x3f800000;
                auVar300._0_8_ = &DAT_3f8000003f800000;
                auVar300._12_4_ = 0x3f800000;
                auVar300._16_4_ = 0x3f800000;
                auVar300._20_4_ = 0x3f800000;
                auVar300._24_4_ = 0x3f800000;
                auVar300._28_4_ = 0x3f800000;
                auVar156 = vsubps_avx(auVar300,auVar112);
                local_100 = vblendvps_avx(auVar156,auVar112,auVar23);
                auVar156 = vsubps_avx(auVar300,auVar113);
                _local_1c0 = vblendvps_avx(auVar156,auVar113,auVar23);
                auVar168 = ZEXT3264(_local_1c0);
                local_4e0 = auVar111;
              }
            }
            auVar362 = ZEXT3264(local_820);
            local_4c0 = auVar321;
            if ((((((((auVar197 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar197 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar197 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar197 >> 0x7f,0) != '\0') ||
                  (auVar197 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar197 >> 0xbf,0) != '\0') ||
                (auVar197 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar197[0x1f] < '\0') {
              auVar156 = vsubps_avx(_local_840,auVar384);
              auVar230 = ZEXT3264(local_100);
              fVar253 = auVar384._0_4_ + auVar156._0_4_ * local_100._0_4_;
              fVar256 = auVar384._4_4_ + auVar156._4_4_ * local_100._4_4_;
              fVar259 = auVar384._8_4_ + auVar156._8_4_ * local_100._8_4_;
              fVar262 = auVar384._12_4_ + auVar156._12_4_ * local_100._12_4_;
              fVar263 = auVar384._16_4_ + auVar156._16_4_ * local_100._16_4_;
              fVar264 = auVar384._20_4_ + auVar156._20_4_ * local_100._20_4_;
              fVar266 = auVar384._24_4_ + auVar156._24_4_ * local_100._24_4_;
              fVar279 = auVar384._28_4_ + auVar156._28_4_;
              fVar243 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
              auVar114._4_4_ = (fVar256 + fVar256) * fVar243;
              auVar114._0_4_ = (fVar253 + fVar253) * fVar243;
              auVar114._8_4_ = (fVar259 + fVar259) * fVar243;
              auVar114._12_4_ = (fVar262 + fVar262) * fVar243;
              auVar114._16_4_ = (fVar263 + fVar263) * fVar243;
              auVar114._20_4_ = (fVar264 + fVar264) * fVar243;
              auVar114._24_4_ = (fVar266 + fVar266) * fVar243;
              auVar114._28_4_ = fVar279 + fVar279;
              auVar156 = vcmpps_avx(local_4e0,auVar114,6);
              auVar168 = ZEXT3264(auVar156);
              auVar321 = auVar197 & auVar156;
              if ((((((((auVar321 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar321 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar321 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar321 >> 0x7f,0) != '\0') ||
                    (auVar321 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar321 >> 0xbf,0) != '\0') ||
                  (auVar321 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar321[0x1f] < '\0') {
                local_300 = vandps_avx(auVar156,auVar197);
                auVar168 = ZEXT3264(local_300);
                local_3a0 = (float)local_1c0._0_4_ + (float)local_1c0._0_4_ + -1.0;
                fStack_39c = (float)local_1c0._4_4_ + (float)local_1c0._4_4_ + -1.0;
                fStack_398 = fStack_1b8 + fStack_1b8 + -1.0;
                fStack_394 = fStack_1b4 + fStack_1b4 + -1.0;
                fStack_390 = fStack_1b0 + fStack_1b0 + -1.0;
                fStack_38c = fStack_1ac + fStack_1ac + -1.0;
                fStack_388 = fStack_1a8 + fStack_1a8 + -1.0;
                fStack_384 = fStack_1a4 + fStack_1a4 + -1.0;
                local_3c0 = local_100;
                local_380 = local_4e0;
                local_360 = (uint)local_7a0;
                local_35c = uVar18;
                local_340 = local_6e0;
                uStack_338 = uStack_6d8;
                local_330 = local_5f0;
                uStack_328 = uStack_5e8;
                local_320 = local_600;
                uStack_318 = uStack_5f8;
                local_720._0_8_ = (context->scene->geometries).items[uVar17].ptr;
                local_1c0._4_4_ = fStack_39c;
                local_1c0._0_4_ = local_3a0;
                fStack_1b8 = fStack_398;
                fStack_1b4 = fStack_394;
                fStack_1b0 = fStack_390;
                fStack_1ac = fStack_38c;
                fStack_1a8 = fStack_388;
                fStack_1a4 = fStack_384;
                if ((((Geometry *)local_720._0_8_)->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar271 = vshufps_avx(ZEXT416((uint)(float)(int)local_7a0),
                                         ZEXT416((uint)(float)(int)local_7a0),0);
                  local_2e0[0] = (auVar271._0_4_ + local_100._0_4_ + 0.0) * (float)local_120._0_4_;
                  local_2e0[1] = (auVar271._4_4_ + local_100._4_4_ + 1.0) * (float)local_120._4_4_;
                  local_2e0[2] = (auVar271._8_4_ + local_100._8_4_ + 2.0) * fStack_118;
                  local_2e0[3] = (auVar271._12_4_ + local_100._12_4_ + 3.0) * fStack_114;
                  fStack_2d0 = (auVar271._0_4_ + local_100._16_4_ + 4.0) * fStack_110;
                  fStack_2cc = (auVar271._4_4_ + local_100._20_4_ + 5.0) * fStack_10c;
                  fStack_2c8 = (auVar271._8_4_ + local_100._24_4_ + 6.0) * fStack_108;
                  fStack_2c4 = auVar271._12_4_ + local_100._28_4_ + 7.0;
                  local_2c0 = CONCAT44(fStack_39c,local_3a0);
                  uStack_2b8 = CONCAT44(fStack_394,fStack_398);
                  uStack_2b0 = CONCAT44(fStack_38c,fStack_390);
                  uStack_2a8 = CONCAT44(fStack_384,fStack_388);
                  local_2a0 = local_4e0;
                  auVar198._8_4_ = 0x7f800000;
                  auVar198._0_8_ = 0x7f8000007f800000;
                  auVar198._12_4_ = 0x7f800000;
                  auVar198._16_4_ = 0x7f800000;
                  auVar198._20_4_ = 0x7f800000;
                  auVar198._24_4_ = 0x7f800000;
                  auVar198._28_4_ = 0x7f800000;
                  auVar156 = vblendvps_avx(auVar198,local_4e0,local_300);
                  auVar321 = vshufps_avx(auVar156,auVar156,0xb1);
                  auVar321 = vminps_avx(auVar156,auVar321);
                  auVar24 = vshufpd_avx(auVar321,auVar321,5);
                  auVar321 = vminps_avx(auVar321,auVar24);
                  auVar24 = vperm2f128_avx(auVar321,auVar321,1);
                  auVar321 = vminps_avx(auVar321,auVar24);
                  auVar321 = vcmpps_avx(auVar156,auVar321,0);
                  auVar24 = local_300 & auVar321;
                  auVar156 = local_300;
                  if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar24 >> 0x7f,0) != '\0') ||
                        (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar24 >> 0xbf,0) != '\0') ||
                      (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar24[0x1f] < '\0') {
                    auVar156 = vandps_avx(auVar321,local_300);
                  }
                  uVar145 = vmovmskps_avx(auVar156);
                  local_880 = 0;
                  if (uVar145 != 0) {
                    for (; (uVar145 >> local_880 & 1) == 0; local_880 = local_880 + 1) {
                    }
                  }
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (((Geometry *)local_720._0_8_)->intersectionFilterN == (RTCFilterFunctionN)0x0)
                     ) {
                    uVar147 = (ulong)local_880;
                    fVar243 = local_2e0[uVar147];
                    auVar168 = ZEXT464((uint)fVar243);
                    uVar7 = *(undefined4 *)((long)&local_2c0 + uVar147 * 4);
                    fVar256 = 1.0 - fVar243;
                    fVar253 = fVar243 * fVar256 * 4.0;
                    auVar271 = ZEXT416((uint)(fVar243 * fVar243 * 0.5));
                    auVar271 = vshufps_avx(auVar271,auVar271,0);
                    auVar209 = ZEXT416((uint)((fVar256 * fVar256 + fVar253) * 0.5));
                    auVar209 = vshufps_avx(auVar209,auVar209,0);
                    auVar178 = ZEXT416((uint)((-fVar243 * fVar243 - fVar253) * 0.5));
                    auVar178 = vshufps_avx(auVar178,auVar178,0);
                    auVar221 = ZEXT416((uint)(fVar256 * -fVar256 * 0.5));
                    auVar221 = vshufps_avx(auVar221,auVar221,0);
                    auVar210._0_4_ =
                         fVar217 * auVar221._0_4_ +
                         auVar178._0_4_ * (float)local_6e0._0_4_ +
                         auVar271._0_4_ * (float)local_600._0_4_ +
                         auVar209._0_4_ * (float)local_5f0._0_4_;
                    auVar210._4_4_ =
                         fVar231 * auVar221._4_4_ +
                         auVar178._4_4_ * (float)local_6e0._4_4_ +
                         auVar271._4_4_ * (float)local_600._4_4_ +
                         auVar209._4_4_ * (float)local_5f0._4_4_;
                    auVar210._8_4_ =
                         fVar232 * auVar221._8_4_ +
                         auVar178._8_4_ * (float)uStack_6d8 +
                         auVar271._8_4_ * (float)uStack_5f8 + auVar209._8_4_ * (float)uStack_5e8;
                    auVar210._12_4_ =
                         fVar233 * auVar221._12_4_ +
                         auVar178._12_4_ * uStack_6d8._4_4_ +
                         auVar271._12_4_ * uStack_5f8._4_4_ + auVar209._12_4_ * uStack_5e8._4_4_;
                    auVar230 = ZEXT464(*(uint *)(local_2a0 + uVar147 * 4));
                    *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_2a0 + uVar147 * 4);
                    *(float *)(ray + k * 4 + 0xc0) = auVar210._0_4_;
                    uVar19 = vextractps_avx(auVar210,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar19;
                    uVar19 = vextractps_avx(auVar210,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar19;
                    *(float *)(ray + k * 4 + 0xf0) = fVar243;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar7;
                    *(uint *)(ray + k * 4 + 0x110) = uVar146;
                    *(uint *)(ray + k * 4 + 0x120) = uVar17;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_720._8_24_ = auVar392._8_24_;
                    auStack_650 = auVar299._16_16_;
                    _local_660 = _local_6e0;
                    auStack_670 = auVar276._16_16_;
                    _local_680 = _local_5f0;
                    _local_740 = _local_600;
                    _local_760 = *local_6c8;
                    fStack_79c = (float)((ulong)lVar150 >> 0x20);
                    auVar324 = ZEXT1664(ZEXT816(0) << 0x40);
                    local_560[0] = local_300;
                    local_350 = local_890;
                    uStack_348 = uStack_888;
                    do {
                      local_6c0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                      uVar147 = (ulong)local_880;
                      local_420 = local_2e0[uVar147];
                      local_410._4_4_ = *(undefined4 *)((long)&local_2c0 + uVar147 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2a0 + uVar147 * 4)
                      ;
                      fVar253 = 1.0 - local_420;
                      fVar243 = local_420 * fVar253 * 4.0;
                      auVar271 = ZEXT416((uint)(local_420 * local_420 * 0.5));
                      auVar271 = vshufps_avx(auVar271,auVar271,0);
                      auVar209 = ZEXT416((uint)((fVar253 * fVar253 + fVar243) * 0.5));
                      auVar209 = vshufps_avx(auVar209,auVar209,0);
                      auVar178 = ZEXT416((uint)((-local_420 * local_420 - fVar243) * 0.5));
                      auVar178 = vshufps_avx(auVar178,auVar178,0);
                      local_7d0.context = context->user;
                      auVar221 = ZEXT416((uint)(fVar253 * -fVar253 * 0.5));
                      auVar221 = vshufps_avx(auVar221,auVar221,0);
                      auVar211._0_4_ =
                           fVar217 * auVar221._0_4_ +
                           auVar178._0_4_ * (float)local_660._0_4_ +
                           auVar271._0_4_ * (float)local_740._0_4_ +
                           auVar209._0_4_ * (float)local_680._0_4_;
                      auVar211._4_4_ =
                           fVar231 * auVar221._4_4_ +
                           auVar178._4_4_ * (float)local_660._4_4_ +
                           auVar271._4_4_ * (float)local_740._4_4_ +
                           auVar209._4_4_ * (float)local_680._4_4_;
                      auVar211._8_4_ =
                           fVar232 * auVar221._8_4_ +
                           auVar178._8_4_ * (float)uStack_658 +
                           auVar271._8_4_ * fStack_738 + auVar209._8_4_ * (float)uStack_678;
                      auVar211._12_4_ =
                           fVar233 * auVar221._12_4_ +
                           auVar178._12_4_ * uStack_658._4_4_ +
                           auVar271._12_4_ * fStack_734 + auVar209._12_4_ * uStack_678._4_4_;
                      auVar271 = vshufps_avx(auVar211,auVar211,0);
                      local_450[0] = (RTCHitN)auVar271[0];
                      local_450[1] = (RTCHitN)auVar271[1];
                      local_450[2] = (RTCHitN)auVar271[2];
                      local_450[3] = (RTCHitN)auVar271[3];
                      local_450[4] = (RTCHitN)auVar271[4];
                      local_450[5] = (RTCHitN)auVar271[5];
                      local_450[6] = (RTCHitN)auVar271[6];
                      local_450[7] = (RTCHitN)auVar271[7];
                      local_450[8] = (RTCHitN)auVar271[8];
                      local_450[9] = (RTCHitN)auVar271[9];
                      local_450[10] = (RTCHitN)auVar271[10];
                      local_450[0xb] = (RTCHitN)auVar271[0xb];
                      local_450[0xc] = (RTCHitN)auVar271[0xc];
                      local_450[0xd] = (RTCHitN)auVar271[0xd];
                      local_450[0xe] = (RTCHitN)auVar271[0xe];
                      local_450[0xf] = (RTCHitN)auVar271[0xf];
                      local_440 = vshufps_avx(auVar211,auVar211,0x55);
                      local_430 = vshufps_avx(auVar211,auVar211,0xaa);
                      fStack_41c = local_420;
                      fStack_418 = local_420;
                      fStack_414 = local_420;
                      local_410._0_4_ = local_410._4_4_;
                      local_410._8_4_ = local_410._4_4_;
                      local_410._12_4_ = local_410._4_4_;
                      local_400 = local_1e0._0_8_;
                      uStack_3f8 = local_1e0._8_8_;
                      local_3f0 = local_1d0._0_8_;
                      uStack_3e8 = local_1d0._8_8_;
                      vcmpps_avx(auVar324._0_32_,auVar324._0_32_,0xf);
                      local_840 = (undefined1  [8])local_7d0.context;
                      uStack_3dc = (local_7d0.context)->instID[0];
                      local_3e0 = uStack_3dc;
                      uStack_3d8 = uStack_3dc;
                      uStack_3d4 = uStack_3dc;
                      uStack_3d0 = (local_7d0.context)->instPrimID[0];
                      uStack_3cc = uStack_3d0;
                      uStack_3c8 = uStack_3d0;
                      uStack_3c4 = uStack_3d0;
                      local_850 = local_760;
                      uStack_848 = uStack_758;
                      local_7d0.valid = (int *)&local_850;
                      local_7d0.geometryUserPtr = *(void **)(local_720._0_8_ + 0x18);
                      local_7d0.hit = local_450;
                      local_7d0.N = 4;
                      local_7d0.ray = (RTCRayN *)ray;
                      if (*(code **)(local_720._0_8_ + 0x40) != (code *)0x0) {
                        auVar271 = auVar317._0_16_;
                        (**(code **)(local_720._0_8_ + 0x40))(&local_7d0);
                        lVar150 = CONCAT44(fStack_79c,local_7a0);
                        auVar362 = ZEXT3264(local_820);
                        auVar271 = vpcmpeqd_avx(auVar271,auVar271);
                        auVar317 = ZEXT1664(auVar271);
                        auVar324 = ZEXT1664(ZEXT816(0) << 0x40);
                        fVar267 = (float)local_800._0_4_;
                        fVar280 = (float)local_800._4_4_;
                        fVar283 = fStack_7f8;
                        fVar286 = fStack_7f4;
                        fVar235 = fStack_7f0;
                        fVar237 = fStack_7ec;
                        fVar239 = fStack_7e8;
                      }
                      auVar129._8_8_ = uStack_848;
                      auVar129._0_8_ = local_850;
                      auVar271 = auVar317._0_16_;
                      if (auVar129 == (undefined1  [16])0x0) {
                        auVar209 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                        auVar271 = auVar271 ^ auVar209;
                        auVar230 = ZEXT3264(local_4e0);
                      }
                      else {
                        p_Var21 = context->args->filter;
                        if ((p_Var21 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            ((*(byte *)(local_720._0_8_ + 0x3e) & 0x40) != 0)))) {
                          (*p_Var21)(&local_7d0);
                          lVar150 = CONCAT44(fStack_79c,local_7a0);
                          auVar362 = ZEXT3264(local_820);
                          auVar271 = vpcmpeqd_avx(auVar271,auVar271);
                          auVar317 = ZEXT1664(auVar271);
                          auVar324 = ZEXT1664(ZEXT816(0) << 0x40);
                          fVar267 = (float)local_800._0_4_;
                          fVar280 = (float)local_800._4_4_;
                          fVar283 = fStack_7f8;
                          fVar286 = fStack_7f4;
                          fVar235 = fStack_7f0;
                          fVar237 = fStack_7ec;
                          fVar239 = fStack_7e8;
                        }
                        auVar130._8_8_ = uStack_848;
                        auVar130._0_8_ = local_850;
                        auVar209 = vpcmpeqd_avx(auVar130,_DAT_01feba10);
                        auVar271 = auVar317._0_16_ ^ auVar209;
                        auVar230 = ZEXT3264(local_4e0);
                        if (auVar130 != (undefined1  [16])0x0) {
                          auVar209 = auVar317._0_16_ ^ auVar209;
                          auVar178 = vmaskmovps_avx(auVar209,*(undefined1 (*) [16])local_7d0.hit);
                          *(undefined1 (*) [16])(local_7d0.ray + 0xc0) = auVar178;
                          auVar178 = vmaskmovps_avx(auVar209,*(undefined1 (*) [16])
                                                              (local_7d0.hit + 0x10));
                          *(undefined1 (*) [16])(local_7d0.ray + 0xd0) = auVar178;
                          auVar178 = vmaskmovps_avx(auVar209,*(undefined1 (*) [16])
                                                              (local_7d0.hit + 0x20));
                          *(undefined1 (*) [16])(local_7d0.ray + 0xe0) = auVar178;
                          auVar178 = vmaskmovps_avx(auVar209,*(undefined1 (*) [16])
                                                              (local_7d0.hit + 0x30));
                          *(undefined1 (*) [16])(local_7d0.ray + 0xf0) = auVar178;
                          auVar178 = vmaskmovps_avx(auVar209,*(undefined1 (*) [16])
                                                              (local_7d0.hit + 0x40));
                          *(undefined1 (*) [16])(local_7d0.ray + 0x100) = auVar178;
                          auVar178 = vmaskmovps_avx(auVar209,*(undefined1 (*) [16])
                                                              (local_7d0.hit + 0x50));
                          *(undefined1 (*) [16])(local_7d0.ray + 0x110) = auVar178;
                          auVar178 = vmaskmovps_avx(auVar209,*(undefined1 (*) [16])
                                                              (local_7d0.hit + 0x60));
                          *(undefined1 (*) [16])(local_7d0.ray + 0x120) = auVar178;
                          auVar178 = vmaskmovps_avx(auVar209,*(undefined1 (*) [16])
                                                              (local_7d0.hit + 0x70));
                          *(undefined1 (*) [16])(local_7d0.ray + 0x130) = auVar178;
                          auVar209 = vmaskmovps_avx(auVar209,*(undefined1 (*) [16])
                                                              (local_7d0.hit + 0x80));
                          *(undefined1 (*) [16])(local_7d0.ray + 0x140) = auVar209;
                        }
                      }
                      auVar186._8_8_ = 0x100000001;
                      auVar186._0_8_ = 0x100000001;
                      if ((auVar186 & auVar271) == (undefined1  [16])0x0) {
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_6c0._0_4_;
                      }
                      *(undefined4 *)(local_560[0] + (ulong)local_880 * 4) = 0;
                      uVar7 = *(undefined4 *)(ray + k * 4 + 0x80);
                      auVar166._4_4_ = uVar7;
                      auVar166._0_4_ = uVar7;
                      auVar166._8_4_ = uVar7;
                      auVar166._12_4_ = uVar7;
                      auVar166._16_4_ = uVar7;
                      auVar166._20_4_ = uVar7;
                      auVar166._24_4_ = uVar7;
                      auVar166._28_4_ = uVar7;
                      auVar321 = vcmpps_avx(auVar230._0_32_,auVar166,2);
                      auVar156 = vandps_avx(auVar321,local_560[0]);
                      auVar168 = ZEXT3264(auVar156);
                      local_560[0] = local_560[0] & auVar321;
                      bVar122 = (local_560[0] >> 0x1f & (undefined1  [32])0x1) !=
                                (undefined1  [32])0x0;
                      bVar123 = (local_560[0] >> 0x3f & (undefined1  [32])0x1) !=
                                (undefined1  [32])0x0;
                      bVar121 = (local_560[0] >> 0x5f & (undefined1  [32])0x1) !=
                                (undefined1  [32])0x0;
                      bVar120 = SUB321(local_560[0] >> 0x7f,0) != '\0';
                      bVar119 = (local_560[0] & (undefined1  [32])0x100000000) !=
                                (undefined1  [32])0x0;
                      bVar118 = SUB321(local_560[0] >> 0xbf,0) != '\0';
                      bVar116 = (local_560[0] & (undefined1  [32])0x100000000) !=
                                (undefined1  [32])0x0;
                      bVar115 = local_560[0][0x1f] < '\0';
                      if (((((((bVar122 || bVar123) || bVar121) || bVar120) || bVar119) || bVar118)
                          || bVar116) || bVar115) {
                        auVar199._8_4_ = 0x7f800000;
                        auVar199._0_8_ = 0x7f8000007f800000;
                        auVar199._12_4_ = 0x7f800000;
                        auVar199._16_4_ = 0x7f800000;
                        auVar199._20_4_ = 0x7f800000;
                        auVar199._24_4_ = 0x7f800000;
                        auVar199._28_4_ = 0x7f800000;
                        auVar321 = vblendvps_avx(auVar199,auVar230._0_32_,auVar156);
                        auVar24 = vshufps_avx(auVar321,auVar321,0xb1);
                        auVar24 = vminps_avx(auVar321,auVar24);
                        auVar25 = vshufpd_avx(auVar24,auVar24,5);
                        auVar24 = vminps_avx(auVar24,auVar25);
                        auVar25 = vperm2f128_avx(auVar24,auVar24,1);
                        auVar230 = ZEXT3264(auVar25);
                        auVar24 = vminps_avx(auVar24,auVar25);
                        auVar321 = vcmpps_avx(auVar321,auVar24,0);
                        auVar24 = auVar156 & auVar321;
                        if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar24 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar24 >> 0x7f,0) != '\0') ||
                              (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar24 >> 0xbf,0) != '\0') ||
                            (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar24[0x1f] < '\0') {
                          auVar321 = vandps_avx(auVar321,auVar156);
                          auVar168 = ZEXT3264(auVar321);
                        }
                        uVar145 = vmovmskps_avx(auVar168._0_32_);
                        local_880 = 0;
                        if (uVar145 != 0) {
                          for (; (uVar145 >> local_880 & 1) == 0; local_880 = local_880 + 1) {
                          }
                        }
                      }
                      local_560[0] = auVar156;
                    } while (((((((bVar122 || bVar123) || bVar121) || bVar120) || bVar119) ||
                              bVar118) || bVar116) || bVar115);
                  }
                }
              }
            }
          }
          lVar150 = lVar150 + 8;
          auVar317 = ZEXT3264(local_620);
          auVar324 = ZEXT3264(local_640);
          fVar291 = (float)local_700._0_4_;
          fVar301 = (float)local_700._4_4_;
          fVar302 = fStack_6f8;
          fVar303 = fStack_6f4;
          fVar243 = fStack_6f0;
          fVar253 = fStack_6ec;
          fVar256 = fStack_6e8;
          fVar259 = fStack_6e4;
        } while ((int)lVar150 < (int)uVar18);
      }
      uVar7 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar162._4_4_ = uVar7;
      auVar162._0_4_ = uVar7;
      auVar162._8_4_ = uVar7;
      auVar162._12_4_ = uVar7;
      auVar162._16_4_ = uVar7;
      auVar162._20_4_ = uVar7;
      auVar162._24_4_ = uVar7;
      auVar162._28_4_ = uVar7;
      auVar156 = vcmpps_avx(local_80,auVar162,2);
      uVar146 = vmovmskps_avx(auVar156);
      uVar146 = (uint)uVar151 & uVar146;
    } while (uVar146 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }